

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx::CurveNiIntersector1<4>::
     occluded_t<embree::avx::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [12];
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [28];
  float *pfVar4;
  undefined1 (*pauVar5) [16];
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  undefined1 auVar10 [32];
  Primitive PVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [28];
  undefined1 auVar104 [28];
  undefined1 auVar105 [28];
  undefined1 auVar106 [24];
  undefined1 auVar107 [28];
  uint uVar108;
  ulong uVar109;
  RTCIntersectArguments *pRVar110;
  ulong uVar111;
  long lVar112;
  Geometry *geometry;
  long lVar113;
  ulong uVar114;
  long lVar115;
  undefined4 uVar116;
  undefined8 unaff_R13;
  ulong uVar117;
  float fVar118;
  float fVar135;
  float fVar137;
  vint4 bi_2;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar136;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar150;
  float fVar151;
  vint4 bi_1;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar153;
  float fVar155;
  float fVar157;
  float fVar159;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar152;
  float fVar154;
  float fVar156;
  float fVar158;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar172;
  float fVar173;
  vint4 ai;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  float fVar174;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar175;
  float fVar176;
  float fVar185;
  float fVar186;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar187;
  undefined1 auVar184 [64];
  float fVar188;
  float fVar200;
  float fVar201;
  vint4 bi;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  float fVar202;
  float fVar203;
  float fVar205;
  float fVar207;
  float fVar209;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar210;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar204;
  float fVar206;
  float fVar208;
  undefined1 auVar199 [64];
  float fVar211;
  float fVar219;
  float fVar220;
  vint4 ai_2;
  undefined1 auVar212 [16];
  float fVar221;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar222;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  float fVar223;
  float fVar224;
  float fVar231;
  float fVar234;
  vint4 ai_1;
  undefined1 auVar225 [16];
  float fVar237;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar232;
  float fVar235;
  float fVar238;
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar233;
  float fVar236;
  float fVar239;
  float fVar243;
  undefined1 auVar230 [32];
  float fVar244;
  float fVar251;
  float fVar252;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar253;
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [64];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar262;
  float fVar265;
  float fVar269;
  undefined1 auVar257 [32];
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar263;
  float fVar264;
  float fVar266;
  float fVar267;
  float fVar268;
  undefined1 auVar258 [64];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar278;
  float fVar279;
  float fVar280;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  float fVar281;
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar287;
  float fVar288;
  undefined1 auVar286 [64];
  undefined1 auVar289 [64];
  float fVar290;
  float fVar296;
  float fVar297;
  undefined1 auVar291 [16];
  float fVar298;
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  float fVar299;
  float fVar304;
  float fVar305;
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  float fVar306;
  float fVar307;
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  float fVar308;
  float fVar309;
  float fVar313;
  float fVar316;
  undefined1 auVar310 [16];
  float fVar314;
  undefined1 auVar315 [12];
  float fVar317;
  float fVar318;
  float fVar319;
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  float fVar320;
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  float fVar324;
  float fVar325;
  float fVar326;
  undefined1 auVar323 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_7d4;
  long local_7d0;
  Primitive *local_7c8;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_790 [8];
  undefined8 uStack_788;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  ulong local_770;
  Precalculations *local_768;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  RTCFilterFunctionNArguments local_6f0;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  undefined8 uStack_5f8;
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined8 local_5e0;
  undefined4 local_5d8;
  float local_5d4;
  undefined4 local_5d0;
  undefined4 local_5cc;
  undefined4 local_5c8;
  uint local_5c4;
  uint local_5c0;
  ulong local_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [8];
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  uint local_260;
  uint local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined1 local_200 [32];
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar273 [32];
  undefined1 auVar277 [64];
  undefined1 auVar285 [32];
  
  local_768 = pre;
  PVar11 = prim[1];
  uVar109 = (ulong)(byte)PVar11;
  fVar211 = *(float *)(prim + uVar109 * 0x19 + 0x12);
  auVar167 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar109 * 0x19 + 6));
  auVar245._0_4_ = fVar211 * (ray->dir).field_0.m128[0];
  auVar245._4_4_ = fVar211 * (ray->dir).field_0.m128[1];
  auVar245._8_4_ = fVar211 * (ray->dir).field_0.m128[2];
  auVar245._12_4_ = fVar211 * (ray->dir).field_0.m128[3];
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 4 + 6)));
  auVar142._0_4_ = fVar211 * auVar167._0_4_;
  auVar142._4_4_ = fVar211 * auVar167._4_4_;
  auVar142._8_4_ = fVar211 * auVar167._8_4_;
  auVar142._12_4_ = fVar211 * auVar167._12_4_;
  auVar167 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 5 + 6)));
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar180 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 6 + 6)));
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 0xb + 6)));
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 0xc + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 0xd + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar120 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 0x12 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 0x13 + 6)));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar109 * 0x14 + 6)));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar119 = vshufps_avx(auVar245,auVar245,0);
  auVar143 = vshufps_avx(auVar245,auVar245,0x55);
  auVar160 = vshufps_avx(auVar245,auVar245,0xaa);
  fVar211 = auVar160._0_4_;
  fVar176 = auVar160._4_4_;
  fVar219 = auVar160._8_4_;
  fVar185 = auVar160._12_4_;
  fVar223 = auVar143._0_4_;
  fVar231 = auVar143._4_4_;
  fVar234 = auVar143._8_4_;
  fVar237 = auVar143._12_4_;
  fVar220 = auVar119._0_4_;
  fVar186 = auVar119._4_4_;
  fVar221 = auVar119._8_4_;
  fVar187 = auVar119._12_4_;
  auVar291._0_4_ = fVar220 * auVar214._0_4_ + fVar223 * auVar167._0_4_ + fVar211 * auVar180._0_4_;
  auVar291._4_4_ = fVar186 * auVar214._4_4_ + fVar231 * auVar167._4_4_ + fVar176 * auVar180._4_4_;
  auVar291._8_4_ = fVar221 * auVar214._8_4_ + fVar234 * auVar167._8_4_ + fVar219 * auVar180._8_4_;
  auVar291._12_4_ =
       fVar187 * auVar214._12_4_ + fVar237 * auVar167._12_4_ + fVar185 * auVar180._12_4_;
  auVar300._0_4_ = fVar220 * auVar16._0_4_ + fVar223 * auVar17._0_4_ + auVar18._0_4_ * fVar211;
  auVar300._4_4_ = fVar186 * auVar16._4_4_ + fVar231 * auVar17._4_4_ + auVar18._4_4_ * fVar176;
  auVar300._8_4_ = fVar221 * auVar16._8_4_ + fVar234 * auVar17._8_4_ + auVar18._8_4_ * fVar219;
  auVar300._12_4_ = fVar187 * auVar16._12_4_ + fVar237 * auVar17._12_4_ + auVar18._12_4_ * fVar185;
  auVar246._0_4_ = fVar220 * auVar120._0_4_ + fVar223 * auVar121._0_4_ + auVar144._0_4_ * fVar211;
  auVar246._4_4_ = fVar186 * auVar120._4_4_ + fVar231 * auVar121._4_4_ + auVar144._4_4_ * fVar176;
  auVar246._8_4_ = fVar221 * auVar120._8_4_ + fVar234 * auVar121._8_4_ + auVar144._8_4_ * fVar219;
  auVar246._12_4_ =
       fVar187 * auVar120._12_4_ + fVar237 * auVar121._12_4_ + auVar144._12_4_ * fVar185;
  auVar119 = vshufps_avx(auVar142,auVar142,0);
  auVar143 = vshufps_avx(auVar142,auVar142,0x55);
  auVar160 = vshufps_avx(auVar142,auVar142,0xaa);
  fVar211 = auVar160._0_4_;
  fVar176 = auVar160._4_4_;
  fVar219 = auVar160._8_4_;
  fVar185 = auVar160._12_4_;
  fVar223 = auVar143._0_4_;
  fVar231 = auVar143._4_4_;
  fVar234 = auVar143._8_4_;
  fVar237 = auVar143._12_4_;
  fVar220 = auVar119._0_4_;
  fVar186 = auVar119._4_4_;
  fVar221 = auVar119._8_4_;
  fVar187 = auVar119._12_4_;
  auVar189._0_4_ = fVar220 * auVar214._0_4_ + fVar223 * auVar167._0_4_ + fVar211 * auVar180._0_4_;
  auVar189._4_4_ = fVar186 * auVar214._4_4_ + fVar231 * auVar167._4_4_ + fVar176 * auVar180._4_4_;
  auVar189._8_4_ = fVar221 * auVar214._8_4_ + fVar234 * auVar167._8_4_ + fVar219 * auVar180._8_4_;
  auVar189._12_4_ =
       fVar187 * auVar214._12_4_ + fVar237 * auVar167._12_4_ + fVar185 * auVar180._12_4_;
  auVar143._0_4_ = fVar220 * auVar16._0_4_ + auVar18._0_4_ * fVar211 + fVar223 * auVar17._0_4_;
  auVar143._4_4_ = fVar186 * auVar16._4_4_ + auVar18._4_4_ * fVar176 + fVar231 * auVar17._4_4_;
  auVar143._8_4_ = fVar221 * auVar16._8_4_ + auVar18._8_4_ * fVar219 + fVar234 * auVar17._8_4_;
  auVar143._12_4_ = fVar187 * auVar16._12_4_ + auVar18._12_4_ * fVar185 + fVar237 * auVar17._12_4_;
  auVar119._0_4_ = fVar223 * auVar121._0_4_ + auVar144._0_4_ * fVar211 + fVar220 * auVar120._0_4_;
  auVar119._4_4_ = fVar231 * auVar121._4_4_ + auVar144._4_4_ * fVar176 + fVar186 * auVar120._4_4_;
  auVar119._8_4_ = fVar234 * auVar121._8_4_ + auVar144._8_4_ * fVar219 + fVar221 * auVar120._8_4_;
  auVar119._12_4_ =
       fVar237 * auVar121._12_4_ + auVar144._12_4_ * fVar185 + fVar187 * auVar120._12_4_;
  auVar225._8_4_ = 0x7fffffff;
  auVar225._0_8_ = 0x7fffffff7fffffff;
  auVar225._12_4_ = 0x7fffffff;
  auVar214 = vandps_avx(auVar291,auVar225);
  auVar177._8_4_ = 0x219392ef;
  auVar177._0_8_ = 0x219392ef219392ef;
  auVar177._12_4_ = 0x219392ef;
  auVar214 = vcmpps_avx(auVar214,auVar177,1);
  auVar167 = vblendvps_avx(auVar291,auVar177,auVar214);
  auVar214 = vandps_avx(auVar300,auVar225);
  auVar214 = vcmpps_avx(auVar214,auVar177,1);
  auVar180 = vblendvps_avx(auVar300,auVar177,auVar214);
  auVar214 = vandps_avx(auVar246,auVar225);
  auVar214 = vcmpps_avx(auVar214,auVar177,1);
  auVar214 = vblendvps_avx(auVar246,auVar177,auVar214);
  auVar16 = vrcpps_avx(auVar167);
  fVar223 = auVar16._0_4_;
  auVar160._0_4_ = fVar223 * auVar167._0_4_;
  fVar231 = auVar16._4_4_;
  auVar160._4_4_ = fVar231 * auVar167._4_4_;
  fVar234 = auVar16._8_4_;
  auVar160._8_4_ = fVar234 * auVar167._8_4_;
  fVar237 = auVar16._12_4_;
  auVar160._12_4_ = fVar237 * auVar167._12_4_;
  auVar247._8_4_ = 0x3f800000;
  auVar247._0_8_ = 0x3f8000003f800000;
  auVar247._12_4_ = 0x3f800000;
  auVar167 = vsubps_avx(auVar247,auVar160);
  fVar223 = fVar223 + fVar223 * auVar167._0_4_;
  fVar231 = fVar231 + fVar231 * auVar167._4_4_;
  fVar234 = fVar234 + fVar234 * auVar167._8_4_;
  fVar237 = fVar237 + fVar237 * auVar167._12_4_;
  auVar167 = vrcpps_avx(auVar180);
  fVar211 = auVar167._0_4_;
  auVar212._0_4_ = fVar211 * auVar180._0_4_;
  fVar219 = auVar167._4_4_;
  auVar212._4_4_ = fVar219 * auVar180._4_4_;
  fVar220 = auVar167._8_4_;
  auVar212._8_4_ = fVar220 * auVar180._8_4_;
  fVar221 = auVar167._12_4_;
  auVar212._12_4_ = fVar221 * auVar180._12_4_;
  auVar167 = vsubps_avx(auVar247,auVar212);
  fVar211 = fVar211 + fVar211 * auVar167._0_4_;
  fVar219 = fVar219 + fVar219 * auVar167._4_4_;
  fVar220 = fVar220 + fVar220 * auVar167._8_4_;
  fVar221 = fVar221 + fVar221 * auVar167._12_4_;
  auVar167 = vrcpps_avx(auVar214);
  fVar176 = auVar167._0_4_;
  auVar178._0_4_ = fVar176 * auVar214._0_4_;
  fVar185 = auVar167._4_4_;
  auVar178._4_4_ = fVar185 * auVar214._4_4_;
  fVar186 = auVar167._8_4_;
  auVar178._8_4_ = fVar186 * auVar214._8_4_;
  fVar187 = auVar167._12_4_;
  auVar178._12_4_ = fVar187 * auVar214._12_4_;
  auVar214 = vsubps_avx(auVar247,auVar178);
  fVar176 = fVar176 + fVar176 * auVar214._0_4_;
  fVar185 = fVar185 + fVar185 * auVar214._4_4_;
  fVar186 = fVar186 + fVar186 * auVar214._8_4_;
  fVar187 = fVar187 + fVar187 * auVar214._12_4_;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *(ulong *)(prim + uVar109 * 7 + 6);
  auVar214 = vpmovsxwd_avx(auVar214);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar180 = vsubps_avx(auVar214,auVar189);
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *(ulong *)(prim + uVar109 * 9 + 6);
  auVar214 = vpmovsxwd_avx(auVar167);
  auVar161._0_4_ = fVar223 * auVar180._0_4_;
  auVar161._4_4_ = fVar231 * auVar180._4_4_;
  auVar161._8_4_ = fVar234 * auVar180._8_4_;
  auVar161._12_4_ = fVar237 * auVar180._12_4_;
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar214 = vsubps_avx(auVar214,auVar189);
  auVar190._0_4_ = fVar223 * auVar214._0_4_;
  auVar190._4_4_ = fVar231 * auVar214._4_4_;
  auVar190._8_4_ = fVar234 * auVar214._8_4_;
  auVar190._12_4_ = fVar237 * auVar214._12_4_;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = *(ulong *)(prim + uVar109 * 0xe + 6);
  auVar214 = vpmovsxwd_avx(auVar180);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar167 = vsubps_avx(auVar214,auVar143);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + 6);
  auVar214 = vpmovsxwd_avx(auVar16);
  auVar226._0_4_ = auVar167._0_4_ * fVar211;
  auVar226._4_4_ = auVar167._4_4_ * fVar219;
  auVar226._8_4_ = auVar167._8_4_ * fVar220;
  auVar226._12_4_ = auVar167._12_4_ * fVar221;
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar214 = vsubps_avx(auVar214,auVar143);
  auVar144._0_4_ = fVar211 * auVar214._0_4_;
  auVar144._4_4_ = fVar219 * auVar214._4_4_;
  auVar144._8_4_ = fVar220 * auVar214._8_4_;
  auVar144._12_4_ = fVar221 * auVar214._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar109 * 0x15 + 6);
  auVar214 = vpmovsxwd_avx(auVar17);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar214 = vsubps_avx(auVar214,auVar119);
  auVar213._0_4_ = auVar214._0_4_ * fVar176;
  auVar213._4_4_ = auVar214._4_4_ * fVar185;
  auVar213._8_4_ = auVar214._8_4_ * fVar186;
  auVar213._12_4_ = auVar214._12_4_ * fVar187;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar109 * 0x17 + 6);
  auVar214 = vpmovsxwd_avx(auVar18);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar214 = vsubps_avx(auVar214,auVar119);
  auVar120._0_4_ = auVar214._0_4_ * fVar176;
  auVar120._4_4_ = auVar214._4_4_ * fVar185;
  auVar120._8_4_ = auVar214._8_4_ * fVar186;
  auVar120._12_4_ = auVar214._12_4_ * fVar187;
  auVar214 = vpminsd_avx(auVar161,auVar190);
  auVar167 = vpminsd_avx(auVar226,auVar144);
  auVar214 = vmaxps_avx(auVar214,auVar167);
  auVar167 = vpminsd_avx(auVar213,auVar120);
  uVar116 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar270._4_4_ = uVar116;
  auVar270._0_4_ = uVar116;
  auVar270._8_4_ = uVar116;
  auVar270._12_4_ = uVar116;
  auVar277 = ZEXT1664(auVar270);
  auVar167 = vmaxps_avx(auVar167,auVar270);
  auVar214 = vmaxps_avx(auVar214,auVar167);
  auVar258 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
  local_2d0._0_4_ = auVar214._0_4_ * 0.99999964;
  local_2d0._4_4_ = auVar214._4_4_ * 0.99999964;
  local_2d0._8_4_ = auVar214._8_4_ * 0.99999964;
  local_2d0._12_4_ = auVar214._12_4_ * 0.99999964;
  auVar214 = vpmaxsd_avx(auVar161,auVar190);
  auVar167 = vpmaxsd_avx(auVar226,auVar144);
  auVar214 = vminps_avx(auVar214,auVar167);
  auVar167 = vpmaxsd_avx(auVar213,auVar120);
  fVar211 = ray->tfar;
  auVar162._4_4_ = fVar211;
  auVar162._0_4_ = fVar211;
  auVar162._8_4_ = fVar211;
  auVar162._12_4_ = fVar211;
  auVar167 = vminps_avx(auVar167,auVar162);
  auVar214 = vminps_avx(auVar214,auVar167);
  auVar121._0_4_ = auVar214._0_4_ * 1.0000004;
  auVar121._4_4_ = auVar214._4_4_ * 1.0000004;
  auVar121._8_4_ = auVar214._8_4_ * 1.0000004;
  auVar121._12_4_ = auVar214._12_4_ * 1.0000004;
  auVar214 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar167 = vpcmpgtd_avx(auVar214,_DAT_01f4ad30);
  auVar214 = vcmpps_avx(local_2d0,auVar121,2);
  auVar214 = vandps_avx(auVar214,auVar167);
  local_480 = mm_lookupmask_ps._16_8_;
  uStack_478 = mm_lookupmask_ps._24_8_;
  uStack_470 = mm_lookupmask_ps._16_8_;
  uStack_468 = mm_lookupmask_ps._24_8_;
  uVar116 = vmovmskps_avx(auVar214);
  uVar109 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar116);
  local_7c8 = prim;
  while (auVar196 = local_680, uVar109 != 0) {
    auVar130 = auVar277._0_32_;
    auVar254 = auVar258._0_32_;
    lVar115 = 0;
    if (uVar109 != 0) {
      for (; (uVar109 >> lVar115 & 1) == 0; lVar115 = lVar115 + 1) {
      }
    }
    uVar117 = uVar109 - 1 & uVar109;
    local_770 = (ulong)*(uint *)(local_7c8 + 2);
    pGVar12 = (context->scene->geometries).items[*(uint *)(local_7c8 + 2)].ptr;
    local_5a8 = (ulong)*(uint *)(local_7c8 + lVar115 * 4 + 6);
    uVar114 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                              pGVar12[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i *
                              (ulong)*(uint *)(local_7c8 + lVar115 * 4 + 6));
    p_Var13 = pGVar12[1].intersectionFilterN;
    uVar111 = *(ulong *)&pGVar12[1].time_range.upper;
    _local_790 = *(undefined1 (*) [16])(uVar111 + (long)p_Var13 * uVar114);
    _local_600 = *(undefined1 (*) [16])(uVar111 + (uVar114 + 1) * (long)p_Var13);
    _local_780 = *(undefined1 (*) [16])(uVar111 + (uVar114 + 2) * (long)p_Var13);
    lVar115 = 0;
    if (uVar117 != 0) {
      for (; (uVar117 >> lVar115 & 1) == 0; lVar115 = lVar115 + 1) {
      }
    }
    pauVar1 = (undefined1 (*) [12])(uVar111 + (uVar114 + 3) * (long)p_Var13);
    local_220 = *(undefined8 *)*pauVar1;
    uStack_218 = *(undefined8 *)(*pauVar1 + 8);
    local_5f0 = (float)local_220;
    fStack_5ec = (float)((ulong)local_220 >> 0x20);
    fStack_5e8 = (float)uStack_218;
    fStack_5e4 = (float)((ulong)uStack_218 >> 0x20);
    if (((uVar117 != 0) && (uVar114 = uVar117 - 1 & uVar117, uVar114 != 0)) &&
       (lVar115 = 0, uVar114 != 0)) {
      for (; (uVar114 >> lVar115 & 1) == 0; lVar115 = lVar115 + 1) {
      }
    }
    uVar108 = (uint)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar9 = (ray->org).field_0;
    auVar180 = vsubps_avx(_local_790,(undefined1  [16])aVar9);
    auVar121 = _local_790;
    auVar214 = vshufps_avx(auVar180,auVar180,0);
    auVar167 = vshufps_avx(auVar180,auVar180,0x55);
    auVar180 = vshufps_avx(auVar180,auVar180,0xaa);
    fVar211 = (local_768->ray_space).vx.field_0.m128[0];
    fVar176 = (local_768->ray_space).vx.field_0.m128[1];
    fVar219 = (local_768->ray_space).vx.field_0.m128[2];
    fVar185 = (local_768->ray_space).vx.field_0.m128[3];
    fVar220 = (local_768->ray_space).vy.field_0.m128[0];
    fVar186 = (local_768->ray_space).vy.field_0.m128[1];
    fVar221 = (local_768->ray_space).vy.field_0.m128[2];
    fVar187 = (local_768->ray_space).vy.field_0.m128[3];
    fVar223 = (local_768->ray_space).vz.field_0.m128[0];
    fVar231 = (local_768->ray_space).vz.field_0.m128[1];
    fVar234 = (local_768->ray_space).vz.field_0.m128[2];
    fVar237 = (local_768->ray_space).vz.field_0.m128[3];
    auVar301._0_4_ = auVar214._0_4_ * fVar211 + auVar180._0_4_ * fVar223 + auVar167._0_4_ * fVar220;
    auVar301._4_4_ = auVar214._4_4_ * fVar176 + auVar180._4_4_ * fVar231 + auVar167._4_4_ * fVar186;
    auVar301._8_4_ = auVar214._8_4_ * fVar219 + auVar180._8_4_ * fVar234 + auVar167._8_4_ * fVar221;
    auVar301._12_4_ =
         auVar214._12_4_ * fVar185 + auVar180._12_4_ * fVar237 + auVar167._12_4_ * fVar187;
    auVar214 = vblendps_avx(auVar301,_local_790,8);
    auVar16 = vsubps_avx(_local_600,(undefined1  [16])aVar9);
    auVar167 = vshufps_avx(auVar16,auVar16,0);
    auVar180 = vshufps_avx(auVar16,auVar16,0x55);
    auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
    auVar310._0_4_ = auVar167._0_4_ * fVar211 + auVar16._0_4_ * fVar223 + auVar180._0_4_ * fVar220;
    auVar310._4_4_ = auVar167._4_4_ * fVar176 + auVar16._4_4_ * fVar231 + auVar180._4_4_ * fVar186;
    auVar310._8_4_ = auVar167._8_4_ * fVar219 + auVar16._8_4_ * fVar234 + auVar180._8_4_ * fVar221;
    auVar310._12_4_ =
         auVar167._12_4_ * fVar185 + auVar16._12_4_ * fVar237 + auVar180._12_4_ * fVar187;
    auVar167 = vblendps_avx(auVar310,_local_600,8);
    auVar17 = vsubps_avx(_local_780,(undefined1  [16])aVar9);
    auVar180 = vshufps_avx(auVar17,auVar17,0);
    auVar16 = vshufps_avx(auVar17,auVar17,0x55);
    auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
    auVar271._0_4_ = auVar180._0_4_ * fVar211 + auVar16._0_4_ * fVar220 + auVar17._0_4_ * fVar223;
    auVar271._4_4_ = auVar180._4_4_ * fVar176 + auVar16._4_4_ * fVar186 + auVar17._4_4_ * fVar231;
    auVar271._8_4_ = auVar180._8_4_ * fVar219 + auVar16._8_4_ * fVar221 + auVar17._8_4_ * fVar234;
    auVar271._12_4_ =
         auVar180._12_4_ * fVar185 + auVar16._12_4_ * fVar187 + auVar17._12_4_ * fVar237;
    auVar18 = vshufps_avx(_local_780,_local_780,0xff);
    auVar144 = _local_780;
    auVar180 = vblendps_avx(auVar271,_local_780,8);
    auVar97._12_4_ = fStack_5e4;
    auVar97._0_12_ = *pauVar1;
    auVar120 = vsubps_avx(auVar97,(undefined1  [16])aVar9);
    auVar16 = vshufps_avx(auVar120,auVar120,0);
    auVar17 = vshufps_avx(auVar120,auVar120,0x55);
    auVar120 = vshufps_avx(auVar120,auVar120,0xaa);
    auVar163._0_4_ = auVar16._0_4_ * fVar211 + auVar120._0_4_ * fVar223 + auVar17._0_4_ * fVar220;
    auVar163._4_4_ = auVar16._4_4_ * fVar176 + auVar120._4_4_ * fVar231 + auVar17._4_4_ * fVar186;
    auVar163._8_4_ = auVar16._8_4_ * fVar219 + auVar120._8_4_ * fVar234 + auVar17._8_4_ * fVar221;
    auVar163._12_4_ =
         auVar16._12_4_ * fVar185 + auVar120._12_4_ * fVar237 + auVar17._12_4_ * fVar187;
    auVar16 = vblendps_avx(auVar163,auVar97,8);
    auVar227._8_4_ = 0x7fffffff;
    auVar227._0_8_ = 0x7fffffff7fffffff;
    auVar227._12_4_ = 0x7fffffff;
    auVar214 = vandps_avx(auVar214,auVar227);
    auVar167 = vandps_avx(auVar167,auVar227);
    auVar17 = vmaxps_avx(auVar214,auVar167);
    auVar214 = vandps_avx(auVar180,auVar227);
    auVar167 = vandps_avx(auVar16,auVar227);
    auVar214 = vmaxps_avx(auVar214,auVar167);
    auVar214 = vmaxps_avx(auVar17,auVar214);
    auVar167 = vmovshdup_avx(auVar214);
    auVar167 = vmaxss_avx(auVar167,auVar214);
    auVar214 = vshufpd_avx(auVar214,auVar214,1);
    auVar214 = vmaxss_avx(auVar214,auVar167);
    local_680._0_4_ = auVar214._0_4_;
    local_7d0 = (long)(int)uVar108;
    lVar115 = local_7d0 * 0x44;
    fVar279 = *(float *)(bspline_basis0 + lVar115 + 0x908);
    fVar203 = *(float *)(bspline_basis0 + lVar115 + 0x90c);
    fVar153 = *(float *)(bspline_basis0 + lVar115 + 0x910);
    fVar259 = *(float *)(bspline_basis0 + lVar115 + 0x914);
    fVar260 = *(float *)(bspline_basis0 + lVar115 + 0x918);
    fVar205 = *(float *)(bspline_basis0 + lVar115 + 0x91c);
    fVar155 = *(float *)(bspline_basis0 + lVar115 + 0x920);
    auVar167 = vshufps_avx(auVar271,auVar271,0);
    register0x00001310 = auVar167;
    _local_540 = auVar167;
    auVar180 = vshufps_avx(auVar271,auVar271,0x55);
    local_660._16_16_ = auVar180;
    local_660._0_16_ = auVar180;
    fVar211 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar115 + 0xd8c);
    fVar176 = *(float *)(bspline_basis0 + lVar115 + 0xd90);
    fVar219 = *(float *)(bspline_basis0 + lVar115 + 0xd94);
    fVar185 = *(float *)(bspline_basis0 + lVar115 + 0xd98);
    fVar220 = *(float *)(bspline_basis0 + lVar115 + 0xd9c);
    fVar186 = *(float *)(bspline_basis0 + lVar115 + 0xda0);
    fVar221 = *(float *)(bspline_basis0 + lVar115 + 0xda4);
    auVar103 = *(undefined1 (*) [28])(bspline_basis0 + lVar115 + 0xd8c);
    auVar16 = vshufps_avx(auVar163,auVar163,0);
    register0x00001510 = auVar16;
    _local_400 = auVar16;
    auVar17 = vshufps_avx(auVar163,auVar163,0x55);
    register0x00001290 = auVar17;
    _local_5a0 = auVar17;
    fVar290 = auVar16._0_4_;
    fVar296 = auVar16._4_4_;
    fVar297 = auVar16._8_4_;
    fVar298 = auVar16._12_4_;
    fVar156 = auVar17._0_4_;
    fVar158 = auVar17._4_4_;
    fVar224 = auVar17._8_4_;
    fVar233 = auVar17._12_4_;
    fVar236 = auVar167._0_4_;
    fVar239 = auVar167._4_4_;
    fVar240 = auVar167._8_4_;
    fVar241 = auVar167._12_4_;
    fVar244 = auVar180._0_4_;
    fVar251 = auVar180._4_4_;
    fVar252 = auVar180._8_4_;
    fVar253 = auVar180._12_4_;
    auVar167 = vshufps_avx(auVar97,auVar97,0xff);
    local_7c0._0_4_ = auVar18._0_4_;
    local_80 = (float)local_7c0._0_4_;
    local_7c0._4_4_ = auVar18._4_4_;
    fStack_7c = (float)local_7c0._4_4_;
    fStack_7b8 = auVar18._8_4_;
    fStack_78 = fStack_7b8;
    fStack_7b4 = auVar18._12_4_;
    fStack_74 = fStack_7b4;
    register0x00001410 = auVar167;
    _local_140 = auVar167;
    fVar172 = auVar167._0_4_;
    fVar173 = auVar167._4_4_;
    fVar174 = auVar167._8_4_;
    fVar261 = auVar167._12_4_;
    auVar167 = vshufps_avx(auVar310,auVar310,0);
    register0x00001390 = auVar167;
    _local_120 = auVar167;
    fVar263 = *(float *)(bspline_basis0 + lVar115 + 0x484);
    fVar265 = *(float *)(bspline_basis0 + lVar115 + 0x488);
    fVar207 = *(float *)(bspline_basis0 + lVar115 + 0x48c);
    fVar157 = *(float *)(bspline_basis0 + lVar115 + 0x490);
    fVar267 = *(float *)(bspline_basis0 + lVar115 + 0x494);
    fVar269 = *(float *)(bspline_basis0 + lVar115 + 0x498);
    fVar209 = *(float *)(bspline_basis0 + lVar115 + 0x49c);
    fVar243 = auVar167._0_4_;
    fVar232 = auVar167._4_4_;
    fVar235 = auVar167._8_4_;
    fVar238 = auVar167._12_4_;
    auVar167 = vshufps_avx(auVar310,auVar310,0x55);
    register0x00001590 = auVar167;
    _local_6c0 = auVar167;
    fVar308 = auVar167._0_4_;
    fVar313 = auVar167._4_4_;
    fVar316 = auVar167._8_4_;
    fVar318 = auVar167._12_4_;
    auVar18 = _local_600;
    auVar167 = vshufps_avx(_local_600,_local_600,0xff);
    register0x000015d0 = auVar167;
    _local_a0 = auVar167;
    fVar309 = auVar167._0_4_;
    fVar314 = auVar167._4_4_;
    fVar317 = auVar167._8_4_;
    fVar319 = auVar167._12_4_;
    auVar167 = vshufps_avx(auVar301,auVar301,0);
    register0x00001250 = auVar167;
    _local_720 = auVar167;
    pauVar2 = (undefined1 (*) [32])(bspline_basis0 + lVar115);
    fVar187 = *(float *)*pauVar2;
    fVar223 = *(float *)(bspline_basis0 + lVar115 + 4);
    fVar231 = *(float *)(bspline_basis0 + lVar115 + 8);
    fVar234 = *(float *)(bspline_basis0 + lVar115 + 0xc);
    fVar237 = *(float *)(bspline_basis0 + lVar115 + 0x10);
    fVar278 = *(float *)(bspline_basis0 + lVar115 + 0x14);
    fVar242 = *(float *)(bspline_basis0 + lVar115 + 0x18);
    auVar104 = *(undefined1 (*) [28])*pauVar2;
    fVar150 = auVar167._0_4_;
    fVar151 = auVar167._4_4_;
    fVar152 = auVar167._8_4_;
    fVar154 = auVar167._12_4_;
    auVar272._0_4_ = fVar150 * fVar187 + fVar243 * fVar263 + fVar236 * fVar279 + fVar290 * fVar211;
    auVar272._4_4_ = fVar151 * fVar223 + fVar232 * fVar265 + fVar239 * fVar203 + fVar296 * fVar176;
    auVar272._8_4_ = fVar152 * fVar231 + fVar235 * fVar207 + fVar240 * fVar153 + fVar297 * fVar219;
    auVar272._12_4_ = fVar154 * fVar234 + fVar238 * fVar157 + fVar241 * fVar259 + fVar298 * fVar185;
    auVar273._16_4_ = fVar150 * fVar237 + fVar243 * fVar267 + fVar236 * fVar260 + fVar290 * fVar220;
    auVar273._0_16_ = auVar272;
    auVar273._20_4_ = fVar151 * fVar278 + fVar232 * fVar269 + fVar239 * fVar205 + fVar296 * fVar186;
    auVar273._24_4_ = fVar152 * fVar242 + fVar235 * fVar209 + fVar240 * fVar155 + fVar297 * fVar221;
    auVar273._28_4_ = fVar253 + *(float *)(bspline_basis0 + lVar115 + 0x924) + fVar241 + 0.0;
    auVar167 = vshufps_avx(auVar301,auVar301,0x55);
    register0x00001550 = auVar167;
    _local_500 = auVar167;
    fVar299 = auVar167._0_4_;
    fVar304 = auVar167._4_4_;
    fVar305 = auVar167._8_4_;
    fVar306 = auVar167._12_4_;
    auVar169._0_4_ = fVar299 * fVar187 + fVar308 * fVar263 + fVar244 * fVar279 + fVar156 * fVar211;
    auVar169._4_4_ = fVar304 * fVar223 + fVar313 * fVar265 + fVar251 * fVar203 + fVar158 * fVar176;
    auVar169._8_4_ = fVar305 * fVar231 + fVar316 * fVar207 + fVar252 * fVar153 + fVar224 * fVar219;
    auVar169._12_4_ = fVar306 * fVar234 + fVar318 * fVar157 + fVar253 * fVar259 + fVar233 * fVar185;
    auVar169._16_4_ = fVar299 * fVar237 + fVar308 * fVar267 + fVar244 * fVar260 + fVar156 * fVar220;
    auVar169._20_4_ = fVar304 * fVar278 + fVar313 * fVar269 + fVar251 * fVar205 + fVar158 * fVar186;
    auVar169._24_4_ = fVar305 * fVar242 + fVar316 * fVar209 + fVar252 * fVar155 + fVar224 * fVar221;
    auVar169._28_4_ = fVar241 + 0.0 + 0.0 + 0.0;
    auVar167 = vpermilps_avx(_local_790,0xff);
    register0x00001490 = auVar167;
    _local_c0 = auVar167;
    _local_460 = *pauVar2;
    auVar23 = _local_460;
    fVar281 = auVar167._0_4_;
    fVar287 = auVar167._4_4_;
    fVar288 = auVar167._8_4_;
    fVar118 = fVar281 * fVar187 +
              fVar309 * fVar263 + (float)local_7c0._0_4_ * fVar279 + fVar172 * fVar211;
    fVar135 = fVar287 * fVar223 +
              fVar314 * fVar265 + (float)local_7c0._4_4_ * fVar203 + fVar173 * fVar176;
    fVar137 = fVar288 * fVar231 + fVar317 * fVar207 + fStack_7b8 * fVar153 + fVar174 * fVar219;
    fStack_7b4 = auVar167._12_4_ * fVar234 +
                 fVar319 * fVar157 + fStack_7b4 * fVar259 + fVar261 * fVar185;
    fStack_7b0 = fVar281 * fVar237 +
                 fVar309 * fVar267 + (float)local_7c0._0_4_ * fVar260 + fVar172 * fVar220;
    fStack_7ac = fVar287 * fVar278 +
                 fVar314 * fVar269 + (float)local_7c0._4_4_ * fVar205 + fVar173 * fVar186;
    fStack_7a8 = fVar288 * fVar242 + fVar317 * fVar209 + fStack_7b8 * fVar155 + fVar174 * fVar221;
    local_7c0._4_4_ = fVar135;
    local_7c0._0_4_ = fVar118;
    fStack_7b8 = fVar137;
    fStack_7a4 = 0.0;
    fVar175 = *(float *)(bspline_basis1 + lVar115 + 0x908);
    fVar159 = *(float *)(bspline_basis1 + lVar115 + 0x90c);
    fVar280 = *(float *)(bspline_basis1 + lVar115 + 0x910);
    fVar136 = *(float *)(bspline_basis1 + lVar115 + 0x914);
    fVar138 = *(float *)(bspline_basis1 + lVar115 + 0x918);
    fVar210 = *(float *)(bspline_basis1 + lVar115 + 0x91c);
    fVar139 = *(float *)(bspline_basis1 + lVar115 + 0x920);
    fVar140 = *(float *)(bspline_basis1 + lVar115 + 0xd8c);
    fVar141 = *(float *)(bspline_basis1 + lVar115 + 0xd90);
    fVar188 = *(float *)(bspline_basis1 + lVar115 + 0xd94);
    fVar200 = *(float *)(bspline_basis1 + lVar115 + 0xd98);
    fVar201 = *(float *)(bspline_basis1 + lVar115 + 0xd9c);
    fVar202 = *(float *)(bspline_basis1 + lVar115 + 0xda0);
    fVar204 = *(float *)(bspline_basis1 + lVar115 + 0xda4);
    fStack_70 = local_80;
    fStack_6c = fStack_7c;
    fStack_68 = fStack_78;
    fStack_64 = fStack_74;
    fVar206 = *(float *)(bspline_basis1 + lVar115 + 0x484);
    fVar208 = *(float *)(bspline_basis1 + lVar115 + 0x488);
    fVar307 = *(float *)(bspline_basis1 + lVar115 + 0x48c);
    fVar262 = *(float *)(bspline_basis1 + lVar115 + 0x490);
    fVar264 = *(float *)(bspline_basis1 + lVar115 + 0x494);
    fVar266 = *(float *)(bspline_basis1 + lVar115 + 0x498);
    fVar268 = *(float *)(bspline_basis1 + lVar115 + 0x49c);
    fVar222 = fVar261 + 0.0 + 0.0;
    auVar10 = *(undefined1 (*) [32])(bspline_basis1 + lVar115);
    auVar184 = ZEXT3264(auVar10);
    fVar211 = auVar10._0_4_;
    fVar219 = auVar10._4_4_;
    fVar220 = auVar10._8_4_;
    fVar221 = auVar10._12_4_;
    fVar223 = auVar10._16_4_;
    fVar234 = auVar10._20_4_;
    fVar278 = auVar10._24_4_;
    local_340._0_4_ = fVar150 * fVar211 + fVar206 * fVar243 + fVar175 * fVar236 + fVar290 * fVar140;
    local_340._4_4_ = fVar151 * fVar219 + fVar208 * fVar232 + fVar159 * fVar239 + fVar296 * fVar141;
    local_340._8_4_ = fVar152 * fVar220 + fVar307 * fVar235 + fVar280 * fVar240 + fVar297 * fVar188;
    local_340._12_4_ = fVar154 * fVar221 + fVar262 * fVar238 + fVar136 * fVar241 + fVar298 * fVar200
    ;
    local_340._16_4_ = fVar150 * fVar223 + fVar264 * fVar243 + fVar138 * fVar236 + fVar290 * fVar201
    ;
    local_340._20_4_ = fVar151 * fVar234 + fVar266 * fVar232 + fVar210 * fVar239 + fVar296 * fVar202
    ;
    local_340._24_4_ = fVar152 * fVar278 + fVar268 * fVar235 + fVar139 * fVar240 + fVar297 * fVar204
    ;
    local_340._28_4_ = fVar319 + fVar318 + 0.0;
    local_4a0._0_4_ = fVar299 * fVar211 + fVar308 * fVar206 + fVar175 * fVar244 + fVar140 * fVar156;
    local_4a0._4_4_ = fVar304 * fVar219 + fVar313 * fVar208 + fVar159 * fVar251 + fVar141 * fVar158;
    fStack_498 = fVar305 * fVar220 + fVar316 * fVar307 + fVar280 * fVar252 + fVar188 * fVar224;
    fStack_494 = fVar306 * fVar221 + fVar318 * fVar262 + fVar136 * fVar253 + fVar200 * fVar233;
    fStack_490 = fVar299 * fVar223 + fVar308 * fVar264 + fVar138 * fVar244 + fVar201 * fVar156;
    fStack_48c = fVar304 * fVar234 + fVar313 * fVar266 + fVar210 * fVar251 + fVar202 * fVar158;
    fStack_488 = fVar305 * fVar278 + fVar316 * fVar268 + fVar139 * fVar252 + fVar204 * fVar224;
    fStack_484 = fVar318 + 0.0 + 0.0;
    local_640._0_4_ = fVar281 * fVar211 + fVar309 * fVar206 + local_80 * fVar175 + fVar172 * fVar140
    ;
    local_640._4_4_ =
         fVar287 * fVar219 + fVar314 * fVar208 + fStack_7c * fVar159 + fVar173 * fVar141;
    local_640._8_4_ =
         fVar288 * fVar220 + fVar317 * fVar307 + fStack_78 * fVar280 + fVar174 * fVar188;
    local_640._12_4_ =
         auVar167._12_4_ * fVar221 + fVar319 * fVar262 + fStack_74 * fVar136 + fVar261 * fVar200;
    local_640._16_4_ =
         fVar281 * fVar223 + fVar309 * fVar264 + local_80 * fVar138 + fVar172 * fVar201;
    local_640._20_4_ =
         fVar287 * fVar234 + fVar314 * fVar266 + fStack_7c * fVar210 + fVar173 * fVar202;
    local_640._24_4_ =
         fVar288 * fVar278 + fVar317 * fVar268 + fStack_78 * fVar139 + fVar174 * fVar204;
    local_640._28_4_ = fVar222 + 0.0;
    auVar19 = vsubps_avx(local_340,auVar273);
    auVar20 = vsubps_avx(_local_4a0,auVar169);
    fVar172 = auVar19._0_4_;
    fVar173 = auVar19._4_4_;
    auVar15._4_4_ = fVar173 * auVar169._4_4_;
    auVar15._0_4_ = fVar172 * auVar169._0_4_;
    fVar174 = auVar19._8_4_;
    auVar15._8_4_ = fVar174 * auVar169._8_4_;
    fVar261 = auVar19._12_4_;
    auVar15._12_4_ = fVar261 * auVar169._12_4_;
    fVar281 = auVar19._16_4_;
    auVar15._16_4_ = fVar281 * auVar169._16_4_;
    fVar287 = auVar19._20_4_;
    auVar15._20_4_ = fVar287 * auVar169._20_4_;
    fVar288 = auVar19._24_4_;
    auVar15._24_4_ = fVar288 * auVar169._24_4_;
    auVar15._28_4_ = 0;
    fVar176 = auVar20._0_4_;
    fVar185 = auVar20._4_4_;
    auVar21._4_4_ = auVar272._4_4_ * fVar185;
    auVar21._0_4_ = auVar272._0_4_ * fVar176;
    fVar186 = auVar20._8_4_;
    auVar21._8_4_ = auVar272._8_4_ * fVar186;
    fVar187 = auVar20._12_4_;
    auVar21._12_4_ = auVar272._12_4_ * fVar187;
    fVar231 = auVar20._16_4_;
    auVar21._16_4_ = auVar273._16_4_ * fVar231;
    fVar237 = auVar20._20_4_;
    auVar21._20_4_ = auVar273._20_4_ * fVar237;
    fVar242 = auVar20._24_4_;
    auVar21._24_4_ = auVar273._24_4_ * fVar242;
    auVar21._28_4_ = fVar222;
    auVar21 = vsubps_avx(auVar15,auVar21);
    auVar15 = vmaxps_avx(_local_7c0,local_640);
    auVar25._4_4_ = auVar15._4_4_ * auVar15._4_4_ * (fVar173 * fVar173 + fVar185 * fVar185);
    auVar25._0_4_ = auVar15._0_4_ * auVar15._0_4_ * (fVar172 * fVar172 + fVar176 * fVar176);
    auVar25._8_4_ = auVar15._8_4_ * auVar15._8_4_ * (fVar174 * fVar174 + fVar186 * fVar186);
    auVar25._12_4_ = auVar15._12_4_ * auVar15._12_4_ * (fVar261 * fVar261 + fVar187 * fVar187);
    auVar25._16_4_ = auVar15._16_4_ * auVar15._16_4_ * (fVar281 * fVar281 + fVar231 * fVar231);
    auVar25._20_4_ = auVar15._20_4_ * auVar15._20_4_ * (fVar287 * fVar287 + fVar237 * fVar237);
    auVar25._24_4_ = auVar15._24_4_ * auVar15._24_4_ * (fVar288 * fVar288 + fVar242 * fVar242);
    auVar25._28_4_ = fStack_484 + fVar222;
    auVar14._4_4_ = auVar21._4_4_ * auVar21._4_4_;
    auVar14._0_4_ = auVar21._0_4_ * auVar21._0_4_;
    auVar14._8_4_ = auVar21._8_4_ * auVar21._8_4_;
    auVar14._12_4_ = auVar21._12_4_ * auVar21._12_4_;
    auVar14._16_4_ = auVar21._16_4_ * auVar21._16_4_;
    auVar14._20_4_ = auVar21._20_4_ * auVar21._20_4_;
    auVar14._24_4_ = auVar21._24_4_ * auVar21._24_4_;
    auVar14._28_4_ = auVar21._28_4_;
    auVar15 = vcmpps_avx(auVar14,auVar25,2);
    auVar199 = ZEXT3264(auVar15);
    fVar176 = auVar214._0_4_ * 4.7683716e-07;
    local_420._0_4_ = (undefined4)(int)uVar108;
    register0x00001344 = auVar272._4_12_;
    auVar214 = vshufps_avx(_local_420,_local_420,0);
    auVar215._16_16_ = auVar214;
    auVar215._0_16_ = auVar214;
    auVar21 = vcmpps_avx(_DAT_01f7b060,auVar215,1);
    auVar214 = vpermilps_avx(auVar301,0xaa);
    register0x00001490 = auVar214;
    _local_3e0 = auVar214;
    auVar167 = vpermilps_avx(auVar310,0xaa);
    register0x00001590 = auVar167;
    _local_320 = auVar167;
    auVar180 = vpermilps_avx(auVar271,0xaa);
    register0x000015d0 = auVar180;
    _local_300 = auVar180;
    auVar16 = vpermilps_avx(auVar163,0xaa);
    register0x00001290 = auVar16;
    _local_520 = auVar16;
    auVar25 = auVar21 & auVar15;
    auVar17 = vpermilps_avx((undefined1  [16])aVar9,0xff);
    local_620 = ZEXT1632(auVar17);
    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar25 >> 0x7f,0) == '\0') &&
          (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar25 >> 0xbf,0) == '\0') &&
        (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar25[0x1f]) {
      uVar111 = 0;
      auVar258 = ZEXT3264(auVar254);
      auVar277 = ZEXT3264(auVar130);
      auVar323 = ZEXT3264(_local_6c0);
      auVar218 = ZEXT3264(_local_720);
      auVar214 = ZEXT416((uint)fVar176);
      local_620._0_16_ = auVar17;
    }
    else {
      local_680._16_16_ = auVar196._16_16_;
      local_680._0_16_ = ZEXT416((uint)fVar176);
      local_360 = vandps_avx(auVar15,auVar21);
      fVar261 = auVar214._0_4_;
      fVar281 = auVar214._4_4_;
      fVar287 = auVar214._8_4_;
      fVar288 = auVar214._12_4_;
      fVar309 = auVar167._0_4_;
      fVar314 = auVar167._4_4_;
      fVar317 = auVar167._8_4_;
      fVar319 = auVar167._12_4_;
      fVar320 = auVar180._0_4_;
      fVar324 = auVar180._4_4_;
      fVar325 = auVar180._8_4_;
      fVar326 = auVar180._12_4_;
      fVar222 = auVar16._0_4_;
      fVar172 = auVar16._4_4_;
      fVar173 = auVar16._8_4_;
      fVar174 = auVar16._12_4_;
      fVar185 = auVar15._28_4_ + auVar21._28_4_ + 0.0;
      local_380._0_4_ =
           fVar261 * fVar211 + fVar309 * fVar206 + fVar320 * fVar175 + fVar222 * fVar140;
      local_380._4_4_ =
           fVar281 * fVar219 + fVar314 * fVar208 + fVar324 * fVar159 + fVar172 * fVar141;
      fStack_378 = fVar287 * fVar220 + fVar317 * fVar307 + fVar325 * fVar280 + fVar173 * fVar188;
      fStack_374 = fVar288 * fVar221 + fVar319 * fVar262 + fVar326 * fVar136 + fVar174 * fVar200;
      fStack_370 = fVar261 * fVar223 + fVar309 * fVar264 + fVar320 * fVar138 + fVar222 * fVar201;
      fStack_36c = fVar281 * fVar234 + fVar314 * fVar266 + fVar324 * fVar210 + fVar172 * fVar202;
      fStack_368 = fVar287 * fVar278 + fVar317 * fVar268 + fVar325 * fVar139 + fVar173 * fVar204;
      fStack_364 = auVar10._28_4_ + fVar185;
      local_460._0_4_ = auVar104._0_4_;
      local_460._4_4_ = auVar104._4_4_;
      fStack_458 = auVar104._8_4_;
      fStack_454 = auVar104._12_4_;
      fStack_450 = auVar104._16_4_;
      fStack_44c = auVar104._20_4_;
      fStack_448 = auVar104._24_4_;
      local_580._0_4_ = auVar103._0_4_;
      local_580._4_4_ = auVar103._4_4_;
      fStack_578 = auVar103._8_4_;
      fStack_574 = auVar103._12_4_;
      fStack_570 = auVar103._16_4_;
      fStack_56c = auVar103._20_4_;
      fStack_568 = auVar103._24_4_;
      local_560 = fVar261 * (float)local_460._0_4_ +
                  fVar309 * fVar263 + fVar320 * fVar279 + fVar222 * (float)local_580._0_4_;
      fStack_55c = fVar281 * (float)local_460._4_4_ +
                   fVar314 * fVar265 + fVar324 * fVar203 + fVar172 * (float)local_580._4_4_;
      fStack_558 = fVar287 * fStack_458 +
                   fVar317 * fVar207 + fVar325 * fVar153 + fVar173 * fStack_578;
      fStack_554 = fVar288 * fStack_454 +
                   fVar319 * fVar157 + fVar326 * fVar259 + fVar174 * fStack_574;
      fStack_550 = fVar261 * fStack_450 +
                   fVar309 * fVar267 + fVar320 * fVar260 + fVar222 * fStack_570;
      fStack_54c = fVar281 * fStack_44c +
                   fVar314 * fVar269 + fVar324 * fVar205 + fVar172 * fStack_56c;
      fStack_548 = fVar287 * fStack_448 +
                   fVar317 * fVar209 + fVar325 * fVar155 + fVar173 * fStack_568;
      fStack_544 = local_360._28_4_ + fStack_364 + auVar10._28_4_ + fVar185;
      fVar211 = *(float *)(bspline_basis0 + lVar115 + 0x1210);
      fVar219 = *(float *)(bspline_basis0 + lVar115 + 0x1214);
      fVar185 = *(float *)(bspline_basis0 + lVar115 + 0x1218);
      fVar220 = *(float *)(bspline_basis0 + lVar115 + 0x121c);
      fVar186 = *(float *)(bspline_basis0 + lVar115 + 0x1220);
      fVar221 = *(float *)(bspline_basis0 + lVar115 + 0x1224);
      fVar187 = *(float *)(bspline_basis0 + lVar115 + 0x1228);
      fVar223 = *(float *)(bspline_basis0 + lVar115 + 0x1694);
      fVar231 = *(float *)(bspline_basis0 + lVar115 + 0x1698);
      fVar234 = *(float *)(bspline_basis0 + lVar115 + 0x169c);
      fVar237 = *(float *)(bspline_basis0 + lVar115 + 0x16a0);
      fVar278 = *(float *)(bspline_basis0 + lVar115 + 0x16a4);
      fVar242 = *(float *)(bspline_basis0 + lVar115 + 0x16a8);
      fVar279 = *(float *)(bspline_basis0 + lVar115 + 0x16ac);
      fVar203 = *(float *)(bspline_basis0 + lVar115 + 0x1b18);
      fVar153 = *(float *)(bspline_basis0 + lVar115 + 0x1b1c);
      fVar259 = *(float *)(bspline_basis0 + lVar115 + 0x1b20);
      fVar260 = *(float *)(bspline_basis0 + lVar115 + 0x1b24);
      fVar205 = *(float *)(bspline_basis0 + lVar115 + 0x1b28);
      fVar155 = *(float *)(bspline_basis0 + lVar115 + 0x1b2c);
      fVar263 = *(float *)(bspline_basis0 + lVar115 + 0x1b30);
      fVar265 = *(float *)(bspline_basis0 + lVar115 + 0x1f9c);
      fVar207 = *(float *)(bspline_basis0 + lVar115 + 0x1fa0);
      fVar157 = *(float *)(bspline_basis0 + lVar115 + 0x1fa4);
      fVar267 = *(float *)(bspline_basis0 + lVar115 + 0x1fa8);
      fVar269 = *(float *)(bspline_basis0 + lVar115 + 0x1fac);
      fVar209 = *(float *)(bspline_basis0 + lVar115 + 0x1fb0);
      fVar175 = *(float *)(bspline_basis0 + lVar115 + 0x1fb4);
      fVar159 = *(float *)(bspline_basis0 + lVar115 + 0x1b34) +
                *(float *)(bspline_basis0 + lVar115 + 0x1fb8);
      fVar280 = *(float *)(bspline_basis0 + lVar115 + 0x16b0) + fVar159;
      local_4e0 = fVar150 * fVar211 + fVar243 * fVar223 + fVar236 * fVar203 + fVar290 * fVar265;
      fStack_4dc = fVar151 * fVar219 + fVar232 * fVar231 + fVar239 * fVar153 + fVar296 * fVar207;
      fStack_4d8 = fVar152 * fVar185 + fVar235 * fVar234 + fVar240 * fVar259 + fVar297 * fVar157;
      fStack_4d4 = fVar154 * fVar220 + fVar238 * fVar237 + fVar241 * fVar260 + fVar298 * fVar267;
      fStack_4d0 = fVar150 * fVar186 + fVar243 * fVar278 + fVar236 * fVar205 + fVar290 * fVar269;
      fStack_4cc = fVar151 * fVar221 + fVar232 * fVar242 + fVar239 * fVar155 + fVar296 * fVar209;
      fStack_4c8 = fVar152 * fVar187 + fVar235 * fVar279 + fVar240 * fVar263 + fVar297 * fVar175;
      fStack_4c4 = *(float *)(bspline_basis0 + lVar115 + 0x16b0) +
                   *(float *)(bspline_basis0 + lVar115 + 0x1fb8) +
                   auVar273._28_4_ + *(float *)(bspline_basis1 + lVar115 + 0xda8);
      auVar145._0_4_ = fVar299 * fVar211 + fVar244 * fVar203 + fVar156 * fVar265 + fVar308 * fVar223
      ;
      auVar145._4_4_ = fVar304 * fVar219 + fVar251 * fVar153 + fVar158 * fVar207 + fVar313 * fVar231
      ;
      auVar145._8_4_ = fVar305 * fVar185 + fVar252 * fVar259 + fVar224 * fVar157 + fVar316 * fVar234
      ;
      auVar145._12_4_ =
           fVar306 * fVar220 + fVar253 * fVar260 + fVar233 * fVar267 + fVar318 * fVar237;
      auVar145._16_4_ =
           fVar299 * fVar186 + fVar244 * fVar205 + fVar156 * fVar269 + fVar308 * fVar278;
      auVar145._20_4_ =
           fVar304 * fVar221 + fVar251 * fVar155 + fVar158 * fVar209 + fVar313 * fVar242;
      auVar145._24_4_ =
           fVar305 * fVar187 + fVar252 * fVar263 + fVar224 * fVar175 + fVar316 * fVar279;
      auVar145._28_4_ =
           fVar159 + auVar273._28_4_ + auVar19._28_4_ +
                     auVar273._28_4_ + *(float *)(bspline_basis1 + lVar115 + 0xda8);
      auVar182._0_4_ = fVar309 * fVar223 + fVar320 * fVar203 + fVar222 * fVar265 + fVar261 * fVar211
      ;
      auVar182._4_4_ = fVar314 * fVar231 + fVar324 * fVar153 + fVar172 * fVar207 + fVar281 * fVar219
      ;
      auVar182._8_4_ = fVar317 * fVar234 + fVar325 * fVar259 + fVar173 * fVar157 + fVar287 * fVar185
      ;
      auVar182._12_4_ =
           fVar319 * fVar237 + fVar326 * fVar260 + fVar174 * fVar267 + fVar288 * fVar220;
      auVar182._16_4_ =
           fVar309 * fVar278 + fVar320 * fVar205 + fVar222 * fVar269 + fVar261 * fVar186;
      auVar182._20_4_ =
           fVar314 * fVar242 + fVar324 * fVar155 + fVar172 * fVar209 + fVar281 * fVar221;
      auVar182._24_4_ =
           fVar317 * fVar279 + fVar325 * fVar263 + fVar173 * fVar175 + fVar287 * fVar187;
      auVar182._28_4_ = fVar280 + *(float *)(bspline_basis0 + lVar115 + 0x122c);
      fVar211 = *(float *)(bspline_basis1 + lVar115 + 0x1b18);
      fVar219 = *(float *)(bspline_basis1 + lVar115 + 0x1b1c);
      fVar185 = *(float *)(bspline_basis1 + lVar115 + 0x1b20);
      fVar220 = *(float *)(bspline_basis1 + lVar115 + 0x1b24);
      fVar186 = *(float *)(bspline_basis1 + lVar115 + 0x1b28);
      fVar221 = *(float *)(bspline_basis1 + lVar115 + 0x1b2c);
      fVar187 = *(float *)(bspline_basis1 + lVar115 + 0x1b30);
      fVar223 = *(float *)(bspline_basis1 + lVar115 + 0x1f9c);
      fVar231 = *(float *)(bspline_basis1 + lVar115 + 0x1fa0);
      fVar234 = *(float *)(bspline_basis1 + lVar115 + 0x1fa4);
      fVar237 = *(float *)(bspline_basis1 + lVar115 + 0x1fa8);
      fVar278 = *(float *)(bspline_basis1 + lVar115 + 0x1fac);
      fVar242 = *(float *)(bspline_basis1 + lVar115 + 0x1fb0);
      fVar279 = *(float *)(bspline_basis1 + lVar115 + 0x1fb4);
      fVar307 = fVar280 + fVar298;
      fVar203 = *(float *)(bspline_basis1 + lVar115 + 0x1694);
      fVar153 = *(float *)(bspline_basis1 + lVar115 + 0x1698);
      fVar259 = *(float *)(bspline_basis1 + lVar115 + 0x169c);
      fVar260 = *(float *)(bspline_basis1 + lVar115 + 0x16a0);
      fVar205 = *(float *)(bspline_basis1 + lVar115 + 0x16a4);
      fVar155 = *(float *)(bspline_basis1 + lVar115 + 0x16a8);
      fVar263 = *(float *)(bspline_basis1 + lVar115 + 0x16ac);
      fVar265 = *(float *)(bspline_basis1 + lVar115 + 0x1210);
      fVar207 = *(float *)(bspline_basis1 + lVar115 + 0x1214);
      fVar157 = *(float *)(bspline_basis1 + lVar115 + 0x1218);
      fVar267 = *(float *)(bspline_basis1 + lVar115 + 0x121c);
      fVar269 = *(float *)(bspline_basis1 + lVar115 + 0x1220);
      fVar209 = *(float *)(bspline_basis1 + lVar115 + 0x1224);
      fVar175 = *(float *)(bspline_basis1 + lVar115 + 0x1228);
      auVar255._0_4_ = fVar150 * fVar265 + fVar243 * fVar203 + fVar236 * fVar211 + fVar290 * fVar223
      ;
      auVar255._4_4_ = fVar151 * fVar207 + fVar232 * fVar153 + fVar239 * fVar219 + fVar296 * fVar231
      ;
      auVar255._8_4_ = fVar152 * fVar157 + fVar235 * fVar259 + fVar240 * fVar185 + fVar297 * fVar234
      ;
      auVar255._12_4_ =
           fVar154 * fVar267 + fVar238 * fVar260 + fVar241 * fVar220 + fVar298 * fVar237;
      auVar255._16_4_ =
           fVar150 * fVar269 + fVar243 * fVar205 + fVar236 * fVar186 + fVar290 * fVar278;
      auVar255._20_4_ =
           fVar151 * fVar209 + fVar232 * fVar155 + fVar239 * fVar221 + fVar296 * fVar242;
      auVar255._24_4_ =
           fVar152 * fVar175 + fVar235 * fVar263 + fVar240 * fVar187 + fVar297 * fVar279;
      auVar255._28_4_ = fVar288 + fVar288 + fVar307;
      auVar274._0_4_ = fVar299 * fVar265 + fVar203 * fVar308 + fVar244 * fVar211 + fVar156 * fVar223
      ;
      auVar274._4_4_ = fVar304 * fVar207 + fVar153 * fVar313 + fVar251 * fVar219 + fVar158 * fVar231
      ;
      auVar274._8_4_ = fVar305 * fVar157 + fVar259 * fVar316 + fVar252 * fVar185 + fVar224 * fVar234
      ;
      auVar274._12_4_ =
           fVar306 * fVar267 + fVar260 * fVar318 + fVar253 * fVar220 + fVar233 * fVar237;
      auVar274._16_4_ =
           fVar299 * fVar269 + fVar205 * fVar308 + fVar244 * fVar186 + fVar156 * fVar278;
      auVar274._20_4_ =
           fVar304 * fVar209 + fVar155 * fVar313 + fVar251 * fVar221 + fVar158 * fVar242;
      auVar274._24_4_ =
           fVar305 * fVar175 + fVar263 * fVar316 + fVar252 * fVar187 + fVar224 * fVar279;
      auVar274._28_4_ = fVar288 + fVar288 + fVar288 + fVar280;
      auVar193._0_4_ = fVar261 * fVar265 + fVar309 * fVar203 + fVar320 * fVar211 + fVar222 * fVar223
      ;
      auVar193._4_4_ = fVar281 * fVar207 + fVar314 * fVar153 + fVar324 * fVar219 + fVar172 * fVar231
      ;
      auVar193._8_4_ = fVar287 * fVar157 + fVar317 * fVar259 + fVar325 * fVar185 + fVar173 * fVar234
      ;
      auVar193._12_4_ =
           fVar288 * fVar267 + fVar319 * fVar260 + fVar326 * fVar220 + fVar174 * fVar237;
      auVar193._16_4_ =
           fVar261 * fVar269 + fVar309 * fVar205 + fVar320 * fVar186 + fVar222 * fVar278;
      auVar193._20_4_ =
           fVar281 * fVar209 + fVar314 * fVar155 + fVar324 * fVar221 + fVar172 * fVar242;
      auVar193._24_4_ =
           fVar287 * fVar175 + fVar317 * fVar263 + fVar325 * fVar187 + fVar173 * fVar279;
      auVar193._28_4_ =
           *(float *)(bspline_basis1 + lVar115 + 0x122c) +
           *(float *)(bspline_basis1 + lVar115 + 0x16b0) +
           *(float *)(bspline_basis1 + lVar115 + 0x1b34) +
           *(float *)(bspline_basis1 + lVar115 + 0x1fb8);
      auVar170._8_4_ = 0x7fffffff;
      auVar170._0_8_ = 0x7fffffff7fffffff;
      auVar170._12_4_ = 0x7fffffff;
      auVar170._16_4_ = 0x7fffffff;
      auVar170._20_4_ = 0x7fffffff;
      auVar170._24_4_ = 0x7fffffff;
      auVar170._28_4_ = 0x7fffffff;
      auVar100._4_4_ = fStack_4dc;
      auVar100._0_4_ = local_4e0;
      auVar100._8_4_ = fStack_4d8;
      auVar100._12_4_ = fStack_4d4;
      auVar100._16_4_ = fStack_4d0;
      auVar100._20_4_ = fStack_4cc;
      auVar100._24_4_ = fStack_4c8;
      auVar100._28_4_ = fStack_4c4;
      auVar196 = vandps_avx(auVar100,auVar170);
      auVar10 = vandps_avx(auVar145,auVar170);
      auVar10 = vmaxps_avx(auVar196,auVar10);
      auVar196 = vandps_avx(auVar182,auVar170);
      auVar196 = vmaxps_avx(auVar10,auVar196);
      auVar214 = vpermilps_avx(ZEXT416((uint)fVar176),0);
      auVar248._16_16_ = auVar214;
      auVar248._0_16_ = auVar214;
      auVar196 = vcmpps_avx(auVar196,auVar248,1);
      auVar15 = vblendvps_avx(auVar100,auVar19,auVar196);
      auVar21 = vblendvps_avx(auVar145,auVar20,auVar196);
      auVar196 = vandps_avx(auVar255,auVar170);
      auVar10 = vandps_avx(auVar274,auVar170);
      auVar25 = vmaxps_avx(auVar196,auVar10);
      auVar196 = vandps_avx(auVar193,auVar170);
      auVar196 = vmaxps_avx(auVar25,auVar196);
      auVar25 = vcmpps_avx(auVar196,auVar248,1);
      auVar196 = vblendvps_avx(auVar255,auVar19,auVar25);
      auVar19 = vblendvps_avx(auVar274,auVar20,auVar25);
      fVar280 = auVar15._0_4_;
      fVar136 = auVar15._4_4_;
      fVar138 = auVar15._8_4_;
      fVar210 = auVar15._12_4_;
      fVar139 = auVar15._16_4_;
      fVar140 = auVar15._20_4_;
      fVar141 = auVar15._24_4_;
      fVar188 = auVar196._0_4_;
      fVar200 = auVar196._4_4_;
      fVar201 = auVar196._8_4_;
      fVar202 = auVar196._12_4_;
      fVar204 = auVar196._16_4_;
      fVar206 = auVar196._20_4_;
      fVar208 = auVar196._24_4_;
      fVar211 = auVar21._0_4_;
      fVar220 = auVar21._4_4_;
      fVar223 = auVar21._8_4_;
      fVar278 = auVar21._12_4_;
      fVar153 = auVar21._16_4_;
      fVar155 = auVar21._20_4_;
      fVar157 = auVar21._24_4_;
      auVar124._0_4_ = fVar211 * fVar211 + fVar280 * fVar280;
      auVar124._4_4_ = fVar220 * fVar220 + fVar136 * fVar136;
      auVar124._8_4_ = fVar223 * fVar223 + fVar138 * fVar138;
      auVar124._12_4_ = fVar278 * fVar278 + fVar210 * fVar210;
      auVar124._16_4_ = fVar153 * fVar153 + fVar139 * fVar139;
      auVar124._20_4_ = fVar155 * fVar155 + fVar140 * fVar140;
      auVar124._24_4_ = fVar157 * fVar157 + fVar141 * fVar141;
      auVar124._28_4_ = auVar274._28_4_ + auVar15._28_4_;
      auVar15 = vrsqrtps_avx(auVar124);
      fVar176 = auVar15._0_4_;
      fVar219 = auVar15._4_4_;
      auVar20._4_4_ = fVar219 * 1.5;
      auVar20._0_4_ = fVar176 * 1.5;
      fVar185 = auVar15._8_4_;
      auVar20._8_4_ = fVar185 * 1.5;
      fVar186 = auVar15._12_4_;
      auVar20._12_4_ = fVar186 * 1.5;
      fVar221 = auVar15._16_4_;
      auVar20._16_4_ = fVar221 * 1.5;
      fVar187 = auVar15._20_4_;
      auVar20._20_4_ = fVar187 * 1.5;
      fVar231 = auVar15._24_4_;
      auVar20._24_4_ = fVar231 * 1.5;
      auVar20._28_4_ = auVar10._28_4_;
      auVar24._4_4_ = fVar219 * fVar219 * fVar219 * auVar124._4_4_ * 0.5;
      auVar24._0_4_ = fVar176 * fVar176 * fVar176 * auVar124._0_4_ * 0.5;
      auVar24._8_4_ = fVar185 * fVar185 * fVar185 * auVar124._8_4_ * 0.5;
      auVar24._12_4_ = fVar186 * fVar186 * fVar186 * auVar124._12_4_ * 0.5;
      auVar24._16_4_ = fVar221 * fVar221 * fVar221 * auVar124._16_4_ * 0.5;
      auVar24._20_4_ = fVar187 * fVar187 * fVar187 * auVar124._20_4_ * 0.5;
      auVar24._24_4_ = fVar231 * fVar231 * fVar231 * auVar124._24_4_ * 0.5;
      auVar24._28_4_ = auVar124._28_4_;
      auVar15 = vsubps_avx(auVar20,auVar24);
      fVar176 = auVar15._0_4_;
      fVar186 = auVar15._4_4_;
      fVar231 = auVar15._8_4_;
      fVar242 = auVar15._12_4_;
      fVar259 = auVar15._16_4_;
      fVar263 = auVar15._20_4_;
      fVar267 = auVar15._24_4_;
      fVar175 = auVar21._28_4_;
      fVar219 = auVar19._0_4_;
      fVar221 = auVar19._4_4_;
      fVar234 = auVar19._8_4_;
      fVar279 = auVar19._12_4_;
      fVar260 = auVar19._16_4_;
      fVar265 = auVar19._20_4_;
      fVar269 = auVar19._24_4_;
      auVar125._0_4_ = fVar219 * fVar219 + fVar188 * fVar188;
      auVar125._4_4_ = fVar221 * fVar221 + fVar200 * fVar200;
      auVar125._8_4_ = fVar234 * fVar234 + fVar201 * fVar201;
      auVar125._12_4_ = fVar279 * fVar279 + fVar202 * fVar202;
      auVar125._16_4_ = fVar260 * fVar260 + fVar204 * fVar204;
      auVar125._20_4_ = fVar265 * fVar265 + fVar206 * fVar206;
      auVar125._24_4_ = fVar269 * fVar269 + fVar208 * fVar208;
      auVar125._28_4_ = auVar196._28_4_ + auVar15._28_4_;
      auVar196 = vrsqrtps_avx(auVar125);
      fVar185 = auVar196._0_4_;
      fVar187 = auVar196._4_4_;
      auVar22._4_4_ = fVar187 * 1.5;
      auVar22._0_4_ = fVar185 * 1.5;
      fVar237 = auVar196._8_4_;
      auVar22._8_4_ = fVar237 * 1.5;
      fVar203 = auVar196._12_4_;
      auVar22._12_4_ = fVar203 * 1.5;
      fVar205 = auVar196._16_4_;
      auVar22._16_4_ = fVar205 * 1.5;
      fVar207 = auVar196._20_4_;
      auVar22._20_4_ = fVar207 * 1.5;
      fVar209 = auVar196._24_4_;
      auVar22._24_4_ = fVar209 * 1.5;
      auVar22._28_4_ = auVar10._28_4_;
      fVar159 = auVar196._28_4_;
      auVar196._4_4_ = fVar187 * fVar187 * fVar187 * auVar125._4_4_ * 0.5;
      auVar196._0_4_ = fVar185 * fVar185 * fVar185 * auVar125._0_4_ * 0.5;
      auVar196._8_4_ = fVar237 * fVar237 * fVar237 * auVar125._8_4_ * 0.5;
      auVar196._12_4_ = fVar203 * fVar203 * fVar203 * auVar125._12_4_ * 0.5;
      auVar196._16_4_ = fVar205 * fVar205 * fVar205 * auVar125._16_4_ * 0.5;
      auVar196._20_4_ = fVar207 * fVar207 * fVar207 * auVar125._20_4_ * 0.5;
      auVar196._24_4_ = fVar209 * fVar209 * fVar209 * auVar125._24_4_ * 0.5;
      auVar196._28_4_ = auVar125._28_4_;
      auVar196 = vsubps_avx(auVar22,auVar196);
      fVar185 = auVar196._0_4_;
      fVar187 = auVar196._4_4_;
      fVar237 = auVar196._8_4_;
      fVar203 = auVar196._12_4_;
      fVar205 = auVar196._16_4_;
      fVar207 = auVar196._20_4_;
      fVar209 = auVar196._24_4_;
      fVar211 = fVar118 * fVar211 * fVar176;
      fVar220 = fVar135 * fVar220 * fVar186;
      auVar10._4_4_ = fVar220;
      auVar10._0_4_ = fVar211;
      fVar223 = fVar137 * fVar223 * fVar231;
      auVar10._8_4_ = fVar223;
      fVar278 = fStack_7b4 * fVar278 * fVar242;
      auVar10._12_4_ = fVar278;
      fVar153 = fStack_7b0 * fVar153 * fVar259;
      auVar10._16_4_ = fVar153;
      fVar155 = fStack_7ac * fVar155 * fVar263;
      auVar10._20_4_ = fVar155;
      fVar157 = fStack_7a8 * fVar157 * fVar267;
      auVar10._24_4_ = fVar157;
      auVar10._28_4_ = fVar175;
      local_580._4_4_ = auVar272._4_4_ + fVar220;
      local_580._0_4_ = auVar272._0_4_ + fVar211;
      fStack_578 = auVar272._8_4_ + fVar223;
      fStack_574 = auVar272._12_4_ + fVar278;
      fStack_570 = auVar273._16_4_ + fVar153;
      fStack_56c = auVar273._20_4_ + fVar155;
      fStack_568 = auVar273._24_4_ + fVar157;
      fStack_564 = auVar273._28_4_ + fVar175;
      fVar211 = fVar118 * fVar176 * -fVar280;
      fVar220 = fVar135 * fVar186 * -fVar136;
      auVar26._4_4_ = fVar220;
      auVar26._0_4_ = fVar211;
      fVar223 = fVar137 * fVar231 * -fVar138;
      auVar26._8_4_ = fVar223;
      fVar278 = fStack_7b4 * fVar242 * -fVar210;
      auVar26._12_4_ = fVar278;
      fVar153 = fStack_7b0 * fVar259 * -fVar139;
      auVar26._16_4_ = fVar153;
      fVar155 = fStack_7ac * fVar263 * -fVar140;
      auVar26._20_4_ = fVar155;
      fVar157 = fStack_7a8 * fVar267 * -fVar141;
      auVar26._24_4_ = fVar157;
      auVar26._28_4_ = 0x3f000000;
      local_4c0._4_4_ = fVar220 + auVar169._4_4_;
      local_4c0._0_4_ = fVar211 + auVar169._0_4_;
      fStack_4b8 = fVar223 + auVar169._8_4_;
      fStack_4b4 = fVar278 + auVar169._12_4_;
      fStack_4b0 = fVar153 + auVar169._16_4_;
      fStack_4ac = fVar155 + auVar169._20_4_;
      fStack_4a8 = fVar157 + auVar169._24_4_;
      fStack_4a4 = auVar169._28_4_ + 0.5;
      fVar211 = fVar118 * fVar176 * 0.0;
      fVar176 = fVar135 * fVar186 * 0.0;
      auVar27._4_4_ = fVar176;
      auVar27._0_4_ = fVar211;
      fVar220 = fVar137 * fVar231 * 0.0;
      auVar27._8_4_ = fVar220;
      fVar186 = fStack_7b4 * fVar242 * 0.0;
      auVar27._12_4_ = fVar186;
      fVar223 = fStack_7b0 * fVar259 * 0.0;
      auVar27._16_4_ = fVar223;
      fVar231 = fStack_7ac * fVar263 * 0.0;
      auVar27._20_4_ = fVar231;
      fVar278 = fStack_7a8 * fVar267 * 0.0;
      auVar27._24_4_ = fVar278;
      auVar27._28_4_ = fVar307;
      auVar98._4_4_ = fStack_55c;
      auVar98._0_4_ = local_560;
      auVar98._8_4_ = fStack_558;
      auVar98._12_4_ = fStack_554;
      auVar98._16_4_ = fStack_550;
      auVar98._20_4_ = fStack_54c;
      auVar98._24_4_ = fStack_548;
      auVar98._28_4_ = fStack_544;
      auVar256._0_4_ = fVar211 + local_560;
      auVar256._4_4_ = fVar176 + fStack_55c;
      auVar256._8_4_ = fVar220 + fStack_558;
      auVar256._12_4_ = fVar186 + fStack_554;
      auVar256._16_4_ = fVar223 + fStack_550;
      auVar256._20_4_ = fVar231 + fStack_54c;
      auVar256._24_4_ = fVar278 + fStack_548;
      auVar256._28_4_ = fVar307 + fStack_544;
      fVar211 = local_640._0_4_ * fVar219 * fVar185;
      fVar176 = local_640._4_4_ * fVar221 * fVar187;
      auVar28._4_4_ = fVar176;
      auVar28._0_4_ = fVar211;
      fVar219 = local_640._8_4_ * fVar234 * fVar237;
      auVar28._8_4_ = fVar219;
      fVar220 = local_640._12_4_ * fVar279 * fVar203;
      auVar28._12_4_ = fVar220;
      fVar186 = local_640._16_4_ * fVar260 * fVar205;
      auVar28._16_4_ = fVar186;
      fVar221 = local_640._20_4_ * fVar265 * fVar207;
      auVar28._20_4_ = fVar221;
      fVar223 = local_640._24_4_ * fVar269 * fVar209;
      auVar28._24_4_ = fVar223;
      auVar28._28_4_ = auVar19._28_4_;
      auVar20 = vsubps_avx(auVar273,auVar10);
      auVar283._0_4_ = local_340._0_4_ + fVar211;
      auVar283._4_4_ = local_340._4_4_ + fVar176;
      auVar283._8_4_ = local_340._8_4_ + fVar219;
      auVar283._12_4_ = local_340._12_4_ + fVar220;
      auVar283._16_4_ = local_340._16_4_ + fVar186;
      auVar283._20_4_ = local_340._20_4_ + fVar221;
      auVar283._24_4_ = local_340._24_4_ + fVar223;
      auVar283._28_4_ = local_340._28_4_ + auVar19._28_4_;
      fVar211 = local_640._0_4_ * -fVar188 * fVar185;
      fVar176 = local_640._4_4_ * -fVar200 * fVar187;
      auVar19._4_4_ = fVar176;
      auVar19._0_4_ = fVar211;
      fVar219 = local_640._8_4_ * -fVar201 * fVar237;
      auVar19._8_4_ = fVar219;
      fVar220 = local_640._12_4_ * -fVar202 * fVar203;
      auVar19._12_4_ = fVar220;
      fVar186 = local_640._16_4_ * -fVar204 * fVar205;
      auVar19._16_4_ = fVar186;
      fVar221 = local_640._20_4_ * -fVar206 * fVar207;
      auVar19._20_4_ = fVar221;
      fVar223 = local_640._24_4_ * -fVar208 * fVar209;
      auVar19._24_4_ = fVar223;
      auVar19._28_4_ = fVar175;
      auVar169 = vsubps_avx(auVar169,auVar26);
      auVar311._0_4_ = (float)local_4a0._0_4_ + fVar211;
      auVar311._4_4_ = (float)local_4a0._4_4_ + fVar176;
      auVar311._8_4_ = fStack_498 + fVar219;
      auVar311._12_4_ = fStack_494 + fVar220;
      auVar311._16_4_ = fStack_490 + fVar186;
      auVar311._20_4_ = fStack_48c + fVar221;
      auVar311._24_4_ = fStack_488 + fVar223;
      auVar311._28_4_ = fStack_484 + fVar175;
      fVar211 = fVar185 * 0.0 * local_640._0_4_;
      fVar176 = fVar187 * 0.0 * local_640._4_4_;
      auVar29._4_4_ = fVar176;
      auVar29._0_4_ = fVar211;
      fVar219 = fVar237 * 0.0 * local_640._8_4_;
      auVar29._8_4_ = fVar219;
      fVar185 = fVar203 * 0.0 * local_640._12_4_;
      auVar29._12_4_ = fVar185;
      fVar220 = fVar205 * 0.0 * local_640._16_4_;
      auVar29._16_4_ = fVar220;
      fVar186 = fVar207 * 0.0 * local_640._20_4_;
      auVar29._20_4_ = fVar186;
      fVar221 = fVar209 * 0.0 * local_640._24_4_;
      auVar29._24_4_ = fVar221;
      auVar29._28_4_ = fVar159;
      auVar25 = vsubps_avx(auVar98,auVar27);
      auVar321._0_4_ = (float)local_380._0_4_ + fVar211;
      auVar321._4_4_ = (float)local_380._4_4_ + fVar176;
      auVar321._8_4_ = fStack_378 + fVar219;
      auVar321._12_4_ = fStack_374 + fVar185;
      auVar321._16_4_ = fStack_370 + fVar220;
      auVar321._20_4_ = fStack_36c + fVar186;
      auVar321._24_4_ = fStack_368 + fVar221;
      auVar321._28_4_ = fStack_364 + fVar159;
      auVar196 = vsubps_avx(local_340,auVar28);
      auVar10 = vsubps_avx(_local_4a0,auVar19);
      auVar15 = vsubps_avx(_local_380,auVar29);
      auVar21 = vsubps_avx(auVar311,auVar169);
      auVar19 = vsubps_avx(auVar321,auVar25);
      auVar30._4_4_ = auVar25._4_4_ * auVar21._4_4_;
      auVar30._0_4_ = auVar25._0_4_ * auVar21._0_4_;
      auVar30._8_4_ = auVar25._8_4_ * auVar21._8_4_;
      auVar30._12_4_ = auVar25._12_4_ * auVar21._12_4_;
      auVar30._16_4_ = auVar25._16_4_ * auVar21._16_4_;
      auVar30._20_4_ = auVar25._20_4_ * auVar21._20_4_;
      auVar30._24_4_ = auVar25._24_4_ * auVar21._24_4_;
      auVar30._28_4_ = fVar159;
      auVar31._4_4_ = auVar169._4_4_ * auVar19._4_4_;
      auVar31._0_4_ = auVar169._0_4_ * auVar19._0_4_;
      auVar31._8_4_ = auVar169._8_4_ * auVar19._8_4_;
      auVar31._12_4_ = auVar169._12_4_ * auVar19._12_4_;
      auVar31._16_4_ = auVar169._16_4_ * auVar19._16_4_;
      auVar31._20_4_ = auVar169._20_4_ * auVar19._20_4_;
      auVar31._24_4_ = auVar169._24_4_ * auVar19._24_4_;
      auVar31._28_4_ = fStack_364;
      auVar14 = vsubps_avx(auVar31,auVar30);
      auVar32._4_4_ = auVar20._4_4_ * auVar19._4_4_;
      auVar32._0_4_ = auVar20._0_4_ * auVar19._0_4_;
      auVar32._8_4_ = auVar20._8_4_ * auVar19._8_4_;
      auVar32._12_4_ = auVar20._12_4_ * auVar19._12_4_;
      auVar32._16_4_ = auVar20._16_4_ * auVar19._16_4_;
      auVar32._20_4_ = auVar20._20_4_ * auVar19._20_4_;
      auVar32._24_4_ = auVar20._24_4_ * auVar19._24_4_;
      auVar32._28_4_ = auVar19._28_4_;
      auVar215 = vsubps_avx(auVar283,auVar20);
      auVar33._4_4_ = auVar25._4_4_ * auVar215._4_4_;
      auVar33._0_4_ = auVar25._0_4_ * auVar215._0_4_;
      auVar33._8_4_ = auVar25._8_4_ * auVar215._8_4_;
      auVar33._12_4_ = auVar25._12_4_ * auVar215._12_4_;
      auVar33._16_4_ = auVar25._16_4_ * auVar215._16_4_;
      auVar33._20_4_ = auVar25._20_4_ * auVar215._20_4_;
      auVar33._24_4_ = auVar25._24_4_ * auVar215._24_4_;
      auVar33._28_4_ = fStack_484;
      auVar273 = vsubps_avx(auVar33,auVar32);
      auVar34._4_4_ = auVar169._4_4_ * auVar215._4_4_;
      auVar34._0_4_ = auVar169._0_4_ * auVar215._0_4_;
      auVar34._8_4_ = auVar169._8_4_ * auVar215._8_4_;
      auVar34._12_4_ = auVar169._12_4_ * auVar215._12_4_;
      auVar34._16_4_ = auVar169._16_4_ * auVar215._16_4_;
      auVar34._20_4_ = auVar169._20_4_ * auVar215._20_4_;
      auVar34._24_4_ = auVar169._24_4_ * auVar215._24_4_;
      auVar34._28_4_ = auVar19._28_4_;
      auVar35._4_4_ = auVar20._4_4_ * auVar21._4_4_;
      auVar35._0_4_ = auVar20._0_4_ * auVar21._0_4_;
      auVar35._8_4_ = auVar20._8_4_ * auVar21._8_4_;
      auVar35._12_4_ = auVar20._12_4_ * auVar21._12_4_;
      auVar35._16_4_ = auVar20._16_4_ * auVar21._16_4_;
      auVar35._20_4_ = auVar20._20_4_ * auVar21._20_4_;
      auVar35._24_4_ = auVar20._24_4_ * auVar21._24_4_;
      auVar35._28_4_ = auVar21._28_4_;
      auVar21 = vsubps_avx(auVar35,auVar34);
      auVar126._0_4_ = auVar14._0_4_ * 0.0 + auVar21._0_4_ + auVar273._0_4_ * 0.0;
      auVar126._4_4_ = auVar14._4_4_ * 0.0 + auVar21._4_4_ + auVar273._4_4_ * 0.0;
      auVar126._8_4_ = auVar14._8_4_ * 0.0 + auVar21._8_4_ + auVar273._8_4_ * 0.0;
      auVar126._12_4_ = auVar14._12_4_ * 0.0 + auVar21._12_4_ + auVar273._12_4_ * 0.0;
      auVar126._16_4_ = auVar14._16_4_ * 0.0 + auVar21._16_4_ + auVar273._16_4_ * 0.0;
      auVar126._20_4_ = auVar14._20_4_ * 0.0 + auVar21._20_4_ + auVar273._20_4_ * 0.0;
      auVar126._24_4_ = auVar14._24_4_ * 0.0 + auVar21._24_4_ + auVar273._24_4_ * 0.0;
      auVar126._28_4_ = auVar21._28_4_ + auVar21._28_4_ + auVar273._28_4_;
      auVar14 = vcmpps_avx(auVar126,ZEXT832(0) << 0x20,2);
      auVar184 = ZEXT3264(auVar14);
      local_6a0 = vblendvps_avx(auVar196,_local_580,auVar14);
      local_440 = vblendvps_avx(auVar10,_local_4c0,auVar14);
      auVar196 = vblendvps_avx(auVar15,auVar256,auVar14);
      auVar10 = vblendvps_avx(auVar20,auVar283,auVar14);
      auVar15 = vblendvps_avx(auVar169,auVar311,auVar14);
      auVar21 = vblendvps_avx(auVar25,auVar321,auVar14);
      auVar19 = vblendvps_avx(auVar283,auVar20,auVar14);
      auVar20 = vblendvps_avx(auVar311,auVar169,auVar14);
      auVar214 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
      auVar25 = vblendvps_avx(auVar321,auVar25,auVar14);
      auVar19 = vsubps_avx(auVar19,local_6a0);
      auVar20 = vsubps_avx(auVar20,local_440);
      auVar25 = vsubps_avx(auVar25,auVar196);
      auVar215 = vsubps_avx(local_440,auVar15);
      fVar211 = auVar20._0_4_;
      fVar140 = auVar196._0_4_;
      fVar186 = auVar20._4_4_;
      fVar141 = auVar196._4_4_;
      auVar36._4_4_ = fVar141 * fVar186;
      auVar36._0_4_ = fVar140 * fVar211;
      fVar234 = auVar20._8_4_;
      fVar188 = auVar196._8_4_;
      auVar36._8_4_ = fVar188 * fVar234;
      fVar203 = auVar20._12_4_;
      fVar200 = auVar196._12_4_;
      auVar36._12_4_ = fVar200 * fVar203;
      fVar155 = auVar20._16_4_;
      fVar201 = auVar196._16_4_;
      auVar36._16_4_ = fVar201 * fVar155;
      fVar267 = auVar20._20_4_;
      fVar202 = auVar196._20_4_;
      auVar36._20_4_ = fVar202 * fVar267;
      fVar280 = auVar20._24_4_;
      fVar204 = auVar196._24_4_;
      auVar36._24_4_ = fVar204 * fVar280;
      auVar36._28_4_ = local_360._28_4_;
      fVar176 = local_440._0_4_;
      fVar150 = auVar25._0_4_;
      fVar221 = local_440._4_4_;
      fVar151 = auVar25._4_4_;
      auVar37._4_4_ = fVar151 * fVar221;
      auVar37._0_4_ = fVar150 * fVar176;
      fVar237 = local_440._8_4_;
      fVar152 = auVar25._8_4_;
      auVar37._8_4_ = fVar152 * fVar237;
      fVar153 = local_440._12_4_;
      fVar154 = auVar25._12_4_;
      auVar37._12_4_ = fVar154 * fVar153;
      fVar263 = local_440._16_4_;
      fVar156 = auVar25._16_4_;
      auVar37._16_4_ = fVar156 * fVar263;
      fVar269 = local_440._20_4_;
      fVar158 = auVar25._20_4_;
      auVar37._20_4_ = fVar158 * fVar269;
      fVar136 = local_440._24_4_;
      fVar224 = auVar25._24_4_;
      uVar116 = auVar169._28_4_;
      auVar37._24_4_ = fVar224 * fVar136;
      auVar37._28_4_ = uVar116;
      auVar169 = vsubps_avx(auVar37,auVar36);
      fVar219 = local_6a0._0_4_;
      fVar187 = local_6a0._4_4_;
      auVar38._4_4_ = fVar151 * fVar187;
      auVar38._0_4_ = fVar150 * fVar219;
      fVar278 = local_6a0._8_4_;
      auVar38._8_4_ = fVar152 * fVar278;
      fVar259 = local_6a0._12_4_;
      auVar38._12_4_ = fVar154 * fVar259;
      fVar265 = local_6a0._16_4_;
      auVar38._16_4_ = fVar156 * fVar265;
      fVar209 = local_6a0._20_4_;
      auVar38._20_4_ = fVar158 * fVar209;
      fVar138 = local_6a0._24_4_;
      auVar38._24_4_ = fVar224 * fVar138;
      auVar38._28_4_ = uVar116;
      fVar185 = auVar19._0_4_;
      fVar223 = auVar19._4_4_;
      auVar39._4_4_ = fVar141 * fVar223;
      auVar39._0_4_ = fVar140 * fVar185;
      fVar242 = auVar19._8_4_;
      auVar39._8_4_ = fVar188 * fVar242;
      fVar260 = auVar19._12_4_;
      auVar39._12_4_ = fVar200 * fVar260;
      fVar207 = auVar19._16_4_;
      auVar39._16_4_ = fVar201 * fVar207;
      fVar175 = auVar19._20_4_;
      auVar39._20_4_ = fVar202 * fVar175;
      fVar210 = auVar19._24_4_;
      auVar39._24_4_ = fVar204 * fVar210;
      auVar39._28_4_ = auVar311._28_4_;
      auVar273 = vsubps_avx(auVar39,auVar38);
      auVar40._4_4_ = fVar221 * fVar223;
      auVar40._0_4_ = fVar176 * fVar185;
      auVar40._8_4_ = fVar237 * fVar242;
      auVar40._12_4_ = fVar153 * fVar260;
      auVar40._16_4_ = fVar263 * fVar207;
      auVar40._20_4_ = fVar269 * fVar175;
      auVar40._24_4_ = fVar136 * fVar210;
      auVar40._28_4_ = uVar116;
      auVar41._4_4_ = fVar187 * fVar186;
      auVar41._0_4_ = fVar219 * fVar211;
      auVar41._8_4_ = fVar278 * fVar234;
      auVar41._12_4_ = fVar259 * fVar203;
      auVar41._16_4_ = fVar265 * fVar155;
      auVar41._20_4_ = fVar209 * fVar267;
      auVar41._24_4_ = fVar138 * fVar280;
      auVar41._28_4_ = auVar321._28_4_;
      auVar24 = vsubps_avx(auVar41,auVar40);
      auVar22 = vsubps_avx(auVar196,auVar21);
      fVar220 = auVar24._28_4_ + auVar273._28_4_;
      auVar194._0_4_ = auVar24._0_4_ + auVar273._0_4_ * 0.0 + auVar169._0_4_ * 0.0;
      auVar194._4_4_ = auVar24._4_4_ + auVar273._4_4_ * 0.0 + auVar169._4_4_ * 0.0;
      auVar194._8_4_ = auVar24._8_4_ + auVar273._8_4_ * 0.0 + auVar169._8_4_ * 0.0;
      auVar194._12_4_ = auVar24._12_4_ + auVar273._12_4_ * 0.0 + auVar169._12_4_ * 0.0;
      auVar194._16_4_ = auVar24._16_4_ + auVar273._16_4_ * 0.0 + auVar169._16_4_ * 0.0;
      auVar194._20_4_ = auVar24._20_4_ + auVar273._20_4_ * 0.0 + auVar169._20_4_ * 0.0;
      auVar194._24_4_ = auVar24._24_4_ + auVar273._24_4_ * 0.0 + auVar169._24_4_ * 0.0;
      auVar194._28_4_ = fVar220 + 0.0;
      fVar206 = auVar215._0_4_;
      fVar208 = auVar215._4_4_;
      auVar42._4_4_ = fVar208 * auVar21._4_4_;
      auVar42._0_4_ = fVar206 * auVar21._0_4_;
      fVar307 = auVar215._8_4_;
      auVar42._8_4_ = fVar307 * auVar21._8_4_;
      fVar262 = auVar215._12_4_;
      auVar42._12_4_ = fVar262 * auVar21._12_4_;
      fVar264 = auVar215._16_4_;
      auVar42._16_4_ = fVar264 * auVar21._16_4_;
      fVar266 = auVar215._20_4_;
      auVar42._20_4_ = fVar266 * auVar21._20_4_;
      fVar268 = auVar215._24_4_;
      auVar42._24_4_ = fVar268 * auVar21._24_4_;
      auVar42._28_4_ = fVar220;
      fVar220 = auVar22._0_4_;
      fVar231 = auVar22._4_4_;
      auVar43._4_4_ = auVar15._4_4_ * fVar231;
      auVar43._0_4_ = auVar15._0_4_ * fVar220;
      fVar279 = auVar22._8_4_;
      auVar43._8_4_ = auVar15._8_4_ * fVar279;
      fVar205 = auVar22._12_4_;
      auVar43._12_4_ = auVar15._12_4_ * fVar205;
      fVar157 = auVar22._16_4_;
      auVar43._16_4_ = auVar15._16_4_ * fVar157;
      fVar159 = auVar22._20_4_;
      auVar43._20_4_ = auVar15._20_4_ * fVar159;
      fVar139 = auVar22._24_4_;
      auVar43._24_4_ = auVar15._24_4_ * fVar139;
      auVar43._28_4_ = auVar24._28_4_;
      auVar196 = vsubps_avx(auVar43,auVar42);
      auVar169 = vsubps_avx(local_6a0,auVar10);
      fVar233 = auVar169._0_4_;
      fVar236 = auVar169._4_4_;
      auVar44._4_4_ = fVar236 * auVar21._4_4_;
      auVar44._0_4_ = fVar233 * auVar21._0_4_;
      fVar239 = auVar169._8_4_;
      auVar44._8_4_ = fVar239 * auVar21._8_4_;
      fVar240 = auVar169._12_4_;
      auVar44._12_4_ = fVar240 * auVar21._12_4_;
      fVar241 = auVar169._16_4_;
      auVar44._16_4_ = fVar241 * auVar21._16_4_;
      fVar222 = auVar169._20_4_;
      auVar44._20_4_ = fVar222 * auVar21._20_4_;
      fVar243 = auVar169._24_4_;
      auVar44._24_4_ = fVar243 * auVar21._24_4_;
      auVar44._28_4_ = auVar21._28_4_;
      auVar45._4_4_ = auVar10._4_4_ * fVar231;
      auVar45._0_4_ = auVar10._0_4_ * fVar220;
      auVar45._8_4_ = auVar10._8_4_ * fVar279;
      auVar45._12_4_ = auVar10._12_4_ * fVar205;
      auVar45._16_4_ = auVar10._16_4_ * fVar157;
      auVar45._20_4_ = auVar10._20_4_ * fVar159;
      auVar45._24_4_ = auVar10._24_4_ * fVar139;
      auVar45._28_4_ = 0;
      auVar169 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = auVar15._4_4_ * fVar236;
      auVar46._0_4_ = auVar15._0_4_ * fVar233;
      auVar46._8_4_ = auVar15._8_4_ * fVar239;
      auVar46._12_4_ = auVar15._12_4_ * fVar240;
      auVar46._16_4_ = auVar15._16_4_ * fVar241;
      auVar46._20_4_ = auVar15._20_4_ * fVar222;
      auVar46._24_4_ = auVar15._24_4_ * fVar243;
      auVar46._28_4_ = auVar21._28_4_;
      auVar47._4_4_ = auVar10._4_4_ * fVar208;
      auVar47._0_4_ = auVar10._0_4_ * fVar206;
      auVar47._8_4_ = auVar10._8_4_ * fVar307;
      auVar47._12_4_ = auVar10._12_4_ * fVar262;
      auVar47._16_4_ = auVar10._16_4_ * fVar264;
      auVar47._20_4_ = auVar10._20_4_ * fVar266;
      auVar47._24_4_ = auVar10._24_4_ * fVar268;
      auVar47._28_4_ = auVar10._28_4_;
      auVar10 = vsubps_avx(auVar47,auVar46);
      auVar171._0_4_ = auVar196._0_4_ * 0.0 + auVar10._0_4_ + auVar169._0_4_ * 0.0;
      auVar171._4_4_ = auVar196._4_4_ * 0.0 + auVar10._4_4_ + auVar169._4_4_ * 0.0;
      auVar171._8_4_ = auVar196._8_4_ * 0.0 + auVar10._8_4_ + auVar169._8_4_ * 0.0;
      auVar171._12_4_ = auVar196._12_4_ * 0.0 + auVar10._12_4_ + auVar169._12_4_ * 0.0;
      auVar171._16_4_ = auVar196._16_4_ * 0.0 + auVar10._16_4_ + auVar169._16_4_ * 0.0;
      auVar171._20_4_ = auVar196._20_4_ * 0.0 + auVar10._20_4_ + auVar169._20_4_ * 0.0;
      auVar171._24_4_ = auVar196._24_4_ * 0.0 + auVar10._24_4_ + auVar169._24_4_ * 0.0;
      auVar171._28_4_ = auVar10._28_4_ + auVar10._28_4_ + auVar169._28_4_;
      auVar196 = vmaxps_avx(auVar194,auVar171);
      auVar196 = vcmpps_avx(auVar196,ZEXT832(0) << 0x20,2);
      auVar167 = vpackssdw_avx(auVar196._0_16_,auVar196._16_16_);
      auVar214 = vpand_avx(auVar214,auVar167);
      auVar167 = vpmovsxwd_avx(auVar214);
      auVar180 = vpunpckhwd_avx(auVar214,auVar214);
      auVar127._16_16_ = auVar180;
      auVar127._0_16_ = auVar167;
      if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar127 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar127 >> 0x7f,0) == '\0') &&
            (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar180 >> 0x3f,0) == '\0') &&
          (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar180[0xf]
         ) {
LAB_00865748:
        auVar277 = ZEXT3264(auVar130);
        auVar258 = ZEXT3264(auVar254);
        auVar199 = ZEXT3264(CONCAT824(uStack_468,
                                      CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
      }
      else {
        _local_4a0 = auVar194;
        auVar48._4_4_ = fVar231 * fVar186;
        auVar48._0_4_ = fVar220 * fVar211;
        auVar48._8_4_ = fVar279 * fVar234;
        auVar48._12_4_ = fVar205 * fVar203;
        auVar48._16_4_ = fVar157 * fVar155;
        auVar48._20_4_ = fVar159 * fVar267;
        auVar48._24_4_ = fVar139 * fVar280;
        auVar48._28_4_ = auVar180._12_4_;
        auVar292._0_4_ = fVar206 * fVar150;
        auVar292._4_4_ = fVar208 * fVar151;
        auVar292._8_4_ = fVar307 * fVar152;
        auVar292._12_4_ = fVar262 * fVar154;
        auVar292._16_4_ = fVar264 * fVar156;
        auVar292._20_4_ = fVar266 * fVar158;
        auVar292._24_4_ = fVar268 * fVar224;
        auVar292._28_4_ = 0;
        auVar10 = vsubps_avx(auVar292,auVar48);
        auVar49._4_4_ = fVar236 * fVar151;
        auVar49._0_4_ = fVar233 * fVar150;
        auVar49._8_4_ = fVar239 * fVar152;
        auVar49._12_4_ = fVar240 * fVar154;
        auVar49._16_4_ = fVar241 * fVar156;
        auVar49._20_4_ = fVar222 * fVar158;
        auVar49._24_4_ = fVar243 * fVar224;
        auVar49._28_4_ = auVar25._28_4_;
        auVar50._4_4_ = fVar231 * fVar223;
        auVar50._0_4_ = fVar220 * fVar185;
        auVar50._8_4_ = fVar279 * fVar242;
        auVar50._12_4_ = fVar205 * fVar260;
        auVar50._16_4_ = fVar157 * fVar207;
        auVar50._20_4_ = fVar159 * fVar175;
        auVar50._24_4_ = fVar139 * fVar210;
        auVar50._28_4_ = auVar22._28_4_;
        auVar15 = vsubps_avx(auVar50,auVar49);
        auVar51._4_4_ = fVar208 * fVar223;
        auVar51._0_4_ = fVar206 * fVar185;
        auVar51._8_4_ = fVar307 * fVar242;
        auVar51._12_4_ = fVar262 * fVar260;
        auVar51._16_4_ = fVar264 * fVar207;
        auVar51._20_4_ = fVar266 * fVar175;
        auVar51._24_4_ = fVar268 * fVar210;
        auVar51._28_4_ = auVar19._28_4_;
        auVar52._4_4_ = fVar236 * fVar186;
        auVar52._0_4_ = fVar233 * fVar211;
        auVar52._8_4_ = fVar239 * fVar234;
        auVar52._12_4_ = fVar240 * fVar203;
        auVar52._16_4_ = fVar241 * fVar155;
        auVar52._20_4_ = fVar222 * fVar267;
        auVar52._24_4_ = fVar243 * fVar280;
        auVar52._28_4_ = auVar20._28_4_;
        auVar21 = vsubps_avx(auVar52,auVar51);
        auVar249._0_4_ = auVar10._0_4_ * 0.0 + auVar21._0_4_ + auVar15._0_4_ * 0.0;
        auVar249._4_4_ = auVar10._4_4_ * 0.0 + auVar21._4_4_ + auVar15._4_4_ * 0.0;
        auVar249._8_4_ = auVar10._8_4_ * 0.0 + auVar21._8_4_ + auVar15._8_4_ * 0.0;
        auVar249._12_4_ = auVar10._12_4_ * 0.0 + auVar21._12_4_ + auVar15._12_4_ * 0.0;
        auVar249._16_4_ = auVar10._16_4_ * 0.0 + auVar21._16_4_ + auVar15._16_4_ * 0.0;
        auVar249._20_4_ = auVar10._20_4_ * 0.0 + auVar21._20_4_ + auVar15._20_4_ * 0.0;
        auVar249._24_4_ = auVar10._24_4_ * 0.0 + auVar21._24_4_ + auVar15._24_4_ * 0.0;
        auVar249._28_4_ = auVar20._28_4_ + auVar21._28_4_ + auVar19._28_4_;
        auVar196 = vrcpps_avx(auVar249);
        fVar185 = auVar196._0_4_;
        fVar220 = auVar196._4_4_;
        auVar53._4_4_ = auVar249._4_4_ * fVar220;
        auVar53._0_4_ = auVar249._0_4_ * fVar185;
        fVar186 = auVar196._8_4_;
        auVar53._8_4_ = auVar249._8_4_ * fVar186;
        fVar223 = auVar196._12_4_;
        auVar53._12_4_ = auVar249._12_4_ * fVar223;
        fVar231 = auVar196._16_4_;
        auVar53._16_4_ = auVar249._16_4_ * fVar231;
        fVar234 = auVar196._20_4_;
        auVar53._20_4_ = auVar249._20_4_ * fVar234;
        fVar242 = auVar196._24_4_;
        auVar53._24_4_ = auVar249._24_4_ * fVar242;
        auVar53._28_4_ = auVar22._28_4_;
        auVar293._8_4_ = 0x3f800000;
        auVar293._0_8_ = 0x3f8000003f800000;
        auVar293._12_4_ = 0x3f800000;
        auVar293._16_4_ = 0x3f800000;
        auVar293._20_4_ = 0x3f800000;
        auVar293._24_4_ = 0x3f800000;
        auVar293._28_4_ = 0x3f800000;
        auVar196 = vsubps_avx(auVar293,auVar53);
        fVar185 = auVar196._0_4_ * fVar185 + fVar185;
        fVar220 = auVar196._4_4_ * fVar220 + fVar220;
        fVar186 = auVar196._8_4_ * fVar186 + fVar186;
        fVar223 = auVar196._12_4_ * fVar223 + fVar223;
        fVar231 = auVar196._16_4_ * fVar231 + fVar231;
        fVar234 = auVar196._20_4_ * fVar234 + fVar234;
        fVar242 = auVar196._24_4_ * fVar242 + fVar242;
        auVar146._0_4_ =
             (auVar10._0_4_ * fVar219 + auVar15._0_4_ * fVar176 + auVar21._0_4_ * fVar140) * fVar185
        ;
        auVar146._4_4_ =
             (auVar10._4_4_ * fVar187 + auVar15._4_4_ * fVar221 + auVar21._4_4_ * fVar141) * fVar220
        ;
        auVar146._8_4_ =
             (auVar10._8_4_ * fVar278 + auVar15._8_4_ * fVar237 + auVar21._8_4_ * fVar188) * fVar186
        ;
        auVar146._12_4_ =
             (auVar10._12_4_ * fVar259 + auVar15._12_4_ * fVar153 + auVar21._12_4_ * fVar200) *
             fVar223;
        auVar146._16_4_ =
             (auVar10._16_4_ * fVar265 + auVar15._16_4_ * fVar263 + auVar21._16_4_ * fVar201) *
             fVar231;
        auVar146._20_4_ =
             (auVar10._20_4_ * fVar209 + auVar15._20_4_ * fVar269 + auVar21._20_4_ * fVar202) *
             fVar234;
        auVar146._24_4_ =
             (auVar10._24_4_ * fVar138 + auVar15._24_4_ * fVar136 + auVar21._24_4_ * fVar204) *
             fVar242;
        auVar146._28_4_ = 0;
        auVar128._16_16_ = auVar17;
        auVar128._0_16_ = auVar17;
        auVar196 = vcmpps_avx(auVar128,auVar146,2);
        fVar211 = ray->tfar;
        auVar195._4_4_ = fVar211;
        auVar195._0_4_ = fVar211;
        auVar195._8_4_ = fVar211;
        auVar195._12_4_ = fVar211;
        auVar195._16_4_ = fVar211;
        auVar195._20_4_ = fVar211;
        auVar195._24_4_ = fVar211;
        auVar195._28_4_ = fVar211;
        auVar10 = vcmpps_avx(auVar146,auVar195,2);
        auVar196 = vandps_avx(auVar10,auVar196);
        auVar167 = vpackssdw_avx(auVar196._0_16_,auVar196._16_16_);
        auVar214 = vpand_avx(auVar214,auVar167);
        auVar167 = vpmovsxwd_avx(auVar214);
        auVar180 = vpshufd_avx(auVar214,0xee);
        auVar180 = vpmovsxwd_avx(auVar180);
        auVar129._16_16_ = auVar180;
        auVar129._0_16_ = auVar167;
        if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar129 >> 0x7f,0) == '\0') &&
              (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar180 >> 0x3f,0) == '\0') &&
            (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar180[0xf]) goto LAB_00865748;
        auVar196 = vcmpps_avx(ZEXT832(0) << 0x20,auVar249,4);
        auVar167 = vpackssdw_avx(auVar196._0_16_,auVar196._16_16_);
        auVar214 = vpand_avx(auVar214,auVar167);
        auVar167 = vpmovsxwd_avx(auVar214);
        auVar214 = vpunpckhwd_avx(auVar214,auVar214);
        auVar216._16_16_ = auVar214;
        auVar216._0_16_ = auVar167;
        auVar199 = ZEXT3264(CONCAT824(uStack_468,
                                      CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
        auVar258 = ZEXT3264(auVar254);
        auVar277 = ZEXT3264(auVar130);
        if ((((((((auVar216 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar216 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar216 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar216 >> 0x7f,0) != '\0') ||
              (auVar216 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar214 >> 0x3f,0) != '\0') ||
            (auVar216 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar214[0xf] < '\0') {
          auVar130._0_4_ = fVar185 * auVar194._0_4_;
          auVar130._4_4_ = fVar220 * auVar194._4_4_;
          auVar130._8_4_ = fVar186 * auVar194._8_4_;
          auVar130._12_4_ = fVar223 * auVar194._12_4_;
          auVar130._16_4_ = fVar231 * auVar194._16_4_;
          auVar130._20_4_ = fVar234 * auVar194._20_4_;
          auVar130._24_4_ = fVar242 * auVar194._24_4_;
          auVar130._28_4_ = 0;
          auVar254._4_4_ = auVar171._4_4_ * fVar220;
          auVar254._0_4_ = auVar171._0_4_ * fVar185;
          auVar254._8_4_ = auVar171._8_4_ * fVar186;
          auVar254._12_4_ = auVar171._12_4_ * fVar223;
          auVar254._16_4_ = auVar171._16_4_ * fVar231;
          auVar254._20_4_ = auVar171._20_4_ * fVar234;
          auVar254._24_4_ = auVar171._24_4_ * fVar242;
          auVar254._28_4_ = auVar171._28_4_;
          auVar228._8_4_ = 0x3f800000;
          auVar228._0_8_ = 0x3f8000003f800000;
          auVar228._12_4_ = 0x3f800000;
          auVar228._16_4_ = 0x3f800000;
          auVar228._20_4_ = 0x3f800000;
          auVar228._24_4_ = 0x3f800000;
          auVar228._28_4_ = 0x3f800000;
          auVar196 = vsubps_avx(auVar228,auVar130);
          auVar196 = vblendvps_avx(auVar196,auVar130,auVar14);
          auVar258 = ZEXT3264(auVar196);
          auVar196 = vsubps_avx(auVar228,auVar254);
          _local_3a0 = vblendvps_avx(auVar196,auVar254,auVar14);
          auVar199 = ZEXT3264(auVar216);
          auVar277 = ZEXT3264(auVar146);
        }
      }
      auVar323 = ZEXT3264(_local_6c0);
      auVar196 = auVar199._0_32_;
      if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar196 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar196 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar196 >> 0x7f,0) == '\0') &&
            (auVar199 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar196 >> 0xbf,0) == '\0') &&
          (auVar199 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar199[0x1f]) {
        uVar111 = 0;
        auVar218 = ZEXT3264(_local_720);
      }
      else {
        auVar254 = vsubps_avx(local_640,_local_7c0);
        fVar118 = fVar118 + auVar258._0_4_ * auVar254._0_4_;
        fVar135 = fVar135 + auVar258._4_4_ * auVar254._4_4_;
        fVar137 = fVar137 + auVar258._8_4_ * auVar254._8_4_;
        fVar176 = fStack_7b4 + auVar258._12_4_ * auVar254._12_4_;
        fVar219 = fStack_7b0 + auVar258._16_4_ * auVar254._16_4_;
        fVar185 = fStack_7ac + auVar258._20_4_ * auVar254._20_4_;
        fVar220 = fStack_7a8 + auVar258._24_4_ * auVar254._24_4_;
        fVar186 = auVar254._28_4_ + 0.0;
        fVar211 = local_768->depth_scale;
        auVar54._4_4_ = (fVar135 + fVar135) * fVar211;
        auVar54._0_4_ = (fVar118 + fVar118) * fVar211;
        auVar54._8_4_ = (fVar137 + fVar137) * fVar211;
        auVar54._12_4_ = (fVar176 + fVar176) * fVar211;
        auVar54._16_4_ = (fVar219 + fVar219) * fVar211;
        auVar54._20_4_ = (fVar185 + fVar185) * fVar211;
        auVar54._24_4_ = (fVar220 + fVar220) * fVar211;
        auVar54._28_4_ = fVar186 + fVar186;
        local_280 = auVar277._0_32_;
        auVar254 = vcmpps_avx(local_280,auVar54,6);
        auVar130 = auVar196 & auVar254;
        auVar218 = ZEXT3264(_local_720);
        if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar130 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar130 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar130 >> 0x7f,0) == '\0') &&
              (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar130 >> 0xbf,0) == '\0') &&
            (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar130[0x1f]) {
LAB_008644be:
          local_620._0_16_ = auVar17;
          _local_600 = auVar18;
          _local_780 = auVar144;
          _local_790 = auVar121;
          uVar111 = 0;
          auVar121 = _local_790;
          auVar144 = _local_780;
          auVar18 = _local_600;
          auVar17 = local_620._0_16_;
        }
        else {
          auVar184 = ZEXT3264(_local_520);
          local_200 = vandps_avx(auVar254,auVar196);
          local_2a0 = (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0;
          fStack_29c = (float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0;
          fStack_298 = (float)uStack_398 + (float)uStack_398 + -1.0;
          fStack_294 = uStack_398._4_4_ + uStack_398._4_4_ + -1.0;
          fStack_290 = (float)uStack_390 + (float)uStack_390 + -1.0;
          fStack_28c = uStack_390._4_4_ + uStack_390._4_4_ + -1.0;
          fStack_288 = (float)uStack_388 + (float)uStack_388 + -1.0;
          fStack_284 = uStack_388._4_4_ + uStack_388._4_4_ + -1.0;
          local_2c0 = auVar258._0_32_;
          local_260 = 0;
          local_25c = uVar108;
          local_250 = local_790;
          uStack_248 = local_790._8_8_;
          local_240 = local_600;
          uStack_238 = local_600._8_8_;
          local_230 = local_780;
          uStack_228 = local_780._8_8_;
          local_3a0._4_4_ = fStack_29c;
          local_3a0._0_4_ = local_2a0;
          uStack_398._0_4_ = fStack_298;
          uStack_398._4_4_ = fStack_294;
          uStack_390._0_4_ = fStack_290;
          uStack_390._4_4_ = fStack_28c;
          auVar106 = _local_3a0;
          uStack_388._0_4_ = fStack_288;
          uStack_388._4_4_ = fStack_284;
          auVar196 = _local_3a0;
          if ((pGVar12->mask & ray->mask) == 0) {
            uVar111 = 0;
          }
          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                  (uVar111 = CONCAT71((int7)(uVar111 >> 8),1),
                  pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar164._0_4_ = 1.0 / (float)local_420._0_4_;
            auVar164._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar214 = vshufps_avx(auVar164,auVar164,0);
            local_1e0[0] = auVar214._0_4_ * (auVar258._0_4_ + 0.0);
            local_1e0[1] = auVar214._4_4_ * (auVar258._4_4_ + 1.0);
            local_1e0[2] = auVar214._8_4_ * (auVar258._8_4_ + 2.0);
            local_1e0[3] = auVar214._12_4_ * (auVar258._12_4_ + 3.0);
            fStack_1d0 = auVar214._0_4_ * (auVar258._16_4_ + 4.0);
            fStack_1cc = auVar214._4_4_ * (auVar258._20_4_ + 5.0);
            fStack_1c8 = auVar214._8_4_ * (auVar258._24_4_ + 6.0);
            fStack_1c4 = auVar258._28_4_ + 7.0;
            uStack_390 = auVar106._16_8_;
            uStack_388 = auVar196._24_8_;
            local_1c0 = local_3a0;
            uStack_1b8 = uStack_398;
            uStack_1b0 = uStack_390;
            uStack_1a8 = uStack_388;
            local_1a0 = local_280;
            uVar116 = vmovmskps_avx(local_200);
            uVar114 = CONCAT44((int)((ulong)context->args >> 0x20),uVar116);
            lVar113 = 0;
            if (uVar114 != 0) {
              for (; (uVar114 >> lVar113 & 1) == 0; lVar113 = lVar113 + 1) {
              }
            }
            local_740 = auVar258._0_32_;
            local_760 = local_280;
            fVar211 = (float)local_790._0_4_;
            fVar176 = (float)local_790._4_4_;
            fVar219 = (float)uStack_788;
            fVar185 = uStack_788._4_4_;
            fVar220 = (float)local_600._0_4_;
            fVar186 = (float)local_600._4_4_;
            fVar221 = (float)uStack_5f8;
            fVar187 = uStack_5f8._4_4_;
            fVar223 = (float)local_780._0_4_;
            fVar231 = (float)local_780._4_4_;
            fVar234 = (float)uStack_778;
            fVar237 = uStack_778._4_4_;
            _local_790 = auVar121;
            _local_780 = auVar144;
            _local_600 = auVar18;
            _local_460 = auVar23;
            _local_3a0 = auVar196;
            while (auVar121 = _local_790, auVar144 = _local_780, auVar18 = _local_600,
                  auVar17 = local_620._0_16_, uVar114 != 0) {
              local_7c0 = (undefined1  [8])uVar114;
              local_5d4 = local_1e0[lVar113];
              local_5d0 = *(undefined4 *)((long)&local_1c0 + lVar113 * 4);
              local_6a0._0_4_ = ray->tfar;
              local_640._0_8_ = lVar113;
              ray->tfar = *(float *)(local_1a0 + lVar113 * 4);
              local_6f0.context = context->user;
              fVar242 = 1.0 - local_5d4;
              fVar278 = local_5d4 * fVar242 * 4.0;
              auVar214 = ZEXT416((uint)(local_5d4 * local_5d4 * 0.5));
              auVar214 = vshufps_avx(auVar214,auVar214,0);
              auVar167 = ZEXT416((uint)((fVar242 * fVar242 + fVar278) * 0.5));
              auVar167 = vshufps_avx(auVar167,auVar167,0);
              auVar180 = ZEXT416((uint)((-local_5d4 * local_5d4 - fVar278) * 0.5));
              auVar180 = vshufps_avx(auVar180,auVar180,0);
              auVar191._0_4_ = fVar220 * auVar180._0_4_;
              auVar191._4_4_ = fVar186 * auVar180._4_4_;
              auVar191._8_4_ = fVar221 * auVar180._8_4_;
              auVar191._12_4_ = fVar187 * auVar180._12_4_;
              auVar199 = ZEXT1664(auVar191);
              auVar180 = ZEXT416((uint)(fVar242 * -fVar242 * 0.5));
              auVar180 = vshufps_avx(auVar180,auVar180,0);
              auVar179._0_4_ = fVar211 * auVar180._0_4_;
              auVar179._4_4_ = fVar176 * auVar180._4_4_;
              auVar179._8_4_ = fVar219 * auVar180._8_4_;
              auVar179._12_4_ = fVar185 * auVar180._12_4_;
              auVar184 = ZEXT1664(auVar179);
              auVar165._0_4_ =
                   auVar179._0_4_ +
                   auVar191._0_4_ + auVar214._0_4_ * local_5f0 + fVar223 * auVar167._0_4_;
              auVar165._4_4_ =
                   auVar179._4_4_ +
                   auVar191._4_4_ + auVar214._4_4_ * fStack_5ec + fVar231 * auVar167._4_4_;
              auVar165._8_4_ =
                   auVar179._8_4_ +
                   auVar191._8_4_ + auVar214._8_4_ * fStack_5e8 + fVar234 * auVar167._8_4_;
              auVar165._12_4_ =
                   auVar179._12_4_ +
                   auVar191._12_4_ + auVar214._12_4_ * fStack_5e4 + fVar237 * auVar167._12_4_;
              local_5e0 = vmovlps_avx(auVar165);
              local_5d8 = vextractps_avx(auVar165,2);
              local_5cc = (int)local_5a8;
              local_5c8 = (int)local_770;
              local_5c4 = (local_6f0.context)->instID[0];
              local_5c0 = (local_6f0.context)->instPrimID[0];
              local_7d4 = -1;
              local_6f0.valid = &local_7d4;
              local_6f0.geometryUserPtr = pGVar12->userPtr;
              local_6f0.ray = (RTCRayN *)ray;
              local_6f0.hit = (RTCHitN *)&local_5e0;
              local_6f0.N = 1;
              if (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00864797:
                p_Var13 = context->args->filter;
                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar184 = ZEXT1664(auVar184._0_16_);
                  auVar199 = ZEXT1664(auVar199._0_16_);
                  (*p_Var13)(&local_6f0);
                  if (*local_6f0.valid == 0) goto LAB_008647da;
                }
                uVar111 = CONCAT71((int7)(uVar111 >> 8),1);
                auVar258 = ZEXT3264(local_740);
                auVar277 = ZEXT3264(local_760);
                auVar323 = ZEXT3264(_local_6c0);
                auVar218 = ZEXT3264(_local_720);
                auVar121 = _local_790;
                auVar144 = _local_780;
                auVar18 = _local_600;
                auVar17 = local_620._0_16_;
                goto LAB_0086487d;
              }
              auVar184 = ZEXT1664(auVar179);
              auVar199 = ZEXT1664(auVar191);
              (*pGVar12->occlusionFilterN)(&local_6f0);
              if (*local_6f0.valid != 0) goto LAB_00864797;
LAB_008647da:
              ray->tfar = (float)local_6a0._0_4_;
              uVar114 = (ulong)local_7c0 ^ 1L << (local_640._0_8_ & 0x3f);
              lVar113 = 0;
              if (uVar114 != 0) {
                for (; (uVar114 >> lVar113 & 1) == 0; lVar113 = lVar113 + 1) {
                }
              }
              auVar258 = ZEXT3264(local_740);
              auVar277 = ZEXT3264(local_760);
              auVar323 = ZEXT3264(_local_6c0);
              auVar218 = ZEXT3264(_local_720);
              fVar211 = (float)local_790._0_4_;
              fVar176 = (float)local_790._4_4_;
              fVar219 = (float)uStack_788;
              fVar185 = uStack_788._4_4_;
              fVar220 = (float)local_600._0_4_;
              fVar186 = (float)local_600._4_4_;
              fVar221 = (float)uStack_5f8;
              fVar187 = uStack_5f8._4_4_;
              fVar223 = (float)local_780._0_4_;
              fVar231 = (float)local_780._4_4_;
              fVar234 = (float)uStack_778;
              fVar237 = uStack_778._4_4_;
            }
            goto LAB_008644be;
          }
        }
      }
LAB_0086487d:
      local_620._0_16_ = auVar17;
      _local_600 = auVar18;
      _local_780 = auVar144;
      _local_790 = auVar121;
      auVar214 = local_680._0_16_;
    }
    auVar286 = ZEXT3264(local_660);
    auVar250 = ZEXT3264(_local_540);
    auVar289 = ZEXT3264(_local_5a0);
    if (8 < (int)uVar108) {
      auVar167 = vpshufd_avx(ZEXT416(uVar108),0);
      local_360._0_16_ = auVar167;
      auVar214 = vshufps_avx(auVar214,auVar214,0);
      register0x00001210 = auVar214;
      _local_380 = auVar214;
      local_e0 = local_620._0_8_;
      uStack_d8 = local_620._8_8_;
      uStack_d0 = local_620._0_8_;
      uStack_c8 = local_620._8_8_;
      auVar123._0_4_ = 1.0 / (float)local_420._0_4_;
      auVar123._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar214 = vshufps_avx(auVar123,auVar123,0);
      register0x00001210 = auVar214;
      _local_100 = auVar214;
      auVar134 = ZEXT3264(_local_100);
      local_740 = auVar258._0_32_;
      local_760 = auVar277._0_32_;
      _local_6c0 = auVar323._0_32_;
      for (lVar113 = 8; lVar113 < local_7d0; lVar113 = lVar113 + 8) {
        pauVar3 = (undefined1 (*) [28])(bspline_basis0 + lVar113 * 4 + lVar115);
        fVar211 = *(float *)*pauVar3;
        fVar176 = *(float *)(*pauVar3 + 4);
        fVar219 = *(float *)(*pauVar3 + 8);
        fVar185 = *(float *)(*pauVar3 + 0xc);
        fVar220 = *(float *)(*pauVar3 + 0x10);
        fVar186 = *(float *)(*pauVar3 + 0x14);
        fVar221 = *(float *)(*pauVar3 + 0x18);
        auVar105 = *pauVar3;
        pfVar4 = (float *)(lVar115 + 0x21fffac + lVar113 * 4);
        fVar203 = *pfVar4;
        fVar153 = pfVar4[1];
        fVar259 = pfVar4[2];
        fVar260 = pfVar4[3];
        fVar205 = pfVar4[4];
        fVar155 = pfVar4[5];
        fVar263 = pfVar4[6];
        pauVar3 = (undefined1 (*) [28])(lVar115 + 0x2200430 + lVar113 * 4);
        fVar187 = *(float *)*pauVar3;
        fVar223 = *(float *)(*pauVar3 + 4);
        fVar231 = *(float *)(*pauVar3 + 8);
        fVar234 = *(float *)(*pauVar3 + 0xc);
        fVar237 = *(float *)(*pauVar3 + 0x10);
        fVar278 = *(float *)(*pauVar3 + 0x14);
        fVar242 = *(float *)(*pauVar3 + 0x18);
        auVar104 = *pauVar3;
        pauVar3 = (undefined1 (*) [28])(lVar115 + 0x22008b4 + lVar113 * 4);
        fVar279 = *(float *)*pauVar3;
        fVar265 = *(float *)(*pauVar3 + 4);
        fVar207 = *(float *)(*pauVar3 + 8);
        fVar157 = *(float *)(*pauVar3 + 0xc);
        fVar267 = *(float *)(*pauVar3 + 0x10);
        fVar269 = *(float *)(*pauVar3 + 0x14);
        fVar209 = *(float *)(*pauVar3 + 0x18);
        auVar103 = *pauVar3;
        fVar206 = auVar289._0_4_;
        fVar208 = auVar289._4_4_;
        fVar307 = auVar289._8_4_;
        fVar262 = auVar289._12_4_;
        fVar264 = auVar289._16_4_;
        fVar268 = auVar289._20_4_;
        fVar135 = auVar289._24_4_;
        fVar159 = auVar184._28_4_;
        fVar140 = auVar286._0_4_;
        fVar141 = auVar286._4_4_;
        fVar188 = auVar286._8_4_;
        fVar200 = auVar286._12_4_;
        fVar201 = auVar286._16_4_;
        fVar202 = auVar286._20_4_;
        fVar204 = auVar286._24_4_;
        fVar175 = fVar159 + *(float *)pauVar3[1];
        fStack_7a4 = fVar159 + fVar159 + auVar134._28_4_;
        fVar210 = fVar159 + fVar175;
        auVar312._0_4_ =
             fVar211 * auVar218._0_4_ +
             (float)local_120._0_4_ * fVar203 +
             auVar250._0_4_ * fVar187 + (float)local_400._0_4_ * fVar279;
        auVar312._4_4_ =
             fVar176 * auVar218._4_4_ +
             (float)local_120._4_4_ * fVar153 +
             auVar250._4_4_ * fVar223 + (float)local_400._4_4_ * fVar265;
        auVar312._8_4_ =
             fVar219 * auVar218._8_4_ +
             fStack_118 * fVar259 + auVar250._8_4_ * fVar231 + fStack_3f8 * fVar207;
        auVar312._12_4_ =
             fVar185 * auVar218._12_4_ +
             fStack_114 * fVar260 + auVar250._12_4_ * fVar234 + fStack_3f4 * fVar157;
        auVar312._16_4_ =
             fVar220 * auVar218._16_4_ +
             fStack_110 * fVar205 + auVar250._16_4_ * fVar237 + fStack_3f0 * fVar267;
        auVar312._20_4_ =
             fVar186 * auVar218._20_4_ +
             fStack_10c * fVar155 + auVar250._20_4_ * fVar278 + fStack_3ec * fVar269;
        auVar312._24_4_ =
             fVar221 * auVar218._24_4_ +
             fStack_108 * fVar263 + auVar250._24_4_ * fVar242 + fStack_3e8 * fVar209;
        auVar312._28_4_ = fVar175 + fStack_7a4;
        local_680._0_4_ =
             fVar211 * (float)local_500._0_4_ +
             auVar323._0_4_ * fVar203 + fVar140 * fVar187 + fVar206 * fVar279;
        local_680._4_4_ =
             fVar176 * (float)local_500._4_4_ +
             auVar323._4_4_ * fVar153 + fVar141 * fVar223 + fVar208 * fVar265;
        local_680._8_4_ =
             fVar219 * fStack_4f8 + auVar323._8_4_ * fVar259 + fVar188 * fVar231 + fVar307 * fVar207
        ;
        local_680._12_4_ =
             fVar185 * fStack_4f4 +
             auVar323._12_4_ * fVar260 + fVar200 * fVar234 + fVar262 * fVar157;
        local_680._16_4_ =
             fVar220 * fStack_4f0 +
             auVar323._16_4_ * fVar205 + fVar201 * fVar237 + fVar264 * fVar267;
        local_680._20_4_ =
             fVar186 * fStack_4ec +
             auVar323._20_4_ * fVar155 + fVar202 * fVar278 + fVar268 * fVar269;
        local_680._24_4_ =
             fVar221 * fStack_4e8 +
             auVar323._24_4_ * fVar263 + fVar204 * fVar242 + fVar135 * fVar209;
        local_680._28_4_ = fStack_7a4 + fVar159 + fVar159 + auVar199._28_4_;
        local_7c0._0_4_ =
             fVar211 * (float)local_c0._0_4_ +
             (float)local_a0._0_4_ * fVar203 + local_80 * fVar187 + fVar279 * (float)local_140._0_4_
        ;
        local_7c0._4_4_ =
             fVar176 * (float)local_c0._4_4_ +
             (float)local_a0._4_4_ * fVar153 +
             fStack_7c * fVar223 + fVar265 * (float)local_140._4_4_;
        fStack_7b8 = fVar219 * fStack_b8 +
                     fStack_98 * fVar259 + fStack_78 * fVar231 + fVar207 * fStack_138;
        fStack_7b4 = fVar185 * fStack_b4 +
                     fStack_94 * fVar260 + fStack_74 * fVar234 + fVar157 * fStack_134;
        fStack_7b0 = fVar220 * fStack_b0 +
                     fStack_90 * fVar205 + fStack_70 * fVar237 + fVar267 * fStack_130;
        fStack_7ac = fVar186 * fStack_ac +
                     fStack_8c * fVar155 + fStack_6c * fVar278 + fVar269 * fStack_12c;
        fStack_7a8 = fVar221 * fStack_a8 +
                     fStack_88 * fVar263 + fStack_68 * fVar242 + fVar209 * fStack_128;
        fStack_7a4 = fStack_7a4 + fVar210;
        pauVar2 = (undefined1 (*) [32])(bspline_basis1 + lVar113 * 4 + lVar115);
        auVar106 = *(undefined1 (*) [24])*pauVar2;
        pauVar3 = (undefined1 (*) [28])(lVar115 + 0x22023cc + lVar113 * 4);
        fVar219 = *(float *)*pauVar3;
        fVar220 = *(float *)(*pauVar3 + 4);
        fVar221 = *(float *)(*pauVar3 + 8);
        fVar223 = *(float *)(*pauVar3 + 0xc);
        fVar234 = *(float *)(*pauVar3 + 0x10);
        fVar278 = *(float *)(*pauVar3 + 0x14);
        fVar279 = *(float *)(*pauVar3 + 0x18);
        auVar107 = *pauVar3;
        pauVar5 = (undefined1 (*) [16])(lVar115 + 0x2202850 + lVar113 * 4);
        fVar265 = *(float *)*pauVar5;
        fVar207 = *(float *)(*pauVar5 + 4);
        fVar157 = *(float *)(*pauVar5 + 8);
        auVar315 = *(undefined1 (*) [12])*pauVar5;
        fVar267 = *(float *)(*pauVar5 + 0xc);
        fStack_410 = *(float *)pauVar5[1];
        fStack_40c = *(float *)(pauVar5[1] + 4);
        fStack_408 = *(float *)(pauVar5[1] + 8);
        pfVar4 = (float *)(lVar115 + 0x2202cd4 + lVar113 * 4);
        fVar269 = *pfVar4;
        fVar209 = pfVar4[1];
        fVar175 = pfVar4[2];
        fVar159 = pfVar4[3];
        fVar280 = pfVar4[4];
        fVar136 = pfVar4[5];
        fVar138 = pfVar4[6];
        fVar139 = auVar250._28_4_;
        fVar211 = auVar218._28_4_;
        _local_420 = *pauVar5;
        auVar180 = _local_420;
        fStack_404 = *(float *)(pauVar5[1] + 0xc);
        fVar210 = fVar139 + fVar139 + fVar210;
        auVar134 = ZEXT3264(*pauVar2);
        fVar176 = auVar106._0_4_;
        fVar185 = auVar106._4_4_;
        fVar186 = auVar106._8_4_;
        fVar187 = auVar106._12_4_;
        fVar231 = auVar106._16_4_;
        fVar237 = auVar106._20_4_;
        fVar242 = (float)*(undefined8 *)(*pauVar2 + 0x18);
        auVar229._0_4_ =
             auVar218._0_4_ * fVar176 +
             (float)local_120._0_4_ * fVar219 +
             fVar265 * auVar250._0_4_ + (float)local_400._0_4_ * fVar269;
        auVar229._4_4_ =
             auVar218._4_4_ * fVar185 +
             (float)local_120._4_4_ * fVar220 +
             fVar207 * auVar250._4_4_ + (float)local_400._4_4_ * fVar209;
        auVar229._8_4_ =
             auVar218._8_4_ * fVar186 +
             fStack_118 * fVar221 + fVar157 * auVar250._8_4_ + fStack_3f8 * fVar175;
        auVar229._12_4_ =
             auVar218._12_4_ * fVar187 +
             fStack_114 * fVar223 + fVar267 * auVar250._12_4_ + fStack_3f4 * fVar159;
        auVar229._16_4_ =
             auVar218._16_4_ * fVar231 +
             fStack_110 * fVar234 + fStack_410 * auVar250._16_4_ + fStack_3f0 * fVar280;
        auVar229._20_4_ =
             auVar218._20_4_ * fVar237 +
             fStack_10c * fVar278 + fStack_40c * auVar250._20_4_ + fStack_3ec * fVar136;
        auVar229._24_4_ =
             auVar218._24_4_ * fVar242 +
             fStack_108 * fVar279 + fStack_408 * auVar250._24_4_ + fStack_3e8 * fVar138;
        auVar229._28_4_ = fVar139 + pfVar4[7] + fVar210;
        local_440._0_4_ =
             (float)local_500._0_4_ * fVar176 +
             auVar323._0_4_ * fVar219 + fVar140 * fVar265 + fVar206 * fVar269;
        local_440._4_4_ =
             (float)local_500._4_4_ * fVar185 +
             auVar323._4_4_ * fVar220 + fVar141 * fVar207 + fVar208 * fVar209;
        local_440._8_4_ =
             fStack_4f8 * fVar186 + auVar323._8_4_ * fVar221 + fVar188 * fVar157 + fVar307 * fVar175
        ;
        local_440._12_4_ =
             fStack_4f4 * fVar187 +
             auVar323._12_4_ * fVar223 + fVar200 * fVar267 + fVar262 * fVar159;
        local_440._16_4_ =
             fStack_4f0 * fVar231 +
             auVar323._16_4_ * fVar234 + fVar201 * fStack_410 + fVar264 * fVar280;
        local_440._20_4_ =
             fStack_4ec * fVar237 +
             auVar323._20_4_ * fVar278 + fVar202 * fStack_40c + fVar268 * fVar136;
        local_440._24_4_ =
             fStack_4e8 * fVar242 +
             auVar323._24_4_ * fVar279 + fVar204 * fStack_408 + fVar135 * fVar138;
        local_440._28_4_ = fVar210 + fVar139 + fVar139 + fVar211;
        local_620._0_4_ =
             (float)local_a0._0_4_ * fVar219 + local_80 * fVar265 + fVar269 * (float)local_140._0_4_
             + (float)local_c0._0_4_ * fVar176;
        local_620._4_4_ =
             (float)local_a0._4_4_ * fVar220 +
             fStack_7c * fVar207 + fVar209 * (float)local_140._4_4_ +
             (float)local_c0._4_4_ * fVar185;
        local_620._8_4_ =
             fStack_98 * fVar221 + fStack_78 * fVar157 + fVar175 * fStack_138 + fStack_b8 * fVar186;
        local_620._12_4_ =
             fStack_94 * fVar223 + fStack_74 * fVar267 + fVar159 * fStack_134 + fStack_b4 * fVar187;
        local_620._16_4_ =
             fStack_90 * fVar234 + fStack_70 * fStack_410 + fVar280 * fStack_130 +
             fStack_b0 * fVar231;
        local_620._20_4_ =
             fStack_8c * fVar278 + fStack_6c * fStack_40c + fVar136 * fStack_12c +
             fStack_ac * fVar237;
        local_620._24_4_ =
             fStack_88 * fVar279 + fStack_68 * fStack_408 + fVar138 * fStack_128 +
             fStack_a8 * fVar242;
        local_620._28_4_ = fVar139 + fVar139 + pfVar4[7] + fVar210;
        auVar254 = vsubps_avx(auVar229,auVar312);
        auVar130 = vsubps_avx(local_440,local_680);
        fVar265 = auVar254._0_4_;
        fVar207 = auVar254._4_4_;
        auVar23._4_4_ = fVar207 * local_680._4_4_;
        auVar23._0_4_ = fVar265 * (float)local_680._0_4_;
        fVar157 = auVar254._8_4_;
        auVar23._8_4_ = fVar157 * local_680._8_4_;
        fVar139 = auVar254._12_4_;
        auVar23._12_4_ = fVar139 * local_680._12_4_;
        fVar266 = auVar254._16_4_;
        auVar23._16_4_ = fVar266 * local_680._16_4_;
        fVar118 = auVar254._20_4_;
        auVar23._20_4_ = fVar118 * local_680._20_4_;
        fVar137 = auVar254._24_4_;
        auVar23._24_4_ = fVar137 * local_680._24_4_;
        auVar23._28_4_ = fVar210;
        fVar219 = auVar130._0_4_;
        fVar220 = auVar130._4_4_;
        auVar55._4_4_ = auVar312._4_4_ * fVar220;
        auVar55._0_4_ = auVar312._0_4_ * fVar219;
        fVar221 = auVar130._8_4_;
        auVar55._8_4_ = auVar312._8_4_ * fVar221;
        fVar223 = auVar130._12_4_;
        auVar55._12_4_ = auVar312._12_4_ * fVar223;
        fVar234 = auVar130._16_4_;
        auVar55._16_4_ = auVar312._16_4_ * fVar234;
        fVar278 = auVar130._20_4_;
        auVar55._20_4_ = auVar312._20_4_ * fVar278;
        fVar279 = auVar130._24_4_;
        auVar55._24_4_ = auVar312._24_4_ * fVar279;
        auVar55._28_4_ = local_440._28_4_;
        auVar10 = vsubps_avx(auVar23,auVar55);
        auVar196 = vmaxps_avx(_local_7c0,local_620);
        auVar56._4_4_ = auVar196._4_4_ * auVar196._4_4_ * (fVar207 * fVar207 + fVar220 * fVar220);
        auVar56._0_4_ = auVar196._0_4_ * auVar196._0_4_ * (fVar265 * fVar265 + fVar219 * fVar219);
        auVar56._8_4_ = auVar196._8_4_ * auVar196._8_4_ * (fVar157 * fVar157 + fVar221 * fVar221);
        auVar56._12_4_ = auVar196._12_4_ * auVar196._12_4_ * (fVar139 * fVar139 + fVar223 * fVar223)
        ;
        auVar56._16_4_ = auVar196._16_4_ * auVar196._16_4_ * (fVar266 * fVar266 + fVar234 * fVar234)
        ;
        auVar56._20_4_ = auVar196._20_4_ * auVar196._20_4_ * (fVar118 * fVar118 + fVar278 * fVar278)
        ;
        auVar56._24_4_ = auVar196._24_4_ * auVar196._24_4_ * (fVar137 * fVar137 + fVar279 * fVar279)
        ;
        auVar56._28_4_ = auVar229._28_4_ + local_440._28_4_;
        auVar57._4_4_ = auVar10._4_4_ * auVar10._4_4_;
        auVar57._0_4_ = auVar10._0_4_ * auVar10._0_4_;
        auVar57._8_4_ = auVar10._8_4_ * auVar10._8_4_;
        auVar57._12_4_ = auVar10._12_4_ * auVar10._12_4_;
        auVar57._16_4_ = auVar10._16_4_ * auVar10._16_4_;
        auVar57._20_4_ = auVar10._20_4_ * auVar10._20_4_;
        auVar57._24_4_ = auVar10._24_4_ * auVar10._24_4_;
        auVar57._28_4_ = auVar10._28_4_;
        auVar199 = ZEXT3264(auVar57);
        local_340 = vcmpps_avx(auVar57,auVar56,2);
        local_260 = (uint)lVar113;
        auVar167 = vpshufd_avx(ZEXT416(local_260),0);
        auVar214 = vpor_avx(auVar167,_DAT_01f4ad30);
        auVar167 = vpor_avx(auVar167,_DAT_01f7afa0);
        auVar214 = vpcmpgtd_avx(local_360._0_16_,auVar214);
        auVar167 = vpcmpgtd_avx(local_360._0_16_,auVar167);
        auVar183._16_16_ = auVar167;
        auVar183._0_16_ = auVar214;
        auVar184 = ZEXT3264(auVar183);
        auVar196 = auVar183 & local_340;
        if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar196 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar196 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar196 >> 0x7f,0) == '\0') &&
              (auVar196 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar196 >> 0xbf,0) == '\0') &&
            (auVar196 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar196[0x1f]) {
          auVar258 = ZEXT3264(local_740);
          auVar277 = ZEXT3264(local_760);
          auVar250 = ZEXT3264(_local_540);
          auVar286 = ZEXT3264(auVar286._0_32_);
          auVar289 = ZEXT3264(auVar289._0_32_);
          auVar323 = ZEXT3264(_local_6c0);
          auVar218 = ZEXT3264(auVar218._0_32_);
        }
        else {
          local_460._0_4_ = auVar107._0_4_;
          local_460._4_4_ = auVar107._4_4_;
          fStack_458 = auVar107._8_4_;
          fStack_454 = auVar107._12_4_;
          fStack_450 = auVar107._16_4_;
          fStack_44c = auVar107._20_4_;
          fStack_448 = auVar107._24_4_;
          fVar219 = (float)local_320._0_4_ * (float)local_460._0_4_;
          fVar220 = (float)local_320._4_4_ * (float)local_460._4_4_;
          fVar221 = fStack_318 * fStack_458;
          fVar223 = fStack_314 * fStack_454;
          fVar234 = fStack_310 * fStack_450;
          fVar278 = fStack_30c * fStack_44c;
          fVar279 = fStack_308 * fStack_448;
          local_420._0_4_ = auVar315._0_4_;
          local_420._4_4_ = auVar315._4_4_;
          fStack_418 = auVar315._8_4_;
          _local_460 = auVar183;
          local_4e0 = fVar176 * (float)local_3e0._0_4_ +
                      fVar219 + (float)local_300._0_4_ * (float)local_420._0_4_ +
                                (float)local_520._0_4_ * fVar269;
          fStack_4dc = fVar185 * (float)local_3e0._4_4_ +
                       fVar220 + (float)local_300._4_4_ * (float)local_420._4_4_ +
                                 (float)local_520._4_4_ * fVar209;
          fStack_4d8 = fVar186 * fStack_3d8 +
                       fVar221 + fStack_2f8 * fStack_418 + fStack_518 * fVar175;
          fStack_4d4 = fVar187 * fStack_3d4 + fVar223 + fStack_2f4 * fVar267 + fStack_514 * fVar159;
          fStack_4d0 = fVar231 * fStack_3d0 +
                       fVar234 + fStack_2f0 * fStack_410 + fStack_510 * fVar280;
          fStack_4cc = fVar237 * fStack_3cc +
                       fVar278 + fStack_2ec * fStack_40c + fStack_50c * fVar136;
          fStack_4c8 = fVar242 * fStack_3c8 +
                       fVar279 + fStack_2e8 * fStack_408 + fStack_508 * fVar138;
          fStack_4c4 = *(float *)(pauVar5[1] + 0xc) +
                       (float)((ulong)*(undefined8 *)(*pauVar2 + 0x18) >> 0x20) + fVar211 + 0.0;
          local_580._0_4_ = auVar104._0_4_;
          local_580._4_4_ = auVar104._4_4_;
          fStack_578 = auVar104._8_4_;
          fStack_574 = auVar104._12_4_;
          fStack_570 = auVar104._16_4_;
          fStack_56c = auVar104._20_4_;
          fStack_568 = auVar104._24_4_;
          fVar137 = (float)local_300._0_4_ * (float)local_580._0_4_;
          fVar150 = (float)local_300._4_4_ * (float)local_580._4_4_;
          fVar151 = fStack_2f8 * fStack_578;
          fVar152 = fStack_2f4 * fStack_574;
          fVar154 = fStack_2f0 * fStack_570;
          fVar156 = fStack_2ec * fStack_56c;
          fVar158 = fStack_2e8 * fStack_568;
          local_4c0._0_4_ = auVar103._0_4_;
          local_4c0._4_4_ = auVar103._4_4_;
          fStack_4b8 = auVar103._8_4_;
          fStack_4b4 = auVar103._12_4_;
          fStack_4b0 = auVar103._16_4_;
          fStack_4ac = auVar103._20_4_;
          fStack_4a8 = auVar103._24_4_;
          fVar224 = (float)local_520._0_4_ * (float)local_4c0._0_4_;
          fVar233 = (float)local_520._4_4_ * (float)local_4c0._4_4_;
          fVar236 = fStack_518 * fStack_4b8;
          fVar239 = fStack_514 * fStack_4b4;
          fVar240 = fStack_510 * fStack_4b0;
          fVar241 = fStack_50c * fStack_4ac;
          fVar222 = fStack_508 * fStack_4a8;
          pfVar4 = (float *)(lVar115 + 0x2201640 + lVar113 * 4);
          fVar176 = *pfVar4;
          fVar219 = pfVar4[1];
          fVar185 = pfVar4[2];
          fVar220 = pfVar4[3];
          fVar186 = pfVar4[4];
          fVar221 = pfVar4[5];
          fVar187 = pfVar4[6];
          pfVar6 = (float *)(lVar115 + 0x2201ac4 + lVar113 * 4);
          fVar223 = *pfVar6;
          fVar231 = pfVar6[1];
          fVar234 = pfVar6[2];
          fVar237 = pfVar6[3];
          fVar278 = pfVar6[4];
          fVar242 = pfVar6[5];
          fVar279 = pfVar6[6];
          pfVar7 = (float *)(lVar115 + 0x22011bc + lVar113 * 4);
          fVar265 = *pfVar7;
          fVar207 = pfVar7[1];
          fVar157 = pfVar7[2];
          fVar267 = pfVar7[3];
          fVar269 = pfVar7[4];
          fVar209 = pfVar7[5];
          fVar175 = pfVar7[6];
          fVar118 = pfVar4[7] + pfVar6[7];
          fStack_4a4 = pfVar6[7] + auVar312._28_4_ + 0.0;
          fVar243 = auVar312._28_4_ + fStack_4e4 + auVar312._28_4_ + 0.0;
          pfVar4 = (float *)(lVar115 + 0x2200d38 + lVar113 * 4);
          fVar159 = *pfVar4;
          fVar280 = pfVar4[1];
          fVar136 = pfVar4[2];
          fVar138 = pfVar4[3];
          fVar210 = pfVar4[4];
          fVar139 = pfVar4[5];
          fVar266 = pfVar4[6];
          local_580._4_4_ =
               fVar280 * (float)local_720._4_4_ +
               (float)local_120._4_4_ * fVar207 +
               (float)local_540._4_4_ * fVar219 + (float)local_400._4_4_ * fVar231;
          local_580._0_4_ =
               fVar159 * (float)local_720._0_4_ +
               (float)local_120._0_4_ * fVar265 +
               (float)local_540._0_4_ * fVar176 + (float)local_400._0_4_ * fVar223;
          fStack_578 = fVar136 * fStack_718 +
                       fStack_118 * fVar157 + fStack_538 * fVar185 + fStack_3f8 * fVar234;
          fStack_574 = fVar138 * fStack_714 +
                       fStack_114 * fVar267 + fStack_534 * fVar220 + fStack_3f4 * fVar237;
          fStack_570 = fVar210 * fStack_710 +
                       fStack_110 * fVar269 + fStack_530 * fVar186 + fStack_3f0 * fVar278;
          fStack_56c = fVar139 * fStack_70c +
                       fStack_10c * fVar209 + fStack_52c * fVar221 + fStack_3ec * fVar242;
          fStack_568 = fVar266 * fStack_708 +
                       fStack_108 * fVar175 + fStack_528 * fVar187 + fStack_3e8 * fVar279;
          fStack_564 = fVar118 + fStack_4a4;
          fStack_4a4 = fStack_4a4 + fVar243;
          local_4c0._4_4_ =
               fVar280 * (float)local_500._4_4_ +
               fVar141 * fVar219 + fVar208 * fVar231 + fVar207 * (float)local_6c0._4_4_;
          local_4c0._0_4_ =
               fVar159 * (float)local_500._0_4_ +
               fVar140 * fVar176 + fVar206 * fVar223 + fVar265 * (float)local_6c0._0_4_;
          fStack_4b8 = fVar136 * fStack_4f8 +
                       fVar188 * fVar185 + fVar307 * fVar234 + fVar157 * fStack_6b8;
          fStack_4b4 = fVar138 * fStack_4f4 +
                       fVar200 * fVar220 + fVar262 * fVar237 + fVar267 * fStack_6b4;
          fStack_4b0 = fVar210 * fStack_4f0 +
                       fVar201 * fVar186 + fVar264 * fVar278 + fVar269 * fStack_6b0;
          fStack_4ac = fVar139 * fStack_4ec +
                       fVar202 * fVar221 + fVar268 * fVar242 + fVar209 * fStack_6ac;
          fStack_4a8 = fVar266 * fStack_4e8 +
                       fVar204 * fVar187 + fVar135 * fVar279 + fVar175 * fStack_6a8;
          auVar302._0_4_ =
               fVar265 * (float)local_320._0_4_ +
               (float)local_300._0_4_ * fVar176 + (float)local_520._0_4_ * fVar223 +
               fVar159 * (float)local_3e0._0_4_;
          auVar302._4_4_ =
               fVar207 * (float)local_320._4_4_ +
               (float)local_300._4_4_ * fVar219 + (float)local_520._4_4_ * fVar231 +
               fVar280 * (float)local_3e0._4_4_;
          auVar302._8_4_ =
               fVar157 * fStack_318 + fStack_2f8 * fVar185 + fStack_518 * fVar234 +
               fVar136 * fStack_3d8;
          auVar302._12_4_ =
               fVar267 * fStack_314 + fStack_2f4 * fVar220 + fStack_514 * fVar237 +
               fVar138 * fStack_3d4;
          auVar302._16_4_ =
               fVar269 * fStack_310 + fStack_2f0 * fVar186 + fStack_510 * fVar278 +
               fVar210 * fStack_3d0;
          auVar302._20_4_ =
               fVar209 * fStack_30c + fStack_2ec * fVar221 + fStack_50c * fVar242 +
               fVar139 * fStack_3cc;
          auVar302._24_4_ =
               fVar175 * fStack_308 + fStack_2e8 * fVar187 + fStack_508 * fVar279 +
               fVar266 * fStack_3c8;
          auVar302._28_4_ = pfVar7[7] + fVar118 + fVar243;
          pfVar4 = (float *)(lVar115 + 0x2203a60 + lVar113 * 4);
          fVar219 = *pfVar4;
          fVar185 = pfVar4[1];
          fVar220 = pfVar4[2];
          fVar186 = pfVar4[3];
          fVar221 = pfVar4[4];
          fVar187 = pfVar4[5];
          fVar223 = pfVar4[6];
          pfVar6 = (float *)(lVar115 + 0x2203ee4 + lVar113 * 4);
          fVar231 = *pfVar6;
          fVar234 = pfVar6[1];
          fVar237 = pfVar6[2];
          fVar278 = pfVar6[3];
          fVar242 = pfVar6[4];
          fVar279 = pfVar6[5];
          fVar265 = pfVar6[6];
          pfVar7 = (float *)(lVar115 + 0x22035dc + lVar113 * 4);
          fVar207 = *pfVar7;
          fVar157 = pfVar7[1];
          fVar267 = pfVar7[2];
          fVar269 = pfVar7[3];
          fVar209 = pfVar7[4];
          fVar175 = pfVar7[5];
          fVar159 = pfVar7[6];
          fVar176 = auVar286._28_4_;
          pfVar8 = (float *)(lVar115 + 0x2203158 + lVar113 * 4);
          fVar280 = *pfVar8;
          fVar136 = pfVar8[1];
          fVar138 = pfVar8[2];
          fVar210 = pfVar8[3];
          fVar139 = pfVar8[4];
          fVar206 = pfVar8[5];
          fVar208 = pfVar8[6];
          auVar275._0_4_ =
               fVar280 * (float)local_720._0_4_ +
               (float)local_120._0_4_ * fVar207 +
               (float)local_540._0_4_ * fVar219 + (float)local_400._0_4_ * fVar231;
          auVar275._4_4_ =
               fVar136 * (float)local_720._4_4_ +
               (float)local_120._4_4_ * fVar157 +
               (float)local_540._4_4_ * fVar185 + (float)local_400._4_4_ * fVar234;
          auVar275._8_4_ =
               fVar138 * fStack_718 +
               fStack_118 * fVar267 + fStack_538 * fVar220 + fStack_3f8 * fVar237;
          auVar275._12_4_ =
               fVar210 * fStack_714 +
               fStack_114 * fVar269 + fStack_534 * fVar186 + fStack_3f4 * fVar278;
          auVar275._16_4_ =
               fVar139 * fStack_710 +
               fStack_110 * fVar209 + fStack_530 * fVar221 + fStack_3f0 * fVar242;
          auVar275._20_4_ =
               fVar206 * fStack_70c +
               fStack_10c * fVar175 + fStack_52c * fVar187 + fStack_3ec * fVar279;
          auVar275._24_4_ =
               fVar208 * fStack_708 +
               fStack_108 * fVar159 + fStack_528 * fVar223 + fStack_3e8 * fVar265;
          auVar275._28_4_ = fVar176 + fVar176 + fStack_3e4 + fStack_4a4;
          auVar294._0_4_ =
               fVar280 * (float)local_500._0_4_ +
               fVar207 * (float)local_6c0._0_4_ +
               fVar140 * fVar219 + fVar231 * (float)local_5a0._0_4_;
          auVar294._4_4_ =
               fVar136 * (float)local_500._4_4_ +
               fVar157 * (float)local_6c0._4_4_ +
               fVar141 * fVar185 + fVar234 * (float)local_5a0._4_4_;
          auVar294._8_4_ =
               fVar138 * fStack_4f8 +
               fVar267 * fStack_6b8 + fVar188 * fVar220 + fVar237 * fStack_598;
          auVar294._12_4_ =
               fVar210 * fStack_4f4 +
               fVar269 * fStack_6b4 + fVar200 * fVar186 + fVar278 * fStack_594;
          auVar294._16_4_ =
               fVar139 * fStack_4f0 +
               fVar209 * fStack_6b0 + fVar201 * fVar221 + fVar242 * fStack_590;
          auVar294._20_4_ =
               fVar206 * fStack_4ec +
               fVar175 * fStack_6ac + fVar202 * fVar187 + fVar279 * fStack_58c;
          auVar294._24_4_ =
               fVar208 * fStack_4e8 +
               fVar159 * fStack_6a8 + fVar204 * fVar223 + fVar265 * fStack_588;
          auVar294._28_4_ = fVar176 + fVar176 + fStack_524 + fStack_4a4;
          auVar217._8_4_ = 0x7fffffff;
          auVar217._0_8_ = 0x7fffffff7fffffff;
          auVar217._12_4_ = 0x7fffffff;
          auVar217._16_4_ = 0x7fffffff;
          auVar217._20_4_ = 0x7fffffff;
          auVar217._24_4_ = 0x7fffffff;
          auVar217._28_4_ = 0x7fffffff;
          auVar196 = vandps_avx(_local_580,auVar217);
          auVar10 = vandps_avx(_local_4c0,auVar217);
          auVar10 = vmaxps_avx(auVar196,auVar10);
          auVar196 = vandps_avx(auVar302,auVar217);
          auVar10 = vmaxps_avx(auVar10,auVar196);
          auVar10 = vcmpps_avx(auVar10,_local_380,1);
          auVar15 = vblendvps_avx(_local_580,auVar254,auVar10);
          auVar131._0_4_ =
               fVar280 * (float)local_3e0._0_4_ +
               fVar207 * (float)local_320._0_4_ +
               fVar231 * (float)local_520._0_4_ + (float)local_300._0_4_ * fVar219;
          auVar131._4_4_ =
               fVar136 * (float)local_3e0._4_4_ +
               fVar157 * (float)local_320._4_4_ +
               fVar234 * (float)local_520._4_4_ + (float)local_300._4_4_ * fVar185;
          auVar131._8_4_ =
               fVar138 * fStack_3d8 +
               fVar267 * fStack_318 + fVar237 * fStack_518 + fStack_2f8 * fVar220;
          auVar131._12_4_ =
               fVar210 * fStack_3d4 +
               fVar269 * fStack_314 + fVar278 * fStack_514 + fStack_2f4 * fVar186;
          auVar131._16_4_ =
               fVar139 * fStack_3d0 +
               fVar209 * fStack_310 + fVar242 * fStack_510 + fStack_2f0 * fVar221;
          auVar131._20_4_ =
               fVar206 * fStack_3cc +
               fVar175 * fStack_30c + fVar279 * fStack_50c + fStack_2ec * fVar187;
          auVar131._24_4_ =
               fVar208 * fStack_3c8 +
               fVar159 * fStack_308 + fVar265 * fStack_508 + fStack_2e8 * fVar223;
          auVar131._28_4_ = auVar196._28_4_ + pfVar7[7] + pfVar6[7] + pfVar4[7];
          auVar21 = vblendvps_avx(_local_4c0,auVar130,auVar10);
          auVar196 = vandps_avx(auVar275,auVar217);
          auVar10 = vandps_avx(auVar294,auVar217);
          auVar19 = vmaxps_avx(auVar196,auVar10);
          auVar196 = vandps_avx(auVar131,auVar217);
          auVar196 = vmaxps_avx(auVar19,auVar196);
          local_4a0._0_4_ = auVar105._0_4_;
          local_4a0._4_4_ = auVar105._4_4_;
          fStack_498 = auVar105._8_4_;
          fStack_494 = auVar105._12_4_;
          fStack_490 = auVar105._16_4_;
          fStack_48c = auVar105._20_4_;
          fStack_488 = auVar105._24_4_;
          auVar10 = vcmpps_avx(auVar196,_local_380,1);
          auVar196 = vblendvps_avx(auVar275,auVar254,auVar10);
          auVar132._0_4_ =
               (float)local_3e0._0_4_ * (float)local_4a0._0_4_ +
               (float)local_320._0_4_ * fVar203 + fVar137 + fVar224;
          auVar132._4_4_ =
               (float)local_3e0._4_4_ * (float)local_4a0._4_4_ +
               (float)local_320._4_4_ * fVar153 + fVar150 + fVar233;
          auVar132._8_4_ = fStack_3d8 * fStack_498 + fStack_318 * fVar259 + fVar151 + fVar236;
          auVar132._12_4_ = fStack_3d4 * fStack_494 + fStack_314 * fVar260 + fVar152 + fVar239;
          auVar132._16_4_ = fStack_3d0 * fStack_490 + fStack_310 * fVar205 + fVar154 + fVar240;
          auVar132._20_4_ = fStack_3cc * fStack_48c + fStack_30c * fVar155 + fVar156 + fVar241;
          auVar132._24_4_ = fStack_3c8 * fStack_488 + fStack_308 * fVar263 + fVar158 + fVar222;
          auVar132._28_4_ = auVar19._28_4_ + fStack_4c4 + fVar211 + 0.0;
          auVar10 = vblendvps_avx(auVar294,auVar130,auVar10);
          fVar140 = auVar15._0_4_;
          fVar141 = auVar15._4_4_;
          fVar188 = auVar15._8_4_;
          fVar200 = auVar15._12_4_;
          fVar201 = auVar15._16_4_;
          fVar202 = auVar15._20_4_;
          fVar204 = auVar15._24_4_;
          fVar206 = auVar15._28_4_;
          fVar279 = auVar196._0_4_;
          fVar153 = auVar196._4_4_;
          fVar260 = auVar196._8_4_;
          fVar155 = auVar196._12_4_;
          fVar265 = auVar196._16_4_;
          fVar157 = auVar196._20_4_;
          fVar269 = auVar196._24_4_;
          fVar211 = auVar21._0_4_;
          fVar219 = auVar21._4_4_;
          fVar220 = auVar21._8_4_;
          fVar221 = auVar21._12_4_;
          fVar223 = auVar21._16_4_;
          fVar234 = auVar21._20_4_;
          fVar278 = auVar21._24_4_;
          auVar284._0_4_ = fVar211 * fVar211 + fVar140 * fVar140;
          auVar284._4_4_ = fVar219 * fVar219 + fVar141 * fVar141;
          auVar284._8_4_ = fVar220 * fVar220 + fVar188 * fVar188;
          auVar284._12_4_ = fVar221 * fVar221 + fVar200 * fVar200;
          auVar284._16_4_ = fVar223 * fVar223 + fVar201 * fVar201;
          auVar284._20_4_ = fVar234 * fVar234 + fVar202 * fVar202;
          auVar284._24_4_ = fVar278 * fVar278 + fVar204 * fVar204;
          auVar284._28_4_ = auVar254._28_4_ + auVar130._28_4_;
          auVar254 = vrsqrtps_avx(auVar284);
          fVar176 = auVar254._0_4_;
          fVar185 = auVar254._4_4_;
          auVar58._4_4_ = fVar185 * 1.5;
          auVar58._0_4_ = fVar176 * 1.5;
          fVar186 = auVar254._8_4_;
          auVar58._8_4_ = fVar186 * 1.5;
          fVar187 = auVar254._12_4_;
          auVar58._12_4_ = fVar187 * 1.5;
          fVar231 = auVar254._16_4_;
          auVar58._16_4_ = fVar231 * 1.5;
          fVar237 = auVar254._20_4_;
          auVar58._20_4_ = fVar237 * 1.5;
          fVar242 = auVar254._24_4_;
          auVar58._24_4_ = fVar242 * 1.5;
          auVar58._28_4_ = auVar294._28_4_;
          auVar59._4_4_ = fVar185 * fVar185 * fVar185 * auVar284._4_4_ * 0.5;
          auVar59._0_4_ = fVar176 * fVar176 * fVar176 * auVar284._0_4_ * 0.5;
          auVar59._8_4_ = fVar186 * fVar186 * fVar186 * auVar284._8_4_ * 0.5;
          auVar59._12_4_ = fVar187 * fVar187 * fVar187 * auVar284._12_4_ * 0.5;
          auVar59._16_4_ = fVar231 * fVar231 * fVar231 * auVar284._16_4_ * 0.5;
          auVar59._20_4_ = fVar237 * fVar237 * fVar237 * auVar284._20_4_ * 0.5;
          auVar59._24_4_ = fVar242 * fVar242 * fVar242 * auVar284._24_4_ * 0.5;
          auVar59._28_4_ = auVar284._28_4_;
          auVar130 = vsubps_avx(auVar58,auVar59);
          fVar175 = auVar130._0_4_;
          fVar159 = auVar130._4_4_;
          fVar280 = auVar130._8_4_;
          fVar136 = auVar130._12_4_;
          fVar138 = auVar130._16_4_;
          fVar210 = auVar130._20_4_;
          fVar139 = auVar130._24_4_;
          fVar176 = auVar10._0_4_;
          fVar185 = auVar10._4_4_;
          fVar186 = auVar10._8_4_;
          fVar187 = auVar10._12_4_;
          fVar231 = auVar10._16_4_;
          fVar237 = auVar10._20_4_;
          fVar242 = auVar10._24_4_;
          auVar257._0_4_ = fVar176 * fVar176 + fVar279 * fVar279;
          auVar257._4_4_ = fVar185 * fVar185 + fVar153 * fVar153;
          auVar257._8_4_ = fVar186 * fVar186 + fVar260 * fVar260;
          auVar257._12_4_ = fVar187 * fVar187 + fVar155 * fVar155;
          auVar257._16_4_ = fVar231 * fVar231 + fVar265 * fVar265;
          auVar257._20_4_ = fVar237 * fVar237 + fVar157 * fVar157;
          auVar257._24_4_ = fVar242 * fVar242 + fVar269 * fVar269;
          auVar257._28_4_ = auVar254._28_4_ + auVar196._28_4_;
          auVar196 = vrsqrtps_avx(auVar257);
          fVar203 = auVar196._0_4_;
          fVar259 = auVar196._4_4_;
          auVar60._4_4_ = fVar259 * 1.5;
          auVar60._0_4_ = fVar203 * 1.5;
          fVar205 = auVar196._8_4_;
          auVar60._8_4_ = fVar205 * 1.5;
          fVar263 = auVar196._12_4_;
          auVar60._12_4_ = fVar263 * 1.5;
          fVar207 = auVar196._16_4_;
          auVar60._16_4_ = fVar207 * 1.5;
          fVar267 = auVar196._20_4_;
          auVar60._20_4_ = fVar267 * 1.5;
          fVar209 = auVar196._24_4_;
          auVar60._24_4_ = fVar209 * 1.5;
          auVar60._28_4_ = auVar294._28_4_;
          auVar61._4_4_ = fVar259 * fVar259 * fVar259 * auVar257._4_4_ * 0.5;
          auVar61._0_4_ = fVar203 * fVar203 * fVar203 * auVar257._0_4_ * 0.5;
          auVar61._8_4_ = fVar205 * fVar205 * fVar205 * auVar257._8_4_ * 0.5;
          auVar61._12_4_ = fVar263 * fVar263 * fVar263 * auVar257._12_4_ * 0.5;
          auVar61._16_4_ = fVar207 * fVar207 * fVar207 * auVar257._16_4_ * 0.5;
          auVar61._20_4_ = fVar267 * fVar267 * fVar267 * auVar257._20_4_ * 0.5;
          auVar61._24_4_ = fVar209 * fVar209 * fVar209 * auVar257._24_4_ * 0.5;
          auVar61._28_4_ = auVar257._28_4_;
          auVar254 = vsubps_avx(auVar60,auVar61);
          fVar203 = auVar254._0_4_;
          fVar259 = auVar254._4_4_;
          fVar205 = auVar254._8_4_;
          fVar263 = auVar254._12_4_;
          fVar207 = auVar254._16_4_;
          fVar267 = auVar254._20_4_;
          fVar209 = auVar254._24_4_;
          fVar211 = (float)local_7c0._0_4_ * fVar175 * fVar211;
          fVar219 = (float)local_7c0._4_4_ * fVar159 * fVar219;
          auVar62._4_4_ = fVar219;
          auVar62._0_4_ = fVar211;
          fVar220 = fStack_7b8 * fVar280 * fVar220;
          auVar62._8_4_ = fVar220;
          fVar221 = fStack_7b4 * fVar136 * fVar221;
          auVar62._12_4_ = fVar221;
          fVar223 = fStack_7b0 * fVar138 * fVar223;
          auVar62._16_4_ = fVar223;
          fVar234 = fStack_7ac * fVar210 * fVar234;
          auVar62._20_4_ = fVar234;
          fVar278 = fStack_7a8 * fVar139 * fVar278;
          auVar62._24_4_ = fVar278;
          auVar62._28_4_ = auVar196._28_4_;
          local_4a0._4_4_ = fVar219 + auVar312._4_4_;
          local_4a0._0_4_ = fVar211 + auVar312._0_4_;
          fStack_498 = fVar220 + auVar312._8_4_;
          fStack_494 = fVar221 + auVar312._12_4_;
          fStack_490 = fVar223 + auVar312._16_4_;
          fStack_48c = fVar234 + auVar312._20_4_;
          fStack_488 = fVar278 + auVar312._24_4_;
          fStack_484 = auVar196._28_4_ + auVar312._28_4_;
          local_560 = (float)local_7c0._0_4_ * fVar175 * -fVar140;
          fStack_55c = (float)local_7c0._4_4_ * fVar159 * -fVar141;
          auVar63._4_4_ = fStack_55c;
          auVar63._0_4_ = local_560;
          fStack_558 = fStack_7b8 * fVar280 * -fVar188;
          auVar63._8_4_ = fStack_558;
          fStack_554 = fStack_7b4 * fVar136 * -fVar200;
          auVar63._12_4_ = fStack_554;
          fStack_550 = fStack_7b0 * fVar138 * -fVar201;
          auVar63._16_4_ = fStack_550;
          fStack_54c = fStack_7ac * fVar210 * -fVar202;
          auVar63._20_4_ = fStack_54c;
          fStack_548 = fStack_7a8 * fVar139 * -fVar204;
          auVar63._24_4_ = fStack_548;
          auVar63._28_4_ = -fVar206;
          local_560 = (float)local_680._0_4_ + local_560;
          fStack_55c = local_680._4_4_ + fStack_55c;
          fStack_558 = local_680._8_4_ + fStack_558;
          fStack_554 = local_680._12_4_ + fStack_554;
          fStack_550 = local_680._16_4_ + fStack_550;
          fStack_54c = local_680._20_4_ + fStack_54c;
          fStack_548 = local_680._24_4_ + fStack_548;
          fStack_544 = local_680._28_4_ + -fVar206;
          fVar211 = fVar175 * 0.0 * (float)local_7c0._0_4_;
          fVar219 = fVar159 * 0.0 * (float)local_7c0._4_4_;
          auVar64._4_4_ = fVar219;
          auVar64._0_4_ = fVar211;
          fVar220 = fVar280 * 0.0 * fStack_7b8;
          auVar64._8_4_ = fVar220;
          fVar221 = fVar136 * 0.0 * fStack_7b4;
          auVar64._12_4_ = fVar221;
          fVar223 = fVar138 * 0.0 * fStack_7b0;
          auVar64._16_4_ = fVar223;
          fVar234 = fVar210 * 0.0 * fStack_7ac;
          auVar64._20_4_ = fVar234;
          fVar278 = fVar139 * 0.0 * fStack_7a8;
          auVar64._24_4_ = fVar278;
          auVar64._28_4_ = fVar206;
          auVar19 = vsubps_avx(auVar312,auVar62);
          auVar322._0_4_ = fVar211 + auVar132._0_4_;
          auVar322._4_4_ = fVar219 + auVar132._4_4_;
          auVar322._8_4_ = fVar220 + auVar132._8_4_;
          auVar322._12_4_ = fVar221 + auVar132._12_4_;
          auVar322._16_4_ = fVar223 + auVar132._16_4_;
          auVar322._20_4_ = fVar234 + auVar132._20_4_;
          auVar322._24_4_ = fVar278 + auVar132._24_4_;
          auVar322._28_4_ = fVar206 + auVar132._28_4_;
          fVar211 = local_620._0_4_ * fVar203 * fVar176;
          fVar176 = local_620._4_4_ * fVar259 * fVar185;
          auVar65._4_4_ = fVar176;
          auVar65._0_4_ = fVar211;
          fVar219 = local_620._8_4_ * fVar205 * fVar186;
          auVar65._8_4_ = fVar219;
          fVar185 = local_620._12_4_ * fVar263 * fVar187;
          auVar65._12_4_ = fVar185;
          fVar220 = local_620._16_4_ * fVar207 * fVar231;
          auVar65._16_4_ = fVar220;
          fVar186 = local_620._20_4_ * fVar267 * fVar237;
          auVar65._20_4_ = fVar186;
          fVar221 = local_620._24_4_ * fVar209 * fVar242;
          auVar65._24_4_ = fVar221;
          auVar65._28_4_ = fStack_7a4;
          auVar23 = vsubps_avx(local_680,auVar63);
          auVar303._0_4_ = auVar229._0_4_ + fVar211;
          auVar303._4_4_ = auVar229._4_4_ + fVar176;
          auVar303._8_4_ = auVar229._8_4_ + fVar219;
          auVar303._12_4_ = auVar229._12_4_ + fVar185;
          auVar303._16_4_ = auVar229._16_4_ + fVar220;
          auVar303._20_4_ = auVar229._20_4_ + fVar186;
          auVar303._24_4_ = auVar229._24_4_ + fVar221;
          auVar303._28_4_ = auVar229._28_4_ + fStack_7a4;
          fVar211 = fVar203 * -fVar279 * local_620._0_4_;
          fVar176 = fVar259 * -fVar153 * local_620._4_4_;
          auVar66._4_4_ = fVar176;
          auVar66._0_4_ = fVar211;
          fVar219 = fVar205 * -fVar260 * local_620._8_4_;
          auVar66._8_4_ = fVar219;
          fVar185 = fVar263 * -fVar155 * local_620._12_4_;
          auVar66._12_4_ = fVar185;
          fVar220 = fVar207 * -fVar265 * local_620._16_4_;
          auVar66._16_4_ = fVar220;
          fVar186 = fVar267 * -fVar157 * local_620._20_4_;
          auVar66._20_4_ = fVar186;
          fVar221 = fVar209 * -fVar269 * local_620._24_4_;
          auVar66._24_4_ = fVar221;
          auVar66._28_4_ = auVar312._28_4_;
          auVar169 = vsubps_avx(auVar132,auVar64);
          auVar197._0_4_ = local_440._0_4_ + fVar211;
          auVar197._4_4_ = local_440._4_4_ + fVar176;
          auVar197._8_4_ = local_440._8_4_ + fVar219;
          auVar197._12_4_ = local_440._12_4_ + fVar185;
          auVar197._16_4_ = local_440._16_4_ + fVar220;
          auVar197._20_4_ = local_440._20_4_ + fVar186;
          auVar197._24_4_ = local_440._24_4_ + fVar221;
          auVar197._28_4_ = local_440._28_4_ + auVar312._28_4_;
          fVar211 = fVar203 * 0.0 * local_620._0_4_;
          fVar176 = fVar259 * 0.0 * local_620._4_4_;
          auVar67._4_4_ = fVar176;
          auVar67._0_4_ = fVar211;
          fVar219 = fVar205 * 0.0 * local_620._8_4_;
          auVar67._8_4_ = fVar219;
          fVar185 = fVar263 * 0.0 * local_620._12_4_;
          auVar67._12_4_ = fVar185;
          fVar220 = fVar207 * 0.0 * local_620._16_4_;
          auVar67._16_4_ = fVar220;
          fVar186 = fVar267 * 0.0 * local_620._20_4_;
          auVar67._20_4_ = fVar186;
          fVar221 = fVar209 * 0.0 * local_620._24_4_;
          auVar67._24_4_ = fVar221;
          auVar67._28_4_ = auVar132._28_4_;
          auVar196 = vsubps_avx(auVar229,auVar65);
          auVar101._4_4_ = fStack_4dc;
          auVar101._0_4_ = local_4e0;
          auVar101._8_4_ = fStack_4d8;
          auVar101._12_4_ = fStack_4d4;
          auVar101._16_4_ = fStack_4d0;
          auVar101._20_4_ = fStack_4cc;
          auVar101._24_4_ = fStack_4c8;
          auVar101._28_4_ = fStack_4c4;
          auVar276._0_4_ = local_4e0 + fVar211;
          auVar276._4_4_ = fStack_4dc + fVar176;
          auVar276._8_4_ = fStack_4d8 + fVar219;
          auVar276._12_4_ = fStack_4d4 + fVar185;
          auVar276._16_4_ = fStack_4d0 + fVar220;
          auVar276._20_4_ = fStack_4cc + fVar186;
          auVar276._24_4_ = fStack_4c8 + fVar221;
          auVar276._28_4_ = fStack_4c4 + auVar132._28_4_;
          auVar130 = vsubps_avx(local_440,auVar66);
          auVar10 = vsubps_avx(auVar101,auVar67);
          auVar15 = vsubps_avx(auVar197,auVar23);
          auVar21 = vsubps_avx(auVar276,auVar169);
          auVar68._4_4_ = auVar169._4_4_ * auVar15._4_4_;
          auVar68._0_4_ = auVar169._0_4_ * auVar15._0_4_;
          auVar68._8_4_ = auVar169._8_4_ * auVar15._8_4_;
          auVar68._12_4_ = auVar169._12_4_ * auVar15._12_4_;
          auVar68._16_4_ = auVar169._16_4_ * auVar15._16_4_;
          auVar68._20_4_ = auVar169._20_4_ * auVar15._20_4_;
          auVar68._24_4_ = auVar169._24_4_ * auVar15._24_4_;
          auVar68._28_4_ = auVar294._28_4_;
          auVar69._4_4_ = auVar23._4_4_ * auVar21._4_4_;
          auVar69._0_4_ = auVar23._0_4_ * auVar21._0_4_;
          auVar69._8_4_ = auVar23._8_4_ * auVar21._8_4_;
          auVar69._12_4_ = auVar23._12_4_ * auVar21._12_4_;
          auVar69._16_4_ = auVar23._16_4_ * auVar21._16_4_;
          auVar69._20_4_ = auVar23._20_4_ * auVar21._20_4_;
          auVar69._24_4_ = auVar23._24_4_ * auVar21._24_4_;
          auVar69._28_4_ = fStack_4c4;
          auVar20 = vsubps_avx(auVar69,auVar68);
          auVar70._4_4_ = auVar19._4_4_ * auVar21._4_4_;
          auVar70._0_4_ = auVar19._0_4_ * auVar21._0_4_;
          auVar70._8_4_ = auVar19._8_4_ * auVar21._8_4_;
          auVar70._12_4_ = auVar19._12_4_ * auVar21._12_4_;
          auVar70._16_4_ = auVar19._16_4_ * auVar21._16_4_;
          auVar70._20_4_ = auVar19._20_4_ * auVar21._20_4_;
          auVar70._24_4_ = auVar19._24_4_ * auVar21._24_4_;
          auVar70._28_4_ = auVar21._28_4_;
          auVar21 = vsubps_avx(auVar303,auVar19);
          auVar71._4_4_ = auVar169._4_4_ * auVar21._4_4_;
          auVar71._0_4_ = auVar169._0_4_ * auVar21._0_4_;
          auVar71._8_4_ = auVar169._8_4_ * auVar21._8_4_;
          auVar71._12_4_ = auVar169._12_4_ * auVar21._12_4_;
          auVar71._16_4_ = auVar169._16_4_ * auVar21._16_4_;
          auVar71._20_4_ = auVar169._20_4_ * auVar21._20_4_;
          auVar71._24_4_ = auVar169._24_4_ * auVar21._24_4_;
          auVar71._28_4_ = auVar254._28_4_;
          auVar25 = vsubps_avx(auVar71,auVar70);
          auVar72._4_4_ = auVar23._4_4_ * auVar21._4_4_;
          auVar72._0_4_ = auVar23._0_4_ * auVar21._0_4_;
          auVar72._8_4_ = auVar23._8_4_ * auVar21._8_4_;
          auVar72._12_4_ = auVar23._12_4_ * auVar21._12_4_;
          auVar72._16_4_ = auVar23._16_4_ * auVar21._16_4_;
          auVar72._20_4_ = auVar23._20_4_ * auVar21._20_4_;
          auVar72._24_4_ = auVar23._24_4_ * auVar21._24_4_;
          auVar72._28_4_ = auVar254._28_4_;
          auVar73._4_4_ = auVar19._4_4_ * auVar15._4_4_;
          auVar73._0_4_ = auVar19._0_4_ * auVar15._0_4_;
          auVar73._8_4_ = auVar19._8_4_ * auVar15._8_4_;
          auVar73._12_4_ = auVar19._12_4_ * auVar15._12_4_;
          auVar73._16_4_ = auVar19._16_4_ * auVar15._16_4_;
          auVar73._20_4_ = auVar19._20_4_ * auVar15._20_4_;
          auVar73._24_4_ = auVar19._24_4_ * auVar15._24_4_;
          auVar73._28_4_ = auVar15._28_4_;
          auVar254 = vsubps_avx(auVar73,auVar72);
          auVar147._0_4_ = auVar20._0_4_ * 0.0 + auVar254._0_4_ + auVar25._0_4_ * 0.0;
          auVar147._4_4_ = auVar20._4_4_ * 0.0 + auVar254._4_4_ + auVar25._4_4_ * 0.0;
          auVar147._8_4_ = auVar20._8_4_ * 0.0 + auVar254._8_4_ + auVar25._8_4_ * 0.0;
          auVar147._12_4_ = auVar20._12_4_ * 0.0 + auVar254._12_4_ + auVar25._12_4_ * 0.0;
          auVar147._16_4_ = auVar20._16_4_ * 0.0 + auVar254._16_4_ + auVar25._16_4_ * 0.0;
          auVar147._20_4_ = auVar20._20_4_ * 0.0 + auVar254._20_4_ + auVar25._20_4_ * 0.0;
          auVar147._24_4_ = auVar20._24_4_ * 0.0 + auVar254._24_4_ + auVar25._24_4_ * 0.0;
          auVar147._28_4_ = auVar20._28_4_ + auVar254._28_4_ + auVar25._28_4_;
          auVar14 = vcmpps_avx(auVar147,ZEXT832(0) << 0x20,2);
          auVar196 = vblendvps_avx(auVar196,_local_4a0,auVar14);
          auVar184 = ZEXT3264(auVar196);
          auVar99._4_4_ = fStack_55c;
          auVar99._0_4_ = local_560;
          auVar99._8_4_ = fStack_558;
          auVar99._12_4_ = fStack_554;
          auVar99._16_4_ = fStack_550;
          auVar99._20_4_ = fStack_54c;
          auVar99._24_4_ = fStack_548;
          auVar99._28_4_ = fStack_544;
          auVar254 = vblendvps_avx(auVar130,auVar99,auVar14);
          auVar130 = vblendvps_avx(auVar10,auVar322,auVar14);
          auVar10 = vblendvps_avx(auVar19,auVar303,auVar14);
          auVar15 = vblendvps_avx(auVar23,auVar197,auVar14);
          auVar21 = vblendvps_avx(auVar169,auVar276,auVar14);
          auVar19 = vblendvps_avx(auVar303,auVar19,auVar14);
          auVar20 = vblendvps_avx(auVar197,auVar23,auVar14);
          auVar25 = vblendvps_avx(auVar276,auVar169,auVar14);
          local_680 = vandps_avx(local_340,auVar183);
          auVar19 = vsubps_avx(auVar19,auVar196);
          auVar215 = vsubps_avx(auVar20,auVar254);
          auVar25 = vsubps_avx(auVar25,auVar130);
          auVar273 = vsubps_avx(auVar254,auVar15);
          fVar211 = auVar215._0_4_;
          fVar118 = auVar130._0_4_;
          fVar187 = auVar215._4_4_;
          fVar135 = auVar130._4_4_;
          auVar74._4_4_ = fVar135 * fVar187;
          auVar74._0_4_ = fVar118 * fVar211;
          fVar279 = auVar215._8_4_;
          fVar137 = auVar130._8_4_;
          auVar74._8_4_ = fVar137 * fVar279;
          fVar263 = auVar215._12_4_;
          fVar150 = auVar130._12_4_;
          auVar74._12_4_ = fVar150 * fVar263;
          fVar175 = auVar215._16_4_;
          fVar151 = auVar130._16_4_;
          auVar74._16_4_ = fVar151 * fVar175;
          fVar140 = auVar215._20_4_;
          fVar152 = auVar130._20_4_;
          auVar74._20_4_ = fVar152 * fVar140;
          fVar206 = auVar215._24_4_;
          fVar154 = auVar130._24_4_;
          auVar74._24_4_ = fVar154 * fVar206;
          auVar74._28_4_ = auVar20._28_4_;
          fVar176 = auVar254._0_4_;
          fVar156 = auVar25._0_4_;
          fVar223 = auVar254._4_4_;
          fVar158 = auVar25._4_4_;
          auVar75._4_4_ = fVar158 * fVar223;
          auVar75._0_4_ = fVar156 * fVar176;
          fVar203 = auVar254._8_4_;
          fVar224 = auVar25._8_4_;
          auVar75._8_4_ = fVar224 * fVar203;
          fVar265 = auVar254._12_4_;
          fVar233 = auVar25._12_4_;
          auVar75._12_4_ = fVar233 * fVar265;
          fVar159 = auVar254._16_4_;
          fVar236 = auVar25._16_4_;
          auVar75._16_4_ = fVar236 * fVar159;
          fVar141 = auVar254._20_4_;
          fVar239 = auVar25._20_4_;
          auVar75._20_4_ = fVar239 * fVar141;
          fVar208 = auVar254._24_4_;
          fVar240 = auVar25._24_4_;
          uVar116 = auVar23._28_4_;
          auVar75._24_4_ = fVar240 * fVar208;
          auVar75._28_4_ = uVar116;
          auVar20 = vsubps_avx(auVar75,auVar74);
          fVar219 = auVar196._0_4_;
          fVar231 = auVar196._4_4_;
          auVar76._4_4_ = fVar158 * fVar231;
          auVar76._0_4_ = fVar156 * fVar219;
          fVar153 = auVar196._8_4_;
          auVar76._8_4_ = fVar224 * fVar153;
          fVar207 = auVar196._12_4_;
          auVar76._12_4_ = fVar233 * fVar207;
          fVar280 = auVar196._16_4_;
          auVar76._16_4_ = fVar236 * fVar280;
          fVar188 = auVar196._20_4_;
          auVar76._20_4_ = fVar239 * fVar188;
          fVar307 = auVar196._24_4_;
          auVar76._24_4_ = fVar240 * fVar307;
          auVar76._28_4_ = uVar116;
          fVar185 = auVar19._0_4_;
          fVar234 = auVar19._4_4_;
          auVar77._4_4_ = fVar135 * fVar234;
          auVar77._0_4_ = fVar118 * fVar185;
          fVar259 = auVar19._8_4_;
          auVar77._8_4_ = fVar137 * fVar259;
          fVar157 = auVar19._12_4_;
          auVar77._12_4_ = fVar150 * fVar157;
          fVar136 = auVar19._16_4_;
          auVar77._16_4_ = fVar151 * fVar136;
          fVar200 = auVar19._20_4_;
          auVar77._20_4_ = fVar152 * fVar200;
          fVar262 = auVar19._24_4_;
          auVar77._24_4_ = fVar154 * fVar262;
          auVar77._28_4_ = auVar303._28_4_;
          auVar23 = vsubps_avx(auVar77,auVar76);
          auVar78._4_4_ = fVar223 * fVar234;
          auVar78._0_4_ = fVar176 * fVar185;
          auVar78._8_4_ = fVar203 * fVar259;
          auVar78._12_4_ = fVar265 * fVar157;
          auVar78._16_4_ = fVar159 * fVar136;
          auVar78._20_4_ = fVar141 * fVar200;
          auVar78._24_4_ = fVar208 * fVar262;
          auVar78._28_4_ = uVar116;
          auVar79._4_4_ = fVar231 * fVar187;
          auVar79._0_4_ = fVar219 * fVar211;
          auVar79._8_4_ = fVar153 * fVar279;
          auVar79._12_4_ = fVar207 * fVar263;
          auVar79._16_4_ = fVar280 * fVar175;
          auVar79._20_4_ = fVar188 * fVar140;
          auVar79._24_4_ = fVar307 * fVar206;
          auVar79._28_4_ = auVar169._28_4_;
          auVar169 = vsubps_avx(auVar79,auVar78);
          auVar24 = vsubps_avx(auVar130,auVar21);
          fVar186 = auVar169._28_4_ + auVar23._28_4_;
          auVar282._0_4_ = auVar169._0_4_ + auVar23._0_4_ * 0.0 + auVar20._0_4_ * 0.0;
          auVar282._4_4_ = auVar169._4_4_ + auVar23._4_4_ * 0.0 + auVar20._4_4_ * 0.0;
          auVar282._8_4_ = auVar169._8_4_ + auVar23._8_4_ * 0.0 + auVar20._8_4_ * 0.0;
          auVar282._12_4_ = auVar169._12_4_ + auVar23._12_4_ * 0.0 + auVar20._12_4_ * 0.0;
          auVar285._16_4_ = auVar169._16_4_ + auVar23._16_4_ * 0.0 + auVar20._16_4_ * 0.0;
          auVar285._0_16_ = auVar282;
          auVar285._20_4_ = auVar169._20_4_ + auVar23._20_4_ * 0.0 + auVar20._20_4_ * 0.0;
          auVar285._24_4_ = auVar169._24_4_ + auVar23._24_4_ * 0.0 + auVar20._24_4_ * 0.0;
          auVar285._28_4_ = fVar186 + auVar20._28_4_;
          fVar220 = auVar273._0_4_;
          fVar237 = auVar273._4_4_;
          auVar80._4_4_ = auVar21._4_4_ * fVar237;
          auVar80._0_4_ = auVar21._0_4_ * fVar220;
          fVar260 = auVar273._8_4_;
          auVar80._8_4_ = auVar21._8_4_ * fVar260;
          fVar267 = auVar273._12_4_;
          auVar80._12_4_ = auVar21._12_4_ * fVar267;
          fVar138 = auVar273._16_4_;
          auVar80._16_4_ = auVar21._16_4_ * fVar138;
          fVar201 = auVar273._20_4_;
          auVar80._20_4_ = auVar21._20_4_ * fVar201;
          fVar264 = auVar273._24_4_;
          auVar80._24_4_ = auVar21._24_4_ * fVar264;
          auVar80._28_4_ = fVar186;
          fVar186 = auVar24._0_4_;
          fVar278 = auVar24._4_4_;
          auVar81._4_4_ = auVar15._4_4_ * fVar278;
          auVar81._0_4_ = auVar15._0_4_ * fVar186;
          fVar205 = auVar24._8_4_;
          auVar81._8_4_ = auVar15._8_4_ * fVar205;
          fVar269 = auVar24._12_4_;
          auVar81._12_4_ = auVar15._12_4_ * fVar269;
          fVar210 = auVar24._16_4_;
          auVar81._16_4_ = auVar15._16_4_ * fVar210;
          fVar202 = auVar24._20_4_;
          auVar81._20_4_ = auVar15._20_4_ * fVar202;
          fVar266 = auVar24._24_4_;
          auVar81._24_4_ = auVar15._24_4_ * fVar266;
          auVar81._28_4_ = auVar169._28_4_;
          auVar23 = vsubps_avx(auVar81,auVar80);
          auVar169 = vsubps_avx(auVar196,auVar10);
          fVar221 = auVar169._0_4_;
          fVar242 = auVar169._4_4_;
          auVar82._4_4_ = auVar21._4_4_ * fVar242;
          auVar82._0_4_ = auVar21._0_4_ * fVar221;
          fVar155 = auVar169._8_4_;
          auVar82._8_4_ = auVar21._8_4_ * fVar155;
          fVar209 = auVar169._12_4_;
          auVar82._12_4_ = auVar21._12_4_ * fVar209;
          fVar139 = auVar169._16_4_;
          auVar82._16_4_ = auVar21._16_4_ * fVar139;
          fVar204 = auVar169._20_4_;
          auVar82._20_4_ = auVar21._20_4_ * fVar204;
          fVar268 = auVar169._24_4_;
          auVar82._24_4_ = auVar21._24_4_ * fVar268;
          auVar82._28_4_ = auVar21._28_4_;
          auVar83._4_4_ = fVar278 * auVar10._4_4_;
          auVar83._0_4_ = fVar186 * auVar10._0_4_;
          auVar83._8_4_ = fVar205 * auVar10._8_4_;
          auVar83._12_4_ = fVar269 * auVar10._12_4_;
          auVar83._16_4_ = fVar210 * auVar10._16_4_;
          auVar83._20_4_ = fVar202 * auVar10._20_4_;
          auVar83._24_4_ = fVar266 * auVar10._24_4_;
          auVar83._28_4_ = auVar20._28_4_;
          auVar21 = vsubps_avx(auVar82,auVar83);
          auVar84._4_4_ = auVar15._4_4_ * fVar242;
          auVar84._0_4_ = auVar15._0_4_ * fVar221;
          auVar84._8_4_ = auVar15._8_4_ * fVar155;
          auVar84._12_4_ = auVar15._12_4_ * fVar209;
          auVar84._16_4_ = auVar15._16_4_ * fVar139;
          auVar84._20_4_ = auVar15._20_4_ * fVar204;
          auVar84._24_4_ = auVar15._24_4_ * fVar268;
          auVar84._28_4_ = auVar15._28_4_;
          auVar85._4_4_ = fVar237 * auVar10._4_4_;
          auVar85._0_4_ = fVar220 * auVar10._0_4_;
          auVar85._8_4_ = fVar260 * auVar10._8_4_;
          auVar85._12_4_ = fVar267 * auVar10._12_4_;
          auVar85._16_4_ = fVar138 * auVar10._16_4_;
          auVar85._20_4_ = fVar201 * auVar10._20_4_;
          auVar85._24_4_ = fVar264 * auVar10._24_4_;
          auVar85._28_4_ = auVar10._28_4_;
          auVar10 = vsubps_avx(auVar85,auVar84);
          auVar133._0_4_ = auVar23._0_4_ * 0.0 + auVar10._0_4_ + auVar21._0_4_ * 0.0;
          auVar133._4_4_ = auVar23._4_4_ * 0.0 + auVar10._4_4_ + auVar21._4_4_ * 0.0;
          auVar133._8_4_ = auVar23._8_4_ * 0.0 + auVar10._8_4_ + auVar21._8_4_ * 0.0;
          auVar133._12_4_ = auVar23._12_4_ * 0.0 + auVar10._12_4_ + auVar21._12_4_ * 0.0;
          auVar133._16_4_ = auVar23._16_4_ * 0.0 + auVar10._16_4_ + auVar21._16_4_ * 0.0;
          auVar133._20_4_ = auVar23._20_4_ * 0.0 + auVar10._20_4_ + auVar21._20_4_ * 0.0;
          auVar133._24_4_ = auVar23._24_4_ * 0.0 + auVar10._24_4_ + auVar21._24_4_ * 0.0;
          auVar133._28_4_ = auVar21._28_4_ + auVar10._28_4_ + auVar21._28_4_;
          auVar134 = ZEXT3264(auVar133);
          auVar10 = vmaxps_avx(auVar285,auVar133);
          auVar10 = vcmpps_avx(auVar10,ZEXT432(0) << 0x20,2);
          auVar199 = ZEXT3264(local_680);
          auVar15 = local_680 & auVar10;
          if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar15 >> 0x7f,0) == '\0') &&
                (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar15 >> 0xbf,0) == '\0') &&
              (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar15[0x1f]) {
LAB_00865652:
            auVar315 = auVar23._4_12_;
            auVar149._8_8_ = uStack_478;
            auVar149._0_8_ = local_480;
            auVar149._16_8_ = uStack_470;
            auVar149._24_8_ = uStack_468;
          }
          else {
            auVar315 = auVar282._4_12_;
            auVar15 = vandps_avx(auVar10,local_680);
            auVar86._4_4_ = fVar278 * fVar187;
            auVar86._0_4_ = fVar186 * fVar211;
            auVar86._8_4_ = fVar205 * fVar279;
            auVar86._12_4_ = fVar269 * fVar263;
            auVar86._16_4_ = fVar210 * fVar175;
            auVar86._20_4_ = fVar202 * fVar140;
            auVar86._24_4_ = fVar266 * fVar206;
            auVar86._28_4_ = local_680._28_4_;
            auVar87._4_4_ = fVar237 * fVar158;
            auVar87._0_4_ = fVar220 * fVar156;
            auVar87._8_4_ = fVar260 * fVar224;
            auVar87._12_4_ = fVar267 * fVar233;
            auVar87._16_4_ = fVar138 * fVar236;
            auVar87._20_4_ = fVar201 * fVar239;
            auVar87._24_4_ = fVar264 * fVar240;
            auVar87._28_4_ = auVar10._28_4_;
            auVar21 = vsubps_avx(auVar87,auVar86);
            auVar88._4_4_ = fVar242 * fVar158;
            auVar88._0_4_ = fVar221 * fVar156;
            auVar88._8_4_ = fVar155 * fVar224;
            auVar88._12_4_ = fVar209 * fVar233;
            auVar88._16_4_ = fVar139 * fVar236;
            auVar88._20_4_ = fVar204 * fVar239;
            auVar88._24_4_ = fVar268 * fVar240;
            auVar88._28_4_ = auVar25._28_4_;
            auVar89._4_4_ = fVar278 * fVar234;
            auVar89._0_4_ = fVar186 * fVar185;
            auVar89._8_4_ = fVar205 * fVar259;
            auVar89._12_4_ = fVar269 * fVar157;
            auVar89._16_4_ = fVar210 * fVar136;
            auVar89._20_4_ = fVar202 * fVar200;
            auVar89._24_4_ = fVar266 * fVar262;
            auVar89._28_4_ = auVar24._28_4_;
            auVar20 = vsubps_avx(auVar89,auVar88);
            auVar90._4_4_ = fVar237 * fVar234;
            auVar90._0_4_ = fVar220 * fVar185;
            auVar90._8_4_ = fVar260 * fVar259;
            auVar90._12_4_ = fVar267 * fVar157;
            auVar90._16_4_ = fVar138 * fVar136;
            auVar90._20_4_ = fVar201 * fVar200;
            auVar90._24_4_ = fVar264 * fVar262;
            auVar90._28_4_ = auVar19._28_4_;
            auVar91._4_4_ = fVar242 * fVar187;
            auVar91._0_4_ = fVar221 * fVar211;
            auVar91._8_4_ = fVar155 * fVar279;
            auVar91._12_4_ = fVar209 * fVar263;
            auVar91._16_4_ = fVar139 * fVar175;
            auVar91._20_4_ = fVar204 * fVar140;
            auVar91._24_4_ = fVar268 * fVar206;
            auVar91._28_4_ = auVar215._28_4_;
            auVar25 = vsubps_avx(auVar91,auVar90);
            auVar148._0_4_ = auVar21._0_4_ * 0.0 + auVar25._0_4_ + auVar20._0_4_ * 0.0;
            auVar148._4_4_ = auVar21._4_4_ * 0.0 + auVar25._4_4_ + auVar20._4_4_ * 0.0;
            auVar148._8_4_ = auVar21._8_4_ * 0.0 + auVar25._8_4_ + auVar20._8_4_ * 0.0;
            auVar148._12_4_ = auVar21._12_4_ * 0.0 + auVar25._12_4_ + auVar20._12_4_ * 0.0;
            auVar148._16_4_ = auVar21._16_4_ * 0.0 + auVar25._16_4_ + auVar20._16_4_ * 0.0;
            auVar148._20_4_ = auVar21._20_4_ * 0.0 + auVar25._20_4_ + auVar20._20_4_ * 0.0;
            auVar148._24_4_ = auVar21._24_4_ * 0.0 + auVar25._24_4_ + auVar20._24_4_ * 0.0;
            auVar148._28_4_ = auVar215._28_4_ + auVar25._28_4_ + auVar19._28_4_;
            auVar10 = vrcpps_avx(auVar148);
            fVar185 = auVar10._0_4_;
            fVar220 = auVar10._4_4_;
            auVar92._4_4_ = auVar148._4_4_ * fVar220;
            auVar92._0_4_ = auVar148._0_4_ * fVar185;
            fVar186 = auVar10._8_4_;
            auVar92._8_4_ = auVar148._8_4_ * fVar186;
            fVar221 = auVar10._12_4_;
            auVar92._12_4_ = auVar148._12_4_ * fVar221;
            fVar187 = auVar10._16_4_;
            auVar92._16_4_ = auVar148._16_4_ * fVar187;
            fVar234 = auVar10._20_4_;
            auVar92._20_4_ = auVar148._20_4_ * fVar234;
            fVar237 = auVar10._24_4_;
            auVar92._24_4_ = auVar148._24_4_ * fVar237;
            auVar92._28_4_ = auVar24._28_4_;
            auVar295._8_4_ = 0x3f800000;
            auVar295._0_8_ = 0x3f8000003f800000;
            auVar295._12_4_ = 0x3f800000;
            auVar295._16_4_ = 0x3f800000;
            auVar295._20_4_ = 0x3f800000;
            auVar295._24_4_ = 0x3f800000;
            auVar295._28_4_ = 0x3f800000;
            auVar10 = vsubps_avx(auVar295,auVar92);
            fVar185 = auVar10._0_4_ * fVar185 + fVar185;
            fVar220 = auVar10._4_4_ * fVar220 + fVar220;
            fVar186 = auVar10._8_4_ * fVar186 + fVar186;
            fVar221 = auVar10._12_4_ * fVar221 + fVar221;
            fVar187 = auVar10._16_4_ * fVar187 + fVar187;
            fVar234 = auVar10._20_4_ * fVar234 + fVar234;
            fVar237 = auVar10._24_4_ * fVar237 + fVar237;
            auVar93._4_4_ =
                 (fVar231 * auVar21._4_4_ + auVar20._4_4_ * fVar223 + auVar25._4_4_ * fVar135) *
                 fVar220;
            auVar93._0_4_ =
                 (fVar219 * auVar21._0_4_ + auVar20._0_4_ * fVar176 + auVar25._0_4_ * fVar118) *
                 fVar185;
            auVar93._8_4_ =
                 (fVar153 * auVar21._8_4_ + auVar20._8_4_ * fVar203 + auVar25._8_4_ * fVar137) *
                 fVar186;
            auVar93._12_4_ =
                 (fVar207 * auVar21._12_4_ + auVar20._12_4_ * fVar265 + auVar25._12_4_ * fVar150) *
                 fVar221;
            auVar93._16_4_ =
                 (fVar280 * auVar21._16_4_ + auVar20._16_4_ * fVar159 + auVar25._16_4_ * fVar151) *
                 fVar187;
            auVar93._20_4_ =
                 (fVar188 * auVar21._20_4_ + auVar20._20_4_ * fVar141 + auVar25._20_4_ * fVar152) *
                 fVar234;
            auVar93._24_4_ =
                 (fVar307 * auVar21._24_4_ + auVar20._24_4_ * fVar208 + auVar25._24_4_ * fVar154) *
                 fVar237;
            auVar93._28_4_ = auVar196._28_4_ + auVar254._28_4_ + auVar130._28_4_;
            auVar184 = ZEXT3264(auVar93);
            fVar211 = ray->tfar;
            auVar198._4_4_ = fVar211;
            auVar198._0_4_ = fVar211;
            auVar198._8_4_ = fVar211;
            auVar198._12_4_ = fVar211;
            auVar198._16_4_ = fVar211;
            auVar198._20_4_ = fVar211;
            auVar198._24_4_ = fVar211;
            auVar198._28_4_ = fVar211;
            auVar102._8_8_ = uStack_d8;
            auVar102._0_8_ = local_e0;
            auVar102._16_8_ = uStack_d0;
            auVar102._24_8_ = uStack_c8;
            auVar196 = vcmpps_avx(auVar102,auVar93,2);
            auVar254 = vcmpps_avx(auVar93,auVar198,2);
            auVar199 = ZEXT3264(auVar254);
            auVar196 = vandps_avx(auVar196,auVar254);
            auVar130 = auVar15 & auVar196;
            auVar23 = auVar285;
            if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar130 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar130 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar130 >> 0x7f,0) == '\0') &&
                  (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar130 >> 0xbf,0) == '\0') &&
                (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar130[0x1f]) goto LAB_00865652;
            auVar196 = vandps_avx(auVar15,auVar196);
            auVar130 = vcmpps_avx(ZEXT432(0) << 0x20,auVar148,4);
            auVar10 = auVar196 & auVar130;
            auVar149._8_8_ = uStack_478;
            auVar149._0_8_ = local_480;
            auVar149._16_8_ = uStack_470;
            auVar149._24_8_ = uStack_468;
            if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0x7f,0) != '\0') ||
                  (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0xbf,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar10[0x1f] < '\0') {
              auVar149 = vandps_avx(auVar130,auVar196);
              auVar94._4_4_ = auVar282._4_4_ * fVar220;
              auVar94._0_4_ = auVar282._0_4_ * fVar185;
              auVar94._8_4_ = auVar282._8_4_ * fVar186;
              auVar94._12_4_ = auVar282._12_4_ * fVar221;
              auVar94._16_4_ = auVar285._16_4_ * fVar187;
              auVar94._20_4_ = auVar285._20_4_ * fVar234;
              auVar94._24_4_ = auVar285._24_4_ * fVar237;
              auVar94._28_4_ = auVar254._28_4_;
              auVar95._4_4_ = auVar133._4_4_ * fVar220;
              auVar95._0_4_ = auVar133._0_4_ * fVar185;
              auVar95._8_4_ = auVar133._8_4_ * fVar186;
              auVar95._12_4_ = auVar133._12_4_ * fVar221;
              auVar95._16_4_ = auVar133._16_4_ * fVar187;
              auVar95._20_4_ = auVar133._20_4_ * fVar234;
              auVar95._24_4_ = auVar133._24_4_ * fVar237;
              auVar95._28_4_ = auVar133._28_4_;
              auVar230._8_4_ = 0x3f800000;
              auVar230._0_8_ = 0x3f8000003f800000;
              auVar230._12_4_ = 0x3f800000;
              auVar230._16_4_ = 0x3f800000;
              auVar230._20_4_ = 0x3f800000;
              auVar230._24_4_ = 0x3f800000;
              auVar230._28_4_ = 0x3f800000;
              auVar196 = vsubps_avx(auVar230,auVar94);
              local_160 = vblendvps_avx(auVar196,auVar94,auVar14);
              auVar196 = vsubps_avx(auVar230,auVar95);
              auVar199 = ZEXT3264(auVar196);
              _local_3c0 = vblendvps_avx(auVar196,auVar95,auVar14);
              auVar134 = ZEXT3264(_local_3c0);
              local_180 = auVar93;
            }
          }
          auVar277 = ZEXT3264(local_760);
          auVar258 = ZEXT3264(local_740);
          auVar323 = ZEXT3264(_local_6c0);
          if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar149 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar149 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar149 >> 0x7f,0) != '\0') ||
                (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar149 >> 0xbf,0) != '\0') ||
              (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar149[0x1f] < '\0') {
            auVar196 = vsubps_avx(local_620,_local_7c0);
            auVar184 = ZEXT3264(local_160);
            fVar176 = (float)local_7c0._0_4_ + auVar196._0_4_ * local_160._0_4_;
            fVar219 = (float)local_7c0._4_4_ + auVar196._4_4_ * local_160._4_4_;
            fVar185 = fStack_7b8 + auVar196._8_4_ * local_160._8_4_;
            fVar220 = fStack_7b4 + auVar196._12_4_ * local_160._12_4_;
            fVar186 = fStack_7b0 + auVar196._16_4_ * local_160._16_4_;
            fVar221 = fStack_7ac + auVar196._20_4_ * local_160._20_4_;
            fVar187 = fStack_7a8 + auVar196._24_4_ * local_160._24_4_;
            fVar223 = fStack_7a4 + auVar196._28_4_;
            fVar211 = local_768->depth_scale;
            auVar96._4_4_ = (fVar219 + fVar219) * fVar211;
            auVar96._0_4_ = (fVar176 + fVar176) * fVar211;
            auVar96._8_4_ = (fVar185 + fVar185) * fVar211;
            auVar96._12_4_ = (fVar220 + fVar220) * fVar211;
            auVar96._16_4_ = (fVar186 + fVar186) * fVar211;
            auVar96._20_4_ = (fVar221 + fVar221) * fVar211;
            auVar96._24_4_ = (fVar187 + fVar187) * fVar211;
            auVar96._28_4_ = fVar223 + fVar223;
            auVar199 = ZEXT3264(local_180);
            auVar196 = vcmpps_avx(local_180,auVar96,6);
            auVar134 = ZEXT3264(auVar196);
            auVar254 = auVar149 & auVar196;
            auVar250 = ZEXT3264(_local_540);
            if ((((((((auVar254 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar254 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar254 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar254 >> 0x7f,0) != '\0') ||
                  (auVar254 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar254 >> 0xbf,0) != '\0') ||
                (auVar254 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar254[0x1f] < '\0') {
              local_200 = vandps_avx(auVar196,auVar149);
              auVar134 = ZEXT3264(local_200);
              local_2a0 = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
              fStack_29c = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
              fStack_298 = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
              fStack_294 = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
              fStack_290 = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
              fStack_28c = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
              fStack_288 = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
              fStack_284 = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
              local_2c0 = local_160;
              local_280 = local_180;
              local_25c = uVar108;
              local_250 = local_790;
              uStack_248 = uStack_788;
              local_240 = local_600;
              uStack_238 = uStack_5f8;
              local_230 = local_780;
              uStack_228 = uStack_778;
              local_220 = CONCAT44(fStack_5ec,local_5f0);
              uStack_218 = CONCAT44(fStack_5e4,fStack_5e8);
              local_640._0_8_ = (context->scene->geometries).items[local_770].ptr;
              local_3c0._4_4_ = fStack_29c;
              local_3c0._0_4_ = local_2a0;
              uStack_3b8._0_4_ = fStack_298;
              uStack_3b8._4_4_ = fStack_294;
              uStack_3b0._0_4_ = fStack_290;
              uStack_3b0._4_4_ = fStack_28c;
              auVar106 = _local_3c0;
              uStack_3a8._0_4_ = fStack_288;
              uStack_3a8._4_4_ = fStack_284;
              auVar196 = _local_3c0;
              if ((((Geometry *)local_640._0_8_)->mask & ray->mask) == 0) {
                pRVar110 = (RTCIntersectArguments *)0x0;
                auVar286 = ZEXT3264(local_660);
                auVar289 = ZEXT3264(_local_5a0);
                auVar218 = ZEXT3264(_local_720);
              }
              else {
                pRVar110 = context->args;
                auVar286 = ZEXT3264(local_660);
                auVar289 = ZEXT3264(_local_5a0);
                auVar218 = ZEXT3264(_local_720);
                if ((pRVar110->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar110 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar110 >> 8),1),
                   ((Geometry *)local_640._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_640._8_24_ = auVar312._8_24_;
                  local_6a0._4_28_ = auVar229._4_28_;
                  local_6a0._0_4_ = (int)uVar111;
                  auVar166._0_4_ = (float)(int)local_260;
                  auVar166._4_12_ = auVar315;
                  auVar214 = vshufps_avx(auVar166,auVar166,0);
                  local_1e0[0] = (auVar214._0_4_ + local_160._0_4_ + 0.0) * (float)local_100._0_4_;
                  local_1e0[1] = (auVar214._4_4_ + local_160._4_4_ + 1.0) * (float)local_100._4_4_;
                  local_1e0[2] = (auVar214._8_4_ + local_160._8_4_ + 2.0) * fStack_f8;
                  local_1e0[3] = (auVar214._12_4_ + local_160._12_4_ + 3.0) * fStack_f4;
                  fStack_1d0 = (auVar214._0_4_ + local_160._16_4_ + 4.0) * fStack_f0;
                  fStack_1cc = (auVar214._4_4_ + local_160._20_4_ + 5.0) * fStack_ec;
                  fStack_1c8 = (auVar214._8_4_ + local_160._24_4_ + 6.0) * fStack_e8;
                  fStack_1c4 = auVar214._12_4_ + (float)local_160._28_4_ + 7.0;
                  uStack_3b0 = auVar106._16_8_;
                  uStack_3a8 = auVar196._24_8_;
                  local_1c0 = local_3c0;
                  uStack_1b8 = uStack_3b8;
                  uStack_1b0 = uStack_3b0;
                  uStack_1a8 = uStack_3a8;
                  local_1a0 = local_180;
                  uVar116 = vmovmskps_avx(local_200);
                  uVar111 = CONCAT44((int)((ulong)pRVar110 >> 0x20),uVar116);
                  lVar112 = 0;
                  _local_420 = auVar180;
                  _local_3c0 = auVar196;
                  if (uVar111 != 0) {
                    for (; (uVar111 >> lVar112 & 1) == 0; lVar112 = lVar112 + 1) {
                    }
                  }
                  while( true ) {
                    local_7c0 = (undefined1  [8])lVar112;
                    local_620._0_8_ = uVar111;
                    if (uVar111 == 0) break;
                    local_5d4 = local_1e0[lVar112];
                    auVar134 = ZEXT464((uint)local_5d4);
                    local_5d0 = *(undefined4 *)((long)&local_1c0 + lVar112 * 4);
                    local_680._0_4_ = ray->tfar;
                    ray->tfar = *(float *)(local_1a0 + lVar112 * 4);
                    local_6f0.context = context->user;
                    fVar176 = 1.0 - local_5d4;
                    fVar211 = local_5d4 * fVar176 * 4.0;
                    auVar214 = ZEXT416((uint)(local_5d4 * local_5d4 * 0.5));
                    auVar214 = vshufps_avx(auVar214,auVar214,0);
                    auVar167 = ZEXT416((uint)((fVar176 * fVar176 + fVar211) * 0.5));
                    auVar167 = vshufps_avx(auVar167,auVar167,0);
                    auVar180 = ZEXT416((uint)((-local_5d4 * local_5d4 - fVar211) * 0.5));
                    auVar180 = vshufps_avx(auVar180,auVar180,0);
                    auVar192._0_4_ = auVar180._0_4_ * (float)local_600._0_4_;
                    auVar192._4_4_ = auVar180._4_4_ * (float)local_600._4_4_;
                    auVar192._8_4_ = auVar180._8_4_ * (float)uStack_5f8;
                    auVar192._12_4_ = auVar180._12_4_ * uStack_5f8._4_4_;
                    auVar199 = ZEXT1664(auVar192);
                    auVar180 = ZEXT416((uint)(fVar176 * -fVar176 * 0.5));
                    auVar180 = vshufps_avx(auVar180,auVar180,0);
                    auVar181._0_4_ = auVar180._0_4_ * (float)local_790._0_4_;
                    auVar181._4_4_ = auVar180._4_4_ * (float)local_790._4_4_;
                    auVar181._8_4_ = auVar180._8_4_ * (float)uStack_788;
                    auVar181._12_4_ = auVar180._12_4_ * uStack_788._4_4_;
                    auVar184 = ZEXT1664(auVar181);
                    auVar168._0_4_ =
                         auVar181._0_4_ +
                         auVar192._0_4_ +
                         auVar214._0_4_ * local_5f0 + auVar167._0_4_ * (float)local_780._0_4_;
                    auVar168._4_4_ =
                         auVar181._4_4_ +
                         auVar192._4_4_ +
                         auVar214._4_4_ * fStack_5ec + auVar167._4_4_ * (float)local_780._4_4_;
                    auVar168._8_4_ =
                         auVar181._8_4_ +
                         auVar192._8_4_ +
                         auVar214._8_4_ * fStack_5e8 + auVar167._8_4_ * (float)uStack_778;
                    auVar168._12_4_ =
                         auVar181._12_4_ +
                         auVar192._12_4_ +
                         auVar214._12_4_ * fStack_5e4 + auVar167._12_4_ * uStack_778._4_4_;
                    local_5e0 = vmovlps_avx(auVar168);
                    local_5d8 = vextractps_avx(auVar168,2);
                    local_5cc = (int)local_5a8;
                    local_5c8 = (int)local_770;
                    local_5c4 = (local_6f0.context)->instID[0];
                    local_5c0 = (local_6f0.context)->instPrimID[0];
                    local_7d4 = -1;
                    local_6f0.valid = &local_7d4;
                    local_6f0.geometryUserPtr = *(void **)(local_640._0_8_ + 0x18);
                    local_6f0.ray = (RTCRayN *)ray;
                    local_6f0.hit = (RTCHitN *)&local_5e0;
                    local_6f0.N = 1;
                    if (*(code **)(local_640._0_8_ + 0x48) == (code *)0x0) {
LAB_008655b5:
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_640._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar184 = ZEXT1664(auVar184._0_16_);
                        auVar199 = ZEXT1664(auVar199._0_16_);
                        auVar134._0_8_ = (*p_Var13)(&local_6f0);
                        auVar134._8_56_ = extraout_var_00;
                        if (*local_6f0.valid == 0) goto LAB_00865600;
                      }
                      pRVar110 = (RTCIntersectArguments *)0x1;
                      goto LAB_0086568d;
                    }
                    auVar184 = ZEXT1664(auVar181);
                    auVar199 = ZEXT1664(auVar192);
                    auVar134._0_8_ = (**(code **)(local_640._0_8_ + 0x48))(&local_6f0);
                    auVar134._8_56_ = extraout_var;
                    if (*local_6f0.valid != 0) goto LAB_008655b5;
LAB_00865600:
                    auVar134 = ZEXT464((uint)local_680._0_4_);
                    ray->tfar = (float)local_680._0_4_;
                    uVar111 = local_620._0_8_ ^ 1L << ((ulong)local_7c0 & 0x3f);
                    lVar112 = 0;
                    if (uVar111 != 0) {
                      for (; (uVar111 >> lVar112 & 1) == 0; lVar112 = lVar112 + 1) {
                      }
                    }
                  }
                  pRVar110 = (RTCIntersectArguments *)0x0;
LAB_0086568d:
                  auVar258 = ZEXT3264(local_740);
                  auVar277 = ZEXT3264(local_760);
                  auVar250 = ZEXT3264(_local_540);
                  auVar286 = ZEXT3264(local_660);
                  auVar289 = ZEXT3264(_local_5a0);
                  auVar323 = ZEXT3264(_local_6c0);
                  auVar218 = ZEXT3264(_local_720);
                  uVar111 = (ulong)(uint)local_6a0._0_4_;
                }
              }
              uVar111 = CONCAT71((int7)(uVar111 >> 8),(byte)uVar111 | (byte)pRVar110);
              goto LAB_00865285;
            }
          }
          auVar250 = ZEXT3264(_local_540);
          auVar286 = ZEXT3264(local_660);
          auVar289 = ZEXT3264(_local_5a0);
          auVar218 = ZEXT3264(_local_720);
        }
LAB_00865285:
      }
    }
    if ((uVar111 & 1) != 0) break;
    fVar211 = ray->tfar;
    auVar122._4_4_ = fVar211;
    auVar122._0_4_ = fVar211;
    auVar122._8_4_ = fVar211;
    auVar122._12_4_ = fVar211;
    auVar214 = vcmpps_avx(local_2d0,auVar122,2);
    uVar108 = vmovmskps_avx(auVar214);
    uVar109 = (ulong)((uint)uVar117 & uVar108);
  }
  return uVar109 != 0;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }